

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

void embree::avx::CurveNiMBIntersectorK<4,8>::
     intersect_n<embree::avx::OrientedCurve1IntersectorK<embree::BSplineCurveT,8>,embree::avx::Intersect1KEpilog1<8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  long lVar1;
  long lVar2;
  float *pfVar3;
  undefined1 (*pauVar4) [12];
  undefined4 uVar5;
  undefined8 uVar6;
  ulong uVar7;
  Primitive PVar8;
  uint uVar9;
  Geometry *pGVar10;
  __int_type_conflict _Var11;
  long lVar12;
  long lVar13;
  long lVar14;
  RTCFilterFunctionN p_Var15;
  float fVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  bool bVar57;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [12];
  uint uVar70;
  uint uVar71;
  uint uVar72;
  ulong uVar73;
  long lVar74;
  ulong uVar75;
  long lVar76;
  uint uVar77;
  long lVar79;
  vint4 bi_1;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar95 [16];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  float fVar105;
  float fVar134;
  float fVar135;
  vint4 bi;
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  vint4 bi_2;
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  float fVar158;
  float fVar183;
  float fVar184;
  vint4 ai_1;
  undefined1 auVar159 [16];
  float fVar186;
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  float fVar185;
  float fVar187;
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  float fVar188;
  float fVar189;
  float fVar210;
  float fVar213;
  vint4 ai_2;
  undefined1 auVar190 [16];
  float fVar215;
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  float fVar211;
  float fVar214;
  float fVar216;
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [32];
  float fVar212;
  float fVar217;
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  float fVar218;
  float fVar233;
  float fVar234;
  undefined1 auVar219 [16];
  float fVar235;
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  float fVar236;
  float fVar249;
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar242 [16];
  float fVar250;
  float fVar251;
  undefined1 auVar248 [32];
  vint4 ai;
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [32];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [32];
  undefined1 auVar286 [32];
  float fVar299;
  float fVar300;
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  float fVar301;
  undefined1 auVar297 [16];
  float fVar302;
  float fVar303;
  undefined1 auVar298 [32];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [32];
  float fVar312;
  float fVar320;
  float fVar321;
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  float fVar322;
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  float fVar323;
  float fVar324;
  float fVar325;
  float fVar326;
  float fVar335;
  float fVar336;
  vfloat4 a0;
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  float fVar337;
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  float fVar338;
  float fVar339;
  float fVar340;
  float fVar341;
  float fVar342;
  float fVar343;
  float fVar344;
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  undefined1 auVar349 [16];
  undefined1 auVar348 [16];
  undefined1 auVar350 [16];
  undefined1 auVar351 [16];
  float fVar353;
  float fVar354;
  undefined1 auVar352 [32];
  float fVar355;
  float fVar359;
  float fVar360;
  undefined1 auVar356 [16];
  undefined1 auVar357 [16];
  undefined1 auVar358 [16];
  undefined1 auVar361 [16];
  undefined1 auVar362 [16];
  undefined1 auVar363 [16];
  undefined1 auVar364 [16];
  undefined1 auVar366 [64];
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  RTCFilterFunctionNArguments args;
  vfloat_impl<4> p03;
  uint mask_stack [4];
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_710 [8];
  float fStack_708;
  float fStack_704;
  float local_700;
  float fStack_6fc;
  float fStack_6f8;
  undefined1 local_6c0 [8];
  float fStack_6b8;
  float fStack_6b4;
  float local_6a0;
  float fStack_69c;
  float fStack_698;
  float fStack_694;
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  float local_660;
  float fStack_65c;
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  float local_640;
  float fStack_63c;
  float fStack_638;
  float fStack_634;
  float local_610;
  float fStack_60c;
  float fStack_608;
  float fStack_604;
  float local_600;
  float fStack_5fc;
  float fStack_5f8;
  float fStack_5f4;
  float local_5f0;
  float fStack_5ec;
  float fStack_5e8;
  float fStack_5e4;
  undefined1 local_5e0 [8];
  float fStack_5d8;
  float fStack_5d4;
  uint local_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 local_510;
  undefined8 uStack_508;
  RTCFilterFunctionNArguments local_4f0;
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  float local_4b0;
  float fStack_4ac;
  float fStack_4a8;
  float fStack_4a4;
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  undefined1 local_490 [8];
  float fStack_488;
  float fStack_484;
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  undefined1 local_470 [8];
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  undefined1 local_450 [8];
  float fStack_448;
  float fStack_444;
  uint auStack_440 [4];
  undefined1 local_430 [16];
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  undefined1 local_410 [8];
  float fStack_408;
  float fStack_404;
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  undefined1 local_3f0 [8];
  float fStack_3e8;
  float fStack_3e4;
  undefined1 local_3e0 [16];
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [16];
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [16];
  undefined1 local_390 [16];
  undefined1 local_380 [16];
  undefined1 local_370 [16];
  undefined1 local_360 [16];
  undefined1 local_350 [8];
  float fStack_348;
  float fStack_344;
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  undefined1 local_330 [8];
  float fStack_328;
  float fStack_324;
  undefined1 local_320 [32];
  float afStack_300 [8];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  float local_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  float local_240;
  float fStack_23c;
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  float fStack_224;
  float local_220;
  float fStack_21c;
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  ulong auStack_1a0 [4];
  RTCHitN local_180 [16];
  undefined1 auStack_170 [16];
  undefined1 local_160 [16];
  undefined1 auStack_150 [16];
  undefined1 local_140 [16];
  undefined1 auStack_130 [16];
  undefined1 local_120 [16];
  undefined1 auStack_110 [16];
  undefined1 local_100 [16];
  undefined1 auStack_f0 [16];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  ulong uVar78;
  undefined1 auVar182 [32];
  undefined1 auVar365 [32];
  
  PVar8 = prim[1];
  uVar73 = (ulong)(byte)PVar8;
  lVar74 = uVar73 * 0x25;
  fVar105 = *(float *)(prim + lVar74 + 0x12);
  auVar122 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x10);
  auVar122 = vinsertps_avx(auVar122,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar194 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar194 = vinsertps_avx(auVar194,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar122 = vsubps_avx(auVar122,*(undefined1 (*) [16])(prim + lVar74 + 6));
  auVar106._0_4_ = fVar105 * auVar122._0_4_;
  auVar106._4_4_ = fVar105 * auVar122._4_4_;
  auVar106._8_4_ = fVar105 * auVar122._8_4_;
  auVar106._12_4_ = fVar105 * auVar122._12_4_;
  auVar252._0_4_ = fVar105 * auVar194._0_4_;
  auVar252._4_4_ = fVar105 * auVar194._4_4_;
  auVar252._8_4_ = fVar105 * auVar194._8_4_;
  auVar252._12_4_ = fVar105 * auVar194._12_4_;
  auVar122 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 * 4 + 6)));
  auVar122 = vcvtdq2ps_avx(auVar122);
  auVar194 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 * 5 + 6)));
  auVar194 = vcvtdq2ps_avx(auVar194);
  auVar231 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 * 6 + 6)));
  auVar231 = vcvtdq2ps_avx(auVar231);
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 * 0xf + 6)));
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar8 * 0x10 + 6)));
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar8 * 0x10 + uVar73 + 6)));
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar176 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 * 0x1a + 6)));
  auVar176 = vcvtdq2ps_avx(auVar176);
  auVar121 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 * 0x1b + 6)));
  auVar121 = vcvtdq2ps_avx(auVar121);
  auVar175 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 * 0x1c + 6)));
  auVar175 = vcvtdq2ps_avx(auVar175);
  auVar96 = vshufps_avx(auVar252,auVar252,0);
  auVar150 = vshufps_avx(auVar252,auVar252,0x55);
  auVar20 = vshufps_avx(auVar252,auVar252,0xaa);
  fVar105 = auVar20._0_4_;
  fVar134 = auVar20._4_4_;
  fVar236 = auVar20._8_4_;
  fVar135 = auVar20._12_4_;
  fVar188 = auVar150._0_4_;
  fVar210 = auVar150._4_4_;
  fVar213 = auVar150._8_4_;
  fVar215 = auVar150._12_4_;
  fVar158 = auVar96._0_4_;
  fVar183 = auVar96._4_4_;
  fVar184 = auVar96._8_4_;
  fVar186 = auVar96._12_4_;
  auVar327._0_4_ = fVar158 * auVar122._0_4_ + fVar188 * auVar194._0_4_ + fVar105 * auVar231._0_4_;
  auVar327._4_4_ = fVar183 * auVar122._4_4_ + fVar210 * auVar194._4_4_ + fVar134 * auVar231._4_4_;
  auVar327._8_4_ = fVar184 * auVar122._8_4_ + fVar213 * auVar194._8_4_ + fVar236 * auVar231._8_4_;
  auVar327._12_4_ =
       fVar186 * auVar122._12_4_ + fVar215 * auVar194._12_4_ + fVar135 * auVar231._12_4_;
  auVar345._0_4_ = fVar158 * auVar17._0_4_ + fVar188 * auVar18._0_4_ + auVar19._0_4_ * fVar105;
  auVar345._4_4_ = fVar183 * auVar17._4_4_ + fVar210 * auVar18._4_4_ + auVar19._4_4_ * fVar134;
  auVar345._8_4_ = fVar184 * auVar17._8_4_ + fVar213 * auVar18._8_4_ + auVar19._8_4_ * fVar236;
  auVar345._12_4_ = fVar186 * auVar17._12_4_ + fVar215 * auVar18._12_4_ + auVar19._12_4_ * fVar135;
  auVar253._0_4_ = fVar158 * auVar176._0_4_ + fVar188 * auVar121._0_4_ + auVar175._0_4_ * fVar105;
  auVar253._4_4_ = fVar183 * auVar176._4_4_ + fVar210 * auVar121._4_4_ + auVar175._4_4_ * fVar134;
  auVar253._8_4_ = fVar184 * auVar176._8_4_ + fVar213 * auVar121._8_4_ + auVar175._8_4_ * fVar236;
  auVar253._12_4_ =
       fVar186 * auVar176._12_4_ + fVar215 * auVar121._12_4_ + auVar175._12_4_ * fVar135;
  auVar96 = vshufps_avx(auVar106,auVar106,0);
  auVar150 = vshufps_avx(auVar106,auVar106,0x55);
  auVar20 = vshufps_avx(auVar106,auVar106,0xaa);
  fVar105 = auVar20._0_4_;
  fVar134 = auVar20._4_4_;
  fVar236 = auVar20._8_4_;
  fVar135 = auVar20._12_4_;
  fVar188 = auVar150._0_4_;
  fVar210 = auVar150._4_4_;
  fVar213 = auVar150._8_4_;
  fVar215 = auVar150._12_4_;
  fVar158 = auVar96._0_4_;
  fVar183 = auVar96._4_4_;
  fVar184 = auVar96._8_4_;
  fVar186 = auVar96._12_4_;
  auVar107._0_4_ = fVar158 * auVar122._0_4_ + fVar188 * auVar194._0_4_ + fVar105 * auVar231._0_4_;
  auVar107._4_4_ = fVar183 * auVar122._4_4_ + fVar210 * auVar194._4_4_ + fVar134 * auVar231._4_4_;
  auVar107._8_4_ = fVar184 * auVar122._8_4_ + fVar213 * auVar194._8_4_ + fVar236 * auVar231._8_4_;
  auVar107._12_4_ =
       fVar186 * auVar122._12_4_ + fVar215 * auVar194._12_4_ + fVar135 * auVar231._12_4_;
  auVar80._0_4_ = fVar158 * auVar17._0_4_ + auVar19._0_4_ * fVar105 + fVar188 * auVar18._0_4_;
  auVar80._4_4_ = fVar183 * auVar17._4_4_ + auVar19._4_4_ * fVar134 + fVar210 * auVar18._4_4_;
  auVar80._8_4_ = fVar184 * auVar17._8_4_ + auVar19._8_4_ * fVar236 + fVar213 * auVar18._8_4_;
  auVar80._12_4_ = fVar186 * auVar17._12_4_ + auVar19._12_4_ * fVar135 + fVar215 * auVar18._12_4_;
  auVar265._8_4_ = 0x7fffffff;
  auVar265._0_8_ = 0x7fffffff7fffffff;
  auVar265._12_4_ = 0x7fffffff;
  auVar122 = vandps_avx(auVar327,auVar265);
  auVar190._8_4_ = 0x219392ef;
  auVar190._0_8_ = 0x219392ef219392ef;
  auVar190._12_4_ = 0x219392ef;
  auVar122 = vcmpps_avx(auVar122,auVar190,1);
  auVar194 = vblendvps_avx(auVar327,auVar190,auVar122);
  auVar122 = vandps_avx(auVar345,auVar265);
  auVar122 = vcmpps_avx(auVar122,auVar190,1);
  auVar231 = vblendvps_avx(auVar345,auVar190,auVar122);
  auVar122 = vandps_avx(auVar265,auVar253);
  auVar122 = vcmpps_avx(auVar122,auVar190,1);
  auVar122 = vblendvps_avx(auVar253,auVar190,auVar122);
  auVar136._0_4_ = fVar158 * auVar176._0_4_ + fVar188 * auVar121._0_4_ + auVar175._0_4_ * fVar105;
  auVar136._4_4_ = fVar183 * auVar176._4_4_ + fVar210 * auVar121._4_4_ + auVar175._4_4_ * fVar134;
  auVar136._8_4_ = fVar184 * auVar176._8_4_ + fVar213 * auVar121._8_4_ + auVar175._8_4_ * fVar236;
  auVar136._12_4_ =
       fVar186 * auVar176._12_4_ + fVar215 * auVar121._12_4_ + auVar175._12_4_ * fVar135;
  auVar17 = vrcpps_avx(auVar194);
  fVar158 = auVar17._0_4_;
  auVar159._0_4_ = fVar158 * auVar194._0_4_;
  fVar183 = auVar17._4_4_;
  auVar159._4_4_ = fVar183 * auVar194._4_4_;
  fVar184 = auVar17._8_4_;
  auVar159._8_4_ = fVar184 * auVar194._8_4_;
  fVar186 = auVar17._12_4_;
  auVar159._12_4_ = fVar186 * auVar194._12_4_;
  auVar266._8_4_ = 0x3f800000;
  auVar266._0_8_ = &DAT_3f8000003f800000;
  auVar266._12_4_ = 0x3f800000;
  auVar194 = vsubps_avx(auVar266,auVar159);
  fVar158 = fVar158 + fVar158 * auVar194._0_4_;
  fVar183 = fVar183 + fVar183 * auVar194._4_4_;
  fVar184 = fVar184 + fVar184 * auVar194._8_4_;
  fVar186 = fVar186 + fVar186 * auVar194._12_4_;
  auVar194 = vrcpps_avx(auVar231);
  fVar188 = auVar194._0_4_;
  auVar219._0_4_ = fVar188 * auVar231._0_4_;
  fVar210 = auVar194._4_4_;
  auVar219._4_4_ = fVar210 * auVar231._4_4_;
  fVar213 = auVar194._8_4_;
  auVar219._8_4_ = fVar213 * auVar231._8_4_;
  fVar215 = auVar194._12_4_;
  auVar219._12_4_ = fVar215 * auVar231._12_4_;
  auVar194 = vsubps_avx(auVar266,auVar219);
  fVar188 = fVar188 + fVar188 * auVar194._0_4_;
  fVar210 = fVar210 + fVar210 * auVar194._4_4_;
  fVar213 = fVar213 + fVar213 * auVar194._8_4_;
  fVar215 = fVar215 + fVar215 * auVar194._12_4_;
  auVar194 = vrcpps_avx(auVar122);
  fVar218 = auVar194._0_4_;
  auVar237._0_4_ = fVar218 * auVar122._0_4_;
  fVar233 = auVar194._4_4_;
  auVar237._4_4_ = fVar233 * auVar122._4_4_;
  fVar234 = auVar194._8_4_;
  auVar237._8_4_ = fVar234 * auVar122._8_4_;
  fVar235 = auVar194._12_4_;
  auVar237._12_4_ = fVar235 * auVar122._12_4_;
  auVar122 = vsubps_avx(auVar266,auVar237);
  fVar218 = fVar218 + fVar218 * auVar122._0_4_;
  fVar233 = fVar233 + fVar233 * auVar122._4_4_;
  fVar234 = fVar234 + fVar234 * auVar122._8_4_;
  fVar235 = fVar235 + fVar235 * auVar122._12_4_;
  auVar122 = ZEXT416((uint)((*(float *)(ray + k * 4 + 0xe0) - *(float *)(prim + lVar74 + 0x16)) *
                           *(float *)(prim + lVar74 + 0x1a)));
  auVar231 = vshufps_avx(auVar122,auVar122,0);
  auVar122._8_8_ = 0;
  auVar122._0_8_ = *(ulong *)(prim + uVar73 * 7 + 6);
  auVar122 = vpmovsxwd_avx(auVar122);
  auVar122 = vcvtdq2ps_avx(auVar122);
  auVar194._8_8_ = 0;
  auVar194._0_8_ = *(ulong *)(prim + uVar73 * 0xb + 6);
  auVar194 = vpmovsxwd_avx(auVar194);
  auVar194 = vcvtdq2ps_avx(auVar194);
  auVar17 = vsubps_avx(auVar194,auVar122);
  fVar105 = auVar231._0_4_;
  fVar134 = auVar231._4_4_;
  fVar236 = auVar231._8_4_;
  fVar135 = auVar231._12_4_;
  auVar231._8_8_ = 0;
  auVar231._0_8_ = *(ulong *)(prim + uVar73 * 9 + 6);
  auVar194 = vpmovsxwd_avx(auVar231);
  auVar254._0_4_ = auVar17._0_4_ * fVar105 + auVar122._0_4_;
  auVar254._4_4_ = auVar17._4_4_ * fVar134 + auVar122._4_4_;
  auVar254._8_4_ = auVar17._8_4_ * fVar236 + auVar122._8_4_;
  auVar254._12_4_ = auVar17._12_4_ * fVar135 + auVar122._12_4_;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar73 * 0xd + 6);
  auVar231 = vpmovsxwd_avx(auVar17);
  auVar122 = vcvtdq2ps_avx(auVar194);
  auVar194 = vcvtdq2ps_avx(auVar231);
  auVar194 = vsubps_avx(auVar194,auVar122);
  auVar267._0_4_ = auVar194._0_4_ * fVar105 + auVar122._0_4_;
  auVar267._4_4_ = auVar194._4_4_ * fVar134 + auVar122._4_4_;
  auVar267._8_4_ = auVar194._8_4_ * fVar236 + auVar122._8_4_;
  auVar267._12_4_ = auVar194._12_4_ * fVar135 + auVar122._12_4_;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar73 * 0x12 + 6);
  auVar122 = vpmovsxwd_avx(auVar18);
  uVar75 = (ulong)(uint)((int)(uVar73 * 5) << 2);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar73 * 2 + uVar75 + 6);
  auVar194 = vpmovsxwd_avx(auVar19);
  auVar122 = vcvtdq2ps_avx(auVar122);
  auVar194 = vcvtdq2ps_avx(auVar194);
  auVar194 = vsubps_avx(auVar194,auVar122);
  auVar287._0_4_ = auVar194._0_4_ * fVar105 + auVar122._0_4_;
  auVar287._4_4_ = auVar194._4_4_ * fVar134 + auVar122._4_4_;
  auVar287._8_4_ = auVar194._8_4_ * fVar236 + auVar122._8_4_;
  auVar287._12_4_ = auVar194._12_4_ * fVar135 + auVar122._12_4_;
  auVar176._8_8_ = 0;
  auVar176._0_8_ = *(ulong *)(prim + uVar75 + 6);
  auVar122 = vpmovsxwd_avx(auVar176);
  auVar122 = vcvtdq2ps_avx(auVar122);
  auVar121._8_8_ = 0;
  auVar121._0_8_ = *(ulong *)(prim + uVar73 * 0x18 + 6);
  auVar194 = vpmovsxwd_avx(auVar121);
  auVar194 = vcvtdq2ps_avx(auVar194);
  auVar231 = vsubps_avx(auVar194,auVar122);
  auVar175._8_8_ = 0;
  auVar175._0_8_ = *(ulong *)(prim + uVar73 * 0x1d + 6);
  auVar194 = vpmovsxwd_avx(auVar175);
  auVar304._0_4_ = auVar231._0_4_ * fVar105 + auVar122._0_4_;
  auVar304._4_4_ = auVar231._4_4_ * fVar134 + auVar122._4_4_;
  auVar304._8_4_ = auVar231._8_4_ * fVar236 + auVar122._8_4_;
  auVar304._12_4_ = auVar231._12_4_ * fVar135 + auVar122._12_4_;
  auVar122 = vcvtdq2ps_avx(auVar194);
  auVar96._8_8_ = 0;
  auVar96._0_8_ = *(ulong *)(prim + uVar73 + (ulong)(byte)PVar8 * 0x20 + 6);
  auVar194 = vpmovsxwd_avx(auVar96);
  auVar194 = vcvtdq2ps_avx(auVar194);
  auVar194 = vsubps_avx(auVar194,auVar122);
  auVar313._0_4_ = auVar194._0_4_ * fVar105 + auVar122._0_4_;
  auVar313._4_4_ = auVar194._4_4_ * fVar134 + auVar122._4_4_;
  auVar313._8_4_ = auVar194._8_4_ * fVar236 + auVar122._8_4_;
  auVar313._12_4_ = auVar194._12_4_ * fVar135 + auVar122._12_4_;
  auVar150._8_8_ = 0;
  auVar150._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar8 * 0x20 - uVar73) + 6);
  auVar122 = vpmovsxwd_avx(auVar150);
  auVar122 = vcvtdq2ps_avx(auVar122);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar73 * 0x23 + 6);
  auVar194 = vpmovsxwd_avx(auVar20);
  auVar194 = vcvtdq2ps_avx(auVar194);
  auVar194 = vsubps_avx(auVar194,auVar122);
  auVar238._0_4_ = auVar122._0_4_ + auVar194._0_4_ * fVar105;
  auVar238._4_4_ = auVar122._4_4_ + auVar194._4_4_ * fVar134;
  auVar238._8_4_ = auVar122._8_4_ + auVar194._8_4_ * fVar236;
  auVar238._12_4_ = auVar122._12_4_ + auVar194._12_4_ * fVar135;
  auVar122 = vsubps_avx(auVar254,auVar107);
  auVar255._0_4_ = fVar158 * auVar122._0_4_;
  auVar255._4_4_ = fVar183 * auVar122._4_4_;
  auVar255._8_4_ = fVar184 * auVar122._8_4_;
  auVar255._12_4_ = fVar186 * auVar122._12_4_;
  auVar122 = vsubps_avx(auVar267,auVar107);
  auVar108._0_4_ = fVar158 * auVar122._0_4_;
  auVar108._4_4_ = fVar183 * auVar122._4_4_;
  auVar108._8_4_ = fVar184 * auVar122._8_4_;
  auVar108._12_4_ = fVar186 * auVar122._12_4_;
  auVar122 = vsubps_avx(auVar287,auVar80);
  auVar160._0_4_ = fVar188 * auVar122._0_4_;
  auVar160._4_4_ = fVar210 * auVar122._4_4_;
  auVar160._8_4_ = fVar213 * auVar122._8_4_;
  auVar160._12_4_ = fVar215 * auVar122._12_4_;
  auVar122 = vsubps_avx(auVar304,auVar80);
  auVar81._0_4_ = fVar188 * auVar122._0_4_;
  auVar81._4_4_ = fVar210 * auVar122._4_4_;
  auVar81._8_4_ = fVar213 * auVar122._8_4_;
  auVar81._12_4_ = fVar215 * auVar122._12_4_;
  auVar122 = vsubps_avx(auVar313,auVar136);
  auVar191._0_4_ = fVar218 * auVar122._0_4_;
  auVar191._4_4_ = fVar233 * auVar122._4_4_;
  auVar191._8_4_ = fVar234 * auVar122._8_4_;
  auVar191._12_4_ = fVar235 * auVar122._12_4_;
  auVar122 = vsubps_avx(auVar238,auVar136);
  auVar137._0_4_ = fVar218 * auVar122._0_4_;
  auVar137._4_4_ = fVar233 * auVar122._4_4_;
  auVar137._8_4_ = fVar234 * auVar122._8_4_;
  auVar137._12_4_ = fVar235 * auVar122._12_4_;
  auVar122 = vpminsd_avx(auVar255,auVar108);
  auVar194 = vpminsd_avx(auVar160,auVar81);
  auVar122 = vmaxps_avx(auVar122,auVar194);
  auVar194 = vpminsd_avx(auVar191,auVar137);
  uVar5 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar268._4_4_ = uVar5;
  auVar268._0_4_ = uVar5;
  auVar268._8_4_ = uVar5;
  auVar268._12_4_ = uVar5;
  auVar194 = vmaxps_avx(auVar194,auVar268);
  auVar122 = vmaxps_avx(auVar122,auVar194);
  local_430._0_4_ = auVar122._0_4_ * 0.99999964;
  local_430._4_4_ = auVar122._4_4_ * 0.99999964;
  local_430._8_4_ = auVar122._8_4_ * 0.99999964;
  local_430._12_4_ = auVar122._12_4_ * 0.99999964;
  auVar122 = vpmaxsd_avx(auVar255,auVar108);
  auVar194 = vpmaxsd_avx(auVar160,auVar81);
  auVar122 = vminps_avx(auVar122,auVar194);
  auVar194 = vpmaxsd_avx(auVar191,auVar137);
  uVar5 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar138._4_4_ = uVar5;
  auVar138._0_4_ = uVar5;
  auVar138._8_4_ = uVar5;
  auVar138._12_4_ = uVar5;
  auVar194 = vminps_avx(auVar194,auVar138);
  auVar122 = vminps_avx(auVar122,auVar194);
  auVar82._0_4_ = auVar122._0_4_ * 1.0000004;
  auVar82._4_4_ = auVar122._4_4_ * 1.0000004;
  auVar82._8_4_ = auVar122._8_4_ * 1.0000004;
  auVar82._12_4_ = auVar122._12_4_ * 1.0000004;
  auVar122 = vpshufd_avx(ZEXT116((byte)PVar8),0);
  auVar194 = vpcmpgtd_avx(auVar122,_DAT_01ff0cf0);
  auVar122 = vcmpps_avx(local_430,auVar82,2);
  auVar122 = vandps_avx(auVar122,auVar194);
  uVar70 = vmovmskps_avx(auVar122);
  if (uVar70 == 0) {
    return;
  }
  uVar70 = uVar70 & 0xff;
  auVar99._16_16_ = mm_lookupmask_ps._240_16_;
  auVar99._0_16_ = mm_lookupmask_ps._240_16_;
  local_320 = vblendps_avx(auVar99,ZEXT832(0) << 0x20,0x80);
  uVar71 = 1 << ((byte)k & 0x1f);
  uVar73 = (ulong)((uVar71 & 0xf) << 4);
  lVar74 = (long)((int)uVar71 >> 4) * 0x10;
  auVar366 = ZEXT464(0) << 0x20;
LAB_010318c8:
  lVar76 = 0;
  if (uVar70 != 0) {
    for (; (uVar70 >> lVar76 & 1) == 0; lVar76 = lVar76 + 1) {
    }
  }
  uVar71 = *(uint *)(prim + 2);
  pGVar10 = (context->scene->geometries).items[uVar71].ptr;
  fVar105 = (pGVar10->time_range).lower;
  fVar236 = pGVar10->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0xe0) - fVar105) / ((pGVar10->time_range).upper - fVar105));
  auVar122 = vroundss_avx(ZEXT416((uint)fVar236),ZEXT416((uint)fVar236),9);
  auVar122 = vminss_avx(auVar122,ZEXT416((uint)(pGVar10->fnumTimeSegments + -1.0)));
  auVar122 = vmaxss_avx(ZEXT816(0) << 0x20,auVar122);
  uVar9 = *(uint *)(prim + lVar76 * 4 + 6);
  uVar75 = (ulong)*(uint *)(*(long *)&pGVar10->field_0x58 +
                           (ulong)uVar9 *
                           pGVar10[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var11 = pGVar10[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar79 = (long)(int)auVar122._0_4_ * 0x38;
  lVar12 = *(long *)(_Var11 + lVar79);
  lVar13 = *(long *)(_Var11 + 0x10 + lVar79);
  pfVar3 = (float *)(lVar12 + lVar13 * uVar75);
  fVar135 = *pfVar3;
  fVar158 = pfVar3[1];
  fVar183 = pfVar3[2];
  fVar184 = pfVar3[3];
  lVar76 = uVar75 + 1;
  pfVar3 = (float *)(lVar12 + lVar13 * lVar76);
  fVar186 = *pfVar3;
  fVar188 = pfVar3[1];
  fVar210 = pfVar3[2];
  fVar213 = pfVar3[3];
  lVar1 = uVar75 + 2;
  pfVar3 = (float *)(lVar12 + lVar13 * lVar1);
  fVar215 = *pfVar3;
  fVar218 = pfVar3[1];
  fVar233 = pfVar3[2];
  fVar234 = pfVar3[3];
  lVar2 = uVar75 + 3;
  pfVar3 = (float *)(lVar12 + lVar13 * lVar2);
  fVar235 = *pfVar3;
  fVar185 = pfVar3[1];
  fVar187 = pfVar3[2];
  fVar189 = pfVar3[3];
  lVar12 = *(long *)&pGVar10[4].fnumTimeSegments;
  lVar13 = *(long *)(lVar12 + lVar79);
  lVar14 = *(long *)(lVar12 + 0x10 + lVar79);
  auVar194 = *(undefined1 (*) [16])(lVar13 + lVar14 * uVar75);
  pfVar3 = (float *)(lVar13 + lVar14 * lVar76);
  fVar211 = *pfVar3;
  fVar214 = pfVar3[1];
  fVar216 = pfVar3[2];
  fVar302 = pfVar3[3];
  pfVar3 = (float *)(lVar13 + lVar14 * lVar1);
  fVar303 = *pfVar3;
  fVar312 = pfVar3[1];
  fVar299 = pfVar3[2];
  fVar300 = pfVar3[3];
  fVar236 = fVar236 - auVar122._0_4_;
  pfVar3 = (float *)(lVar13 + lVar14 * lVar2);
  fVar301 = *pfVar3;
  fVar16 = pfVar3[1];
  fVar320 = pfVar3[2];
  fVar212 = pfVar3[3];
  fVar105 = auVar366._8_4_;
  fVar134 = auVar366._12_4_;
  local_710._0_4_ =
       fVar135 * 0.16666667 + fVar186 * 0.6666667 + fVar215 * 0.16666667 + fVar235 * 0.0;
  local_710._4_4_ =
       fVar158 * 0.16666667 + fVar188 * 0.6666667 + fVar218 * 0.16666667 + fVar185 * 0.0;
  fStack_708 = fVar183 * 0.16666667 + fVar210 * 0.6666667 + fVar233 * 0.16666667 + fVar187 * fVar105
  ;
  fStack_704 = fVar184 * 0.16666667 + fVar213 * 0.6666667 + fVar234 * 0.16666667 + fVar189 * fVar134
  ;
  auVar83._0_4_ = fVar215 * 0.5 + fVar235 * 0.0;
  auVar83._4_4_ = fVar218 * 0.5 + fVar185 * 0.0;
  auVar83._8_4_ = fVar233 * 0.5 + fVar187 * fVar105;
  auVar83._12_4_ = fVar234 * 0.5 + fVar189 * fVar134;
  auVar139._0_4_ = fVar186 * 0.0;
  auVar139._4_4_ = fVar188 * 0.0;
  auVar139._8_4_ = fVar105 * fVar210;
  auVar139._12_4_ = fVar134 * fVar213;
  auVar122 = vsubps_avx(auVar83,auVar139);
  auVar140._0_4_ = fVar135 * 0.5;
  auVar140._4_4_ = fVar158 * 0.5;
  auVar140._8_4_ = fVar183 * 0.5;
  auVar140._12_4_ = fVar184 * 0.5;
  auVar121 = vsubps_avx(auVar122,auVar140);
  local_680._0_4_ = auVar194._0_4_;
  local_680._4_4_ = auVar194._4_4_;
  fStack_678 = auVar194._8_4_;
  fStack_674 = auVar194._12_4_;
  auVar84._0_4_ =
       (float)local_680._0_4_ * 0.16666667 +
       fVar211 * 0.6666667 + fVar303 * 0.16666667 + fVar301 * 0.0;
  auVar84._4_4_ =
       (float)local_680._4_4_ * 0.16666667 +
       fVar214 * 0.6666667 + fVar312 * 0.16666667 + fVar16 * 0.0;
  auVar84._8_4_ =
       fStack_678 * 0.16666667 + fVar216 * 0.6666667 + fVar299 * 0.16666667 + fVar320 * fVar105;
  auVar84._12_4_ =
       fStack_674 * 0.16666667 + fVar302 * 0.6666667 + fVar300 * 0.16666667 + fVar212 * fVar134;
  auVar239._0_4_ = fVar303 * 0.5 + fVar301 * 0.0;
  auVar239._4_4_ = fVar312 * 0.5 + fVar16 * 0.0;
  auVar239._8_4_ = fVar299 * 0.5 + fVar320 * fVar105;
  auVar239._12_4_ = fVar300 * 0.5 + fVar212 * fVar134;
  auVar328._0_4_ = fVar211 * 0.0;
  auVar328._4_4_ = fVar214 * 0.0;
  auVar328._8_4_ = fVar105 * fVar216;
  auVar328._12_4_ = fVar134 * fVar302;
  auVar122 = vsubps_avx(auVar239,auVar328);
  auVar329._0_4_ = (float)local_680._0_4_ * 0.5;
  auVar329._4_4_ = (float)local_680._4_4_ * 0.5;
  auVar329._8_4_ = fStack_678 * 0.5;
  auVar329._12_4_ = fStack_674 * 0.5;
  auVar17 = vsubps_avx(auVar122,auVar329);
  auVar192._0_4_ = fVar135 * 0.0;
  auVar192._4_4_ = fVar158 * 0.0;
  auVar192._8_4_ = fVar105 * fVar183;
  auVar192._12_4_ = fVar134 * fVar184;
  auVar240._0_4_ =
       auVar192._0_4_ + fVar186 * 0.16666667 + fVar215 * 0.6666667 + fVar235 * 0.16666667;
  auVar240._4_4_ =
       auVar192._4_4_ + fVar188 * 0.16666667 + fVar218 * 0.6666667 + fVar185 * 0.16666667;
  auVar240._8_4_ =
       auVar192._8_4_ + fVar210 * 0.16666667 + fVar233 * 0.6666667 + fVar187 * 0.16666667;
  auVar240._12_4_ =
       auVar192._12_4_ + fVar213 * 0.16666667 + fVar234 * 0.6666667 + fVar189 * 0.16666667;
  auVar256._0_4_ = fVar235 * 0.5 + fVar215 * 0.0;
  auVar256._4_4_ = fVar185 * 0.5 + fVar218 * 0.0;
  auVar256._8_4_ = fVar187 * 0.5 + fVar105 * fVar233;
  auVar256._12_4_ = fVar189 * 0.5 + fVar134 * fVar234;
  auVar161._0_4_ = fVar186 * 0.5;
  auVar161._4_4_ = fVar188 * 0.5;
  auVar161._8_4_ = fVar210 * 0.5;
  auVar161._12_4_ = fVar213 * 0.5;
  auVar122 = vsubps_avx(auVar256,auVar161);
  auVar175 = vsubps_avx(auVar122,auVar192);
  auVar193._0_4_ = (float)local_680._0_4_ * 0.0;
  auVar193._4_4_ = (float)local_680._4_4_ * 0.0;
  auVar193._8_4_ = fVar105 * fStack_678;
  auVar193._12_4_ = fVar134 * fStack_674;
  auVar162._0_4_ =
       auVar193._0_4_ + fVar211 * 0.16666667 + fVar303 * 0.6666667 + fVar301 * 0.16666667;
  auVar162._4_4_ = auVar193._4_4_ + fVar214 * 0.16666667 + fVar312 * 0.6666667 + fVar16 * 0.16666667
  ;
  auVar162._8_4_ =
       auVar193._8_4_ + fVar216 * 0.16666667 + fVar299 * 0.6666667 + fVar320 * 0.16666667;
  auVar162._12_4_ =
       auVar193._12_4_ + fVar302 * 0.16666667 + fVar300 * 0.6666667 + fVar212 * 0.16666667;
  auVar257._0_4_ = fVar303 * 0.0 + fVar301 * 0.5;
  auVar257._4_4_ = fVar312 * 0.0 + fVar16 * 0.5;
  auVar257._8_4_ = fVar299 * fVar105 + fVar320 * 0.5;
  auVar257._12_4_ = fVar300 * fVar134 + fVar212 * 0.5;
  auVar220._0_4_ = fVar211 * 0.5;
  auVar220._4_4_ = fVar214 * 0.5;
  auVar220._8_4_ = fVar216 * 0.5;
  auVar220._12_4_ = fVar302 * 0.5;
  auVar122 = vsubps_avx(auVar257,auVar220);
  auVar19 = vsubps_avx(auVar122,auVar193);
  auVar122 = vshufps_avx(auVar121,auVar121,0xc9);
  auVar194 = vshufps_avx(auVar84,auVar84,0xc9);
  fVar212 = auVar121._0_4_;
  auVar221._0_4_ = fVar212 * auVar194._0_4_;
  fVar321 = auVar121._4_4_;
  auVar221._4_4_ = fVar321 * auVar194._4_4_;
  fVar217 = auVar121._8_4_;
  auVar221._8_4_ = fVar217 * auVar194._8_4_;
  fVar322 = auVar121._12_4_;
  auVar221._12_4_ = fVar322 * auVar194._12_4_;
  auVar85._0_4_ = auVar122._0_4_ * auVar84._0_4_;
  auVar85._4_4_ = auVar122._4_4_ * auVar84._4_4_;
  auVar85._8_4_ = auVar122._8_4_ * auVar84._8_4_;
  auVar85._12_4_ = auVar122._12_4_ * auVar84._12_4_;
  auVar194 = vsubps_avx(auVar85,auVar221);
  auVar231 = vshufps_avx(auVar194,auVar194,0xc9);
  auVar194 = vshufps_avx(auVar17,auVar17,0xc9);
  auVar86._0_4_ = fVar212 * auVar194._0_4_;
  auVar86._4_4_ = fVar321 * auVar194._4_4_;
  auVar86._8_4_ = fVar217 * auVar194._8_4_;
  auVar86._12_4_ = fVar322 * auVar194._12_4_;
  auVar258._0_4_ = auVar17._0_4_ * auVar122._0_4_;
  auVar258._4_4_ = auVar17._4_4_ * auVar122._4_4_;
  auVar258._8_4_ = auVar17._8_4_ * auVar122._8_4_;
  auVar258._12_4_ = auVar17._12_4_ * auVar122._12_4_;
  auVar122 = vsubps_avx(auVar258,auVar86);
  auVar17 = vshufps_avx(auVar122,auVar122,0xc9);
  auVar122 = vshufps_avx(auVar175,auVar175,0xc9);
  auVar194 = vshufps_avx(auVar162,auVar162,0xc9);
  fVar323 = auVar175._0_4_;
  auVar269._0_4_ = fVar323 * auVar194._0_4_;
  fVar324 = auVar175._4_4_;
  auVar269._4_4_ = fVar324 * auVar194._4_4_;
  fVar325 = auVar175._8_4_;
  auVar269._8_4_ = fVar325 * auVar194._8_4_;
  fVar249 = auVar175._12_4_;
  auVar269._12_4_ = fVar249 * auVar194._12_4_;
  auVar163._0_4_ = auVar122._0_4_ * auVar162._0_4_;
  auVar163._4_4_ = auVar122._4_4_ * auVar162._4_4_;
  auVar163._8_4_ = auVar122._8_4_ * auVar162._8_4_;
  auVar163._12_4_ = auVar122._12_4_ * auVar162._12_4_;
  auVar194 = vsubps_avx(auVar163,auVar269);
  auVar18 = vshufps_avx(auVar194,auVar194,0xc9);
  auVar194 = vshufps_avx(auVar19,auVar19,0xc9);
  auVar270._0_4_ = fVar323 * auVar194._0_4_;
  auVar270._4_4_ = fVar324 * auVar194._4_4_;
  auVar270._8_4_ = fVar325 * auVar194._8_4_;
  auVar270._12_4_ = fVar249 * auVar194._12_4_;
  auVar87._0_4_ = auVar122._0_4_ * auVar19._0_4_;
  auVar87._4_4_ = auVar122._4_4_ * auVar19._4_4_;
  auVar87._8_4_ = auVar122._8_4_ * auVar19._8_4_;
  auVar87._12_4_ = auVar122._12_4_ * auVar19._12_4_;
  auVar122 = vdpps_avx(auVar231,auVar231,0x7f);
  auVar194 = vsubps_avx(auVar87,auVar270);
  auVar19 = vshufps_avx(auVar194,auVar194,0xc9);
  fVar134 = auVar122._0_4_;
  auVar271._4_12_ = auVar366._4_12_;
  auVar271._0_4_ = fVar134;
  auVar194 = vrsqrtss_avx(auVar271,auVar271);
  fVar105 = auVar194._0_4_;
  auVar194 = ZEXT416((uint)(fVar105 * 1.5 - fVar134 * 0.5 * fVar105 * fVar105 * fVar105));
  auVar176 = vshufps_avx(auVar194,auVar194,0);
  fVar189 = auVar176._0_4_ * auVar231._0_4_;
  fVar211 = auVar176._4_4_ * auVar231._4_4_;
  fVar214 = auVar176._8_4_ * auVar231._8_4_;
  fVar216 = auVar176._12_4_ * auVar231._12_4_;
  auVar194 = vdpps_avx(auVar231,auVar17,0x7f);
  auVar122 = vshufps_avx(auVar122,auVar122,0);
  auVar259._0_4_ = auVar122._0_4_ * auVar17._0_4_;
  auVar259._4_4_ = auVar122._4_4_ * auVar17._4_4_;
  auVar259._8_4_ = auVar122._8_4_ * auVar17._8_4_;
  auVar259._12_4_ = auVar122._12_4_ * auVar17._12_4_;
  auVar122 = vshufps_avx(auVar194,auVar194,0);
  auVar222._0_4_ = auVar122._0_4_ * auVar231._0_4_;
  auVar222._4_4_ = auVar122._4_4_ * auVar231._4_4_;
  auVar222._8_4_ = auVar122._8_4_ * auVar231._8_4_;
  auVar222._12_4_ = auVar122._12_4_ * auVar231._12_4_;
  auVar96 = vsubps_avx(auVar259,auVar222);
  auVar122 = vrcpss_avx(auVar271,auVar271);
  auVar122 = ZEXT416((uint)((2.0 - fVar134 * auVar122._0_4_) * auVar122._0_4_));
  auVar231 = vshufps_avx(auVar122,auVar122,0);
  auVar122 = vdpps_avx(auVar18,auVar18,0x7f);
  fVar302 = auVar122._0_4_;
  auVar272._4_12_ = auVar366._4_12_;
  auVar272._0_4_ = fVar302;
  auVar194 = vrsqrtss_avx(auVar272,auVar272);
  fVar234 = auVar194._0_4_;
  auVar194 = vdpps_avx(auVar18,auVar19,0x7f);
  auVar122 = vshufps_avx(auVar122,auVar122,0);
  auVar361._0_4_ = auVar122._0_4_ * auVar19._0_4_;
  auVar361._4_4_ = auVar122._4_4_ * auVar19._4_4_;
  auVar361._8_4_ = auVar122._8_4_ * auVar19._8_4_;
  auVar361._12_4_ = auVar122._12_4_ * auVar19._12_4_;
  lVar13 = *(long *)(_Var11 + 0x38 + lVar79);
  lVar14 = *(long *)(_Var11 + 0x48 + lVar79);
  pauVar4 = (undefined1 (*) [12])(lVar13 + lVar14 * uVar75);
  auVar69 = *pauVar4;
  fVar105 = *(float *)pauVar4[1];
  pfVar3 = (float *)(lVar13 + lVar14 * lVar76);
  fVar134 = *pfVar3;
  fVar135 = pfVar3[1];
  fVar158 = pfVar3[2];
  fVar183 = pfVar3[3];
  pfVar3 = (float *)(lVar13 + lVar14 * lVar1);
  fVar184 = *pfVar3;
  fVar186 = pfVar3[1];
  fVar188 = pfVar3[2];
  fVar210 = pfVar3[3];
  auVar122 = vshufps_avx(auVar194,auVar194,0);
  auVar88._0_4_ = auVar122._0_4_ * auVar18._0_4_;
  auVar88._4_4_ = auVar122._4_4_ * auVar18._4_4_;
  auVar88._8_4_ = auVar122._8_4_ * auVar18._8_4_;
  auVar88._12_4_ = auVar122._12_4_ * auVar18._12_4_;
  auVar19 = vsubps_avx(auVar361,auVar88);
  pfVar3 = (float *)(lVar13 + lVar14 * lVar2);
  fVar213 = *pfVar3;
  fVar215 = pfVar3[1];
  fVar218 = pfVar3[2];
  fVar233 = pfVar3[3];
  lVar13 = *(long *)(lVar12 + 0x38 + lVar79);
  lVar12 = *(long *)(lVar12 + 0x48 + lVar79);
  auVar122 = ZEXT416((uint)(fVar234 * 1.5 - fVar302 * 0.5 * fVar234 * fVar234 * fVar234));
  auVar194 = vshufps_avx(auVar122,auVar122,0);
  fVar234 = auVar194._0_4_ * auVar18._0_4_;
  fVar235 = auVar194._4_4_ * auVar18._4_4_;
  fVar185 = auVar194._8_4_ * auVar18._8_4_;
  fVar187 = auVar194._12_4_ * auVar18._12_4_;
  auVar122 = vrcpss_avx(auVar272,auVar272);
  auVar122 = ZEXT416((uint)(auVar122._0_4_ * (2.0 - auVar122._0_4_ * fVar302)));
  auVar122 = vshufps_avx(auVar122,auVar122,0);
  auVar17 = vshufps_avx(_local_710,_local_710,0xff);
  auVar305._0_4_ = auVar17._0_4_ * fVar189;
  auVar305._4_4_ = auVar17._4_4_ * fVar211;
  auVar305._8_4_ = auVar17._8_4_ * fVar214;
  auVar305._12_4_ = auVar17._12_4_ * fVar216;
  auVar18 = vshufps_avx(auVar121,auVar121,0xff);
  auVar150 = vsubps_avx(_local_710,auVar305);
  auVar195._0_4_ =
       auVar18._0_4_ * fVar189 + auVar17._0_4_ * auVar176._0_4_ * auVar96._0_4_ * auVar231._0_4_;
  auVar195._4_4_ =
       auVar18._4_4_ * fVar211 + auVar17._4_4_ * auVar176._4_4_ * auVar96._4_4_ * auVar231._4_4_;
  auVar195._8_4_ =
       auVar18._8_4_ * fVar214 + auVar17._8_4_ * auVar176._8_4_ * auVar96._8_4_ * auVar231._8_4_;
  auVar195._12_4_ =
       auVar18._12_4_ * fVar216 +
       auVar17._12_4_ * auVar176._12_4_ * auVar96._12_4_ * auVar231._12_4_;
  auVar176 = vsubps_avx(auVar121,auVar195);
  local_710._0_4_ = (float)local_710._0_4_ + auVar305._0_4_;
  local_710._4_4_ = (float)local_710._4_4_ + auVar305._4_4_;
  fStack_708 = fStack_708 + auVar305._8_4_;
  fStack_704 = fStack_704 + auVar305._12_4_;
  auVar231 = vshufps_avx(auVar240,auVar240,0xff);
  auVar141._0_4_ = auVar231._0_4_ * fVar234;
  auVar141._4_4_ = auVar231._4_4_ * fVar235;
  auVar141._8_4_ = auVar231._8_4_ * fVar185;
  auVar141._12_4_ = auVar231._12_4_ * fVar187;
  auVar17 = vshufps_avx(auVar175,auVar175,0xff);
  auVar121 = vsubps_avx(auVar240,auVar141);
  auVar89._0_4_ =
       auVar17._0_4_ * fVar234 + auVar231._0_4_ * auVar194._0_4_ * auVar19._0_4_ * auVar122._0_4_;
  auVar89._4_4_ =
       auVar17._4_4_ * fVar235 + auVar231._4_4_ * auVar194._4_4_ * auVar19._4_4_ * auVar122._4_4_;
  auVar89._8_4_ =
       auVar17._8_4_ * fVar185 + auVar231._8_4_ * auVar194._8_4_ * auVar19._8_4_ * auVar122._8_4_;
  auVar89._12_4_ =
       auVar17._12_4_ * fVar187 +
       auVar231._12_4_ * auVar194._12_4_ * auVar19._12_4_ * auVar122._12_4_;
  auVar175 = vsubps_avx(auVar175,auVar89);
  local_680._4_4_ = auVar240._4_4_ + auVar141._4_4_;
  local_680._0_4_ = auVar240._0_4_ + auVar141._0_4_;
  fStack_678 = auVar240._8_4_ + auVar141._8_4_;
  fStack_674 = auVar240._12_4_ + auVar141._12_4_;
  local_6c0._0_4_ =
       *(float *)*pauVar4 * 0.16666667 + fVar134 * 0.6666667 + fVar184 * 0.16666667 + fVar213 * 0.0;
  local_6c0._4_4_ =
       *(float *)(*pauVar4 + 4) * 0.16666667 +
       fVar135 * 0.6666667 + fVar186 * 0.16666667 + fVar215 * 0.0;
  fStack_6b8 = *(float *)(*pauVar4 + 8) * 0.16666667 +
               fVar158 * 0.6666667 + fVar188 * 0.16666667 + fVar218 * 0.0;
  fStack_6b4 = fVar105 * 0.16666667 + fVar183 * 0.6666667 + fVar210 * 0.16666667 + fVar233 * 0.0;
  auVar90._0_4_ = fVar184 * 0.5 + fVar213 * 0.0;
  auVar90._4_4_ = fVar186 * 0.5 + fVar215 * 0.0;
  auVar90._8_4_ = fVar188 * 0.5 + fVar218 * 0.0;
  auVar90._12_4_ = fVar210 * 0.5 + fVar233 * 0.0;
  auVar109._0_4_ = fVar134 * 0.0;
  auVar109._4_4_ = fVar135 * 0.0;
  auVar109._8_4_ = fVar158 * 0.0;
  auVar109._12_4_ = fVar183 * 0.0;
  auVar122 = vsubps_avx(auVar90,auVar109);
  auVar110._0_4_ = *(float *)*pauVar4 * 0.5;
  auVar110._4_4_ = *(float *)(*pauVar4 + 4) * 0.5;
  auVar110._8_4_ = *(float *)(*pauVar4 + 8) * 0.5;
  auVar110._12_4_ = fVar105 * 0.5;
  auVar96 = vsubps_avx(auVar122,auVar110);
  pfVar3 = (float *)(lVar13 + lVar1 * lVar12);
  fVar234 = *pfVar3;
  fVar235 = pfVar3[1];
  fVar185 = pfVar3[2];
  fVar187 = pfVar3[3];
  pfVar3 = (float *)(lVar13 + lVar12 * lVar2);
  fVar189 = *pfVar3;
  fVar211 = pfVar3[1];
  fVar214 = pfVar3[2];
  fVar216 = pfVar3[3];
  pfVar3 = (float *)(lVar13 + lVar76 * lVar12);
  fVar302 = *pfVar3;
  fVar303 = pfVar3[1];
  fVar312 = pfVar3[2];
  fVar299 = pfVar3[3];
  pfVar3 = (float *)(lVar13 + uVar75 * lVar12);
  fVar300 = *pfVar3;
  fVar301 = pfVar3[1];
  fVar16 = pfVar3[2];
  fVar320 = pfVar3[3];
  auVar196._0_4_ = fVar300 * 0.16666667 + fVar302 * 0.6666667 + fVar234 * 0.16666667 + fVar189 * 0.0
  ;
  auVar196._4_4_ = fVar301 * 0.16666667 + fVar303 * 0.6666667 + fVar235 * 0.16666667 + fVar211 * 0.0
  ;
  auVar196._8_4_ = fVar16 * 0.16666667 + fVar312 * 0.6666667 + fVar185 * 0.16666667 + fVar214 * 0.0;
  auVar196._12_4_ =
       fVar320 * 0.16666667 + fVar299 * 0.6666667 + fVar187 * 0.16666667 + fVar216 * 0.0;
  auVar164._0_4_ = fVar234 * 0.5 + fVar189 * 0.0;
  auVar164._4_4_ = fVar235 * 0.5 + fVar211 * 0.0;
  auVar164._8_4_ = fVar185 * 0.5 + fVar214 * 0.0;
  auVar164._12_4_ = fVar187 * 0.5 + fVar216 * 0.0;
  auVar273._0_4_ = fVar302 * 0.0;
  auVar273._4_4_ = fVar303 * 0.0;
  auVar273._8_4_ = fVar312 * 0.0;
  auVar273._12_4_ = fVar299 * 0.0;
  auVar122 = vsubps_avx(auVar164,auVar273);
  auVar274._0_4_ = fVar300 * 0.5;
  auVar274._4_4_ = fVar301 * 0.5;
  auVar274._8_4_ = fVar16 * 0.5;
  auVar274._12_4_ = fVar320 * 0.5;
  auVar194 = vsubps_avx(auVar122,auVar274);
  auVar275._0_4_ = fVar184 * 0.0 + fVar213 * 0.5;
  auVar275._4_4_ = fVar186 * 0.0 + fVar215 * 0.5;
  auVar275._8_4_ = fVar188 * 0.0 + fVar218 * 0.5;
  auVar275._12_4_ = fVar210 * 0.0 + fVar233 * 0.5;
  auVar330._0_4_ = fVar134 * 0.5;
  auVar330._4_4_ = fVar135 * 0.5;
  auVar330._8_4_ = fVar158 * 0.5;
  auVar330._12_4_ = fVar183 * 0.5;
  auVar122 = vsubps_avx(auVar275,auVar330);
  local_700 = auVar69._0_4_;
  fStack_6fc = auVar69._4_4_;
  fStack_6f8 = auVar69._8_4_;
  auVar314._0_4_ = local_700 * 0.0;
  auVar314._4_4_ = fStack_6fc * 0.0;
  auVar314._8_4_ = fStack_6f8 * 0.0;
  auVar314._12_4_ = fVar105 * 0.0;
  auVar331._0_4_ =
       auVar314._0_4_ + fVar134 * 0.16666667 + fVar213 * 0.16666667 + fVar184 * 0.6666667;
  auVar331._4_4_ =
       auVar314._4_4_ + fVar135 * 0.16666667 + fVar215 * 0.16666667 + fVar186 * 0.6666667;
  auVar331._8_4_ =
       auVar314._8_4_ + fVar158 * 0.16666667 + fVar218 * 0.16666667 + fVar188 * 0.6666667;
  auVar331._12_4_ =
       auVar314._12_4_ + fVar183 * 0.16666667 + fVar233 * 0.16666667 + fVar210 * 0.6666667;
  auVar20 = vsubps_avx(auVar122,auVar314);
  auVar142._0_4_ = fVar234 * 0.0 + fVar189 * 0.5;
  auVar142._4_4_ = fVar235 * 0.0 + fVar211 * 0.5;
  auVar142._8_4_ = fVar185 * 0.0 + fVar214 * 0.5;
  auVar142._12_4_ = fVar187 * 0.0 + fVar216 * 0.5;
  auVar91._0_4_ = fVar302 * 0.5;
  auVar91._4_4_ = fVar303 * 0.5;
  auVar91._8_4_ = fVar312 * 0.5;
  auVar91._12_4_ = fVar299 * 0.5;
  auVar122 = vsubps_avx(auVar142,auVar91);
  auVar111._0_4_ = fVar300 * 0.0;
  auVar111._4_4_ = fVar301 * 0.0;
  auVar111._8_4_ = fVar16 * 0.0;
  auVar111._12_4_ = fVar320 * 0.0;
  auVar143._0_4_ =
       auVar111._0_4_ + fVar302 * 0.16666667 + fVar234 * 0.6666667 + fVar189 * 0.16666667;
  auVar143._4_4_ =
       auVar111._4_4_ + fVar303 * 0.16666667 + fVar235 * 0.6666667 + fVar211 * 0.16666667;
  auVar143._8_4_ =
       auVar111._8_4_ + fVar312 * 0.16666667 + fVar185 * 0.6666667 + fVar214 * 0.16666667;
  auVar143._12_4_ =
       auVar111._12_4_ + fVar299 * 0.16666667 + fVar187 * 0.6666667 + fVar216 * 0.16666667;
  auVar231 = vsubps_avx(auVar122,auVar111);
  auVar122 = vshufps_avx(auVar196,auVar196,0xc9);
  fVar210 = auVar96._0_4_;
  auVar112._0_4_ = fVar210 * auVar122._0_4_;
  fVar213 = auVar96._4_4_;
  auVar112._4_4_ = fVar213 * auVar122._4_4_;
  fVar215 = auVar96._8_4_;
  auVar112._8_4_ = fVar215 * auVar122._8_4_;
  fVar211 = auVar96._12_4_;
  auVar112._12_4_ = fVar211 * auVar122._12_4_;
  auVar122 = vshufps_avx(auVar96,auVar96,0xc9);
  auVar197._0_4_ = auVar122._0_4_ * auVar196._0_4_;
  auVar197._4_4_ = auVar122._4_4_ * auVar196._4_4_;
  auVar197._8_4_ = auVar122._8_4_ * auVar196._8_4_;
  auVar197._12_4_ = auVar122._12_4_ * auVar196._12_4_;
  auVar17 = vsubps_avx(auVar197,auVar112);
  auVar113._0_4_ = auVar122._0_4_ * auVar194._0_4_;
  auVar113._4_4_ = auVar122._4_4_ * auVar194._4_4_;
  auVar113._8_4_ = auVar122._8_4_ * auVar194._8_4_;
  auVar113._12_4_ = auVar122._12_4_ * auVar194._12_4_;
  auVar122 = vshufps_avx(auVar194,auVar194,0xc9);
  auVar165._0_4_ = fVar210 * auVar122._0_4_;
  auVar165._4_4_ = fVar213 * auVar122._4_4_;
  auVar165._8_4_ = fVar215 * auVar122._8_4_;
  auVar165._12_4_ = fVar211 * auVar122._12_4_;
  auVar18 = vsubps_avx(auVar113,auVar165);
  auVar122 = vshufps_avx(auVar143,auVar143,0xc9);
  fVar233 = auVar20._0_4_;
  auVar114._0_4_ = fVar233 * auVar122._0_4_;
  fVar235 = auVar20._4_4_;
  auVar114._4_4_ = fVar235 * auVar122._4_4_;
  fVar187 = auVar20._8_4_;
  auVar114._8_4_ = fVar187 * auVar122._8_4_;
  fVar214 = auVar20._12_4_;
  auVar114._12_4_ = fVar214 * auVar122._12_4_;
  auVar122 = vshufps_avx(auVar20,auVar20,0xc9);
  auVar144._0_4_ = auVar122._0_4_ * auVar143._0_4_;
  auVar144._4_4_ = auVar122._4_4_ * auVar143._4_4_;
  auVar144._8_4_ = auVar122._8_4_ * auVar143._8_4_;
  auVar144._12_4_ = auVar122._12_4_ * auVar143._12_4_;
  auVar19 = vsubps_avx(auVar144,auVar114);
  auVar145._0_4_ = auVar122._0_4_ * auVar231._0_4_;
  auVar145._4_4_ = auVar122._4_4_ * auVar231._4_4_;
  auVar145._8_4_ = auVar122._8_4_ * auVar231._8_4_;
  auVar145._12_4_ = auVar122._12_4_ * auVar231._12_4_;
  auVar122 = vshufps_avx(auVar231,auVar231,0xc9);
  auVar92._0_4_ = fVar233 * auVar122._0_4_;
  auVar92._4_4_ = fVar235 * auVar122._4_4_;
  auVar92._8_4_ = fVar187 * auVar122._8_4_;
  auVar92._12_4_ = fVar214 * auVar122._12_4_;
  auVar80 = vsubps_avx(auVar145,auVar92);
  auVar231 = vshufps_avx(auVar17,auVar17,0xc9);
  auVar122 = vdpps_avx(auVar231,auVar231,0x7f);
  fVar105 = auVar122._0_4_;
  auVar82 = ZEXT416((uint)fVar105);
  auVar194 = vrsqrtss_avx(auVar82,auVar82);
  fVar134 = auVar194._0_4_;
  auVar17 = vshufps_avx(auVar18,auVar18,0xc9);
  auVar194 = vdpps_avx(auVar231,auVar17,0x7f);
  auVar122 = vshufps_avx(auVar122,auVar122,0);
  auVar166._0_4_ = auVar122._0_4_ * auVar17._0_4_;
  auVar166._4_4_ = auVar122._4_4_ * auVar17._4_4_;
  auVar166._8_4_ = auVar122._8_4_ * auVar17._8_4_;
  auVar166._12_4_ = auVar122._12_4_ * auVar17._12_4_;
  auVar122 = vshufps_avx(auVar194,auVar194,0);
  auVar346._0_4_ = auVar122._0_4_ * auVar231._0_4_;
  auVar346._4_4_ = auVar122._4_4_ * auVar231._4_4_;
  auVar346._8_4_ = auVar122._8_4_ * auVar231._8_4_;
  auVar346._12_4_ = auVar122._12_4_ * auVar231._12_4_;
  auVar81 = vsubps_avx(auVar166,auVar346);
  auVar122 = vrcpss_avx(auVar82,auVar82);
  auVar122 = ZEXT416((uint)(auVar122._0_4_ * (2.0 - fVar105 * auVar122._0_4_)));
  auVar17 = vshufps_avx(auVar122,auVar122,0);
  auVar122 = ZEXT416((uint)(fVar134 * 1.5 - fVar105 * 0.5 * fVar134 * fVar134 * fVar134));
  auVar18 = vshufps_avx(auVar122,auVar122,0);
  fVar183 = auVar231._0_4_ * auVar18._0_4_;
  fVar184 = auVar231._4_4_ * auVar18._4_4_;
  fVar186 = auVar231._8_4_ * auVar18._8_4_;
  fVar188 = auVar231._12_4_ * auVar18._12_4_;
  auVar231 = vshufps_avx(auVar19,auVar19,0xc9);
  auVar122 = vdpps_avx(auVar231,auVar231,0x7f);
  fVar105 = auVar122._0_4_;
  auVar82 = ZEXT416((uint)fVar105);
  auVar194 = vrsqrtss_avx(auVar82,auVar82);
  fVar134 = auVar194._0_4_;
  auVar19 = vshufps_avx(auVar80,auVar80,0xc9);
  auVar194 = vdpps_avx(auVar231,auVar19,0x7f);
  auVar122 = vshufps_avx(auVar122,auVar122,0);
  auVar93._0_4_ = auVar122._0_4_ * auVar19._0_4_;
  auVar93._4_4_ = auVar122._4_4_ * auVar19._4_4_;
  auVar93._8_4_ = auVar122._8_4_ * auVar19._8_4_;
  auVar93._12_4_ = auVar122._12_4_ * auVar19._12_4_;
  auVar122 = vshufps_avx(auVar194,auVar194,0);
  auVar276._0_4_ = auVar122._0_4_ * auVar231._0_4_;
  auVar276._4_4_ = auVar122._4_4_ * auVar231._4_4_;
  auVar276._8_4_ = auVar122._8_4_ * auVar231._8_4_;
  auVar276._12_4_ = auVar122._12_4_ * auVar231._12_4_;
  auVar80 = vsubps_avx(auVar93,auVar276);
  auVar122 = vrcpss_avx(auVar82,auVar82);
  auVar122 = ZEXT416((uint)(auVar122._0_4_ * (2.0 - fVar105 * auVar122._0_4_)));
  auVar122 = vshufps_avx(auVar122,auVar122,0);
  auVar194 = ZEXT416((uint)(fVar134 * 1.5 - fVar105 * 0.5 * fVar134 * fVar134 * fVar134));
  auVar194 = vshufps_avx(auVar194,auVar194,0);
  fVar105 = auVar231._0_4_ * auVar194._0_4_;
  fVar134 = auVar231._4_4_ * auVar194._4_4_;
  fVar135 = auVar231._8_4_ * auVar194._8_4_;
  fVar158 = auVar231._12_4_ * auVar194._12_4_;
  auVar231 = vshufps_avx(auVar96,auVar96,0xff);
  auVar19 = vshufps_avx(_local_6c0,_local_6c0,0xff);
  auVar146._0_4_ = auVar19._0_4_ * fVar183;
  auVar146._4_4_ = auVar19._4_4_ * fVar184;
  auVar146._8_4_ = auVar19._8_4_ * fVar186;
  auVar146._12_4_ = auVar19._12_4_ * fVar188;
  auVar167._0_4_ =
       auVar231._0_4_ * fVar183 + auVar18._0_4_ * auVar81._0_4_ * auVar17._0_4_ * auVar19._0_4_;
  auVar167._4_4_ =
       auVar231._4_4_ * fVar184 + auVar18._4_4_ * auVar81._4_4_ * auVar17._4_4_ * auVar19._4_4_;
  auVar167._8_4_ =
       auVar231._8_4_ * fVar186 + auVar18._8_4_ * auVar81._8_4_ * auVar17._8_4_ * auVar19._8_4_;
  auVar167._12_4_ =
       auVar231._12_4_ * fVar188 + auVar18._12_4_ * auVar81._12_4_ * auVar17._12_4_ * auVar19._12_4_
  ;
  auVar18 = vsubps_avx(_local_6c0,auVar146);
  local_6c0._0_4_ = (float)local_6c0._0_4_ + auVar146._0_4_;
  local_6c0._4_4_ = (float)local_6c0._4_4_ + auVar146._4_4_;
  fStack_6b8 = fStack_6b8 + auVar146._8_4_;
  fStack_6b4 = fStack_6b4 + auVar146._12_4_;
  auVar19 = vsubps_avx(auVar96,auVar167);
  auVar231 = vshufps_avx(auVar20,auVar20,0xff);
  auVar17 = vshufps_avx(auVar331,auVar331,0xff);
  auVar115._0_4_ = auVar17._0_4_ * fVar105;
  auVar115._4_4_ = auVar17._4_4_ * fVar134;
  auVar115._8_4_ = auVar17._8_4_ * fVar135;
  auVar115._12_4_ = auVar17._12_4_ * fVar158;
  auVar147._0_4_ =
       auVar231._0_4_ * fVar105 + auVar17._0_4_ * auVar194._0_4_ * auVar80._0_4_ * auVar122._0_4_;
  auVar147._4_4_ =
       auVar231._4_4_ * fVar134 + auVar17._4_4_ * auVar194._4_4_ * auVar80._4_4_ * auVar122._4_4_;
  auVar147._8_4_ =
       auVar231._8_4_ * fVar135 + auVar17._8_4_ * auVar194._8_4_ * auVar80._8_4_ * auVar122._8_4_;
  auVar147._12_4_ =
       auVar231._12_4_ * fVar158 +
       auVar17._12_4_ * auVar194._12_4_ * auVar80._12_4_ * auVar122._12_4_;
  auVar231 = vsubps_avx(auVar331,auVar115);
  auVar347._0_4_ = auVar331._0_4_ + auVar115._0_4_;
  auVar347._4_4_ = auVar331._4_4_ + auVar115._4_4_;
  auVar347._8_4_ = auVar331._8_4_ + auVar115._8_4_;
  auVar347._12_4_ = auVar331._12_4_ + auVar115._12_4_;
  auVar17 = vsubps_avx(auVar20,auVar147);
  local_640 = auVar176._0_4_;
  fStack_63c = auVar176._4_4_;
  fStack_638 = auVar176._8_4_;
  fStack_634 = auVar176._12_4_;
  local_6a0 = auVar150._0_4_;
  fStack_69c = auVar150._4_4_;
  fStack_698 = auVar150._8_4_;
  fStack_694 = auVar150._12_4_;
  auVar122 = vshufps_avx(ZEXT416((uint)fVar236),ZEXT416((uint)fVar236),0);
  auVar194 = vshufps_avx(ZEXT416((uint)(1.0 - fVar236)),ZEXT416((uint)(1.0 - fVar236)),0);
  fVar158 = auVar122._0_4_;
  fVar183 = auVar122._4_4_;
  fVar184 = auVar122._8_4_;
  fVar186 = auVar122._12_4_;
  fVar105 = auVar194._0_4_;
  fVar134 = auVar194._4_4_;
  fVar236 = auVar194._8_4_;
  fVar135 = auVar194._12_4_;
  local_470._0_4_ = fVar105 * local_6a0 + fVar158 * auVar18._0_4_;
  local_470._4_4_ = fVar134 * fStack_69c + fVar183 * auVar18._4_4_;
  fStack_468 = fVar236 * fStack_698 + fVar184 * auVar18._8_4_;
  fStack_464 = fVar135 * fStack_694 + fVar186 * auVar18._12_4_;
  fVar218 = (local_6a0 + local_640 * 0.33333334) * fVar105 +
            fVar158 * (auVar18._0_4_ + auVar19._0_4_ * 0.33333334);
  fVar234 = (fStack_69c + fStack_63c * 0.33333334) * fVar134 +
            fVar183 * (auVar18._4_4_ + auVar19._4_4_ * 0.33333334);
  fVar185 = (fStack_698 + fStack_638 * 0.33333334) * fVar236 +
            fVar184 * (auVar18._8_4_ + auVar19._8_4_ * 0.33333334);
  fVar189 = (fStack_694 + fStack_634 * 0.33333334) * fVar135 +
            fVar186 * (auVar18._12_4_ + auVar19._12_4_ * 0.33333334);
  local_610 = auVar175._0_4_;
  fStack_60c = auVar175._4_4_;
  fStack_608 = auVar175._8_4_;
  fStack_604 = auVar175._12_4_;
  auVar198._0_4_ = local_610 * 0.33333334;
  auVar198._4_4_ = fStack_60c * 0.33333334;
  auVar198._8_4_ = fStack_608 * 0.33333334;
  auVar198._12_4_ = fStack_604 * 0.33333334;
  auVar122 = vsubps_avx(auVar121,auVar198);
  auVar241._0_4_ = (fVar323 + auVar89._0_4_) * 0.33333334;
  auVar241._4_4_ = (fVar324 + auVar89._4_4_) * 0.33333334;
  auVar241._8_4_ = (fVar325 + auVar89._8_4_) * 0.33333334;
  auVar241._12_4_ = (fVar249 + auVar89._12_4_) * 0.33333334;
  auVar194 = vsubps_avx(_local_680,auVar241);
  auVar277._0_4_ = auVar17._0_4_ * 0.33333334;
  auVar277._4_4_ = auVar17._4_4_ * 0.33333334;
  auVar277._8_4_ = auVar17._8_4_ * 0.33333334;
  auVar277._12_4_ = auVar17._12_4_ * 0.33333334;
  auVar17 = vsubps_avx(auVar231,auVar277);
  auVar148._0_4_ = (fVar233 + auVar147._0_4_) * 0.33333334;
  auVar148._4_4_ = (fVar235 + auVar147._4_4_) * 0.33333334;
  auVar148._8_4_ = (fVar187 + auVar147._8_4_) * 0.33333334;
  auVar148._12_4_ = (fVar214 + auVar147._12_4_) * 0.33333334;
  auVar18 = vsubps_avx(auVar347,auVar148);
  local_480._0_4_ = auVar17._0_4_ * fVar158 + fVar105 * auVar122._0_4_;
  local_480._4_4_ = auVar17._4_4_ * fVar183 + fVar134 * auVar122._4_4_;
  fStack_478 = auVar17._8_4_ * fVar184 + fVar236 * auVar122._8_4_;
  fStack_474 = auVar17._12_4_ * fVar186 + fVar135 * auVar122._12_4_;
  local_490._0_4_ = auVar231._0_4_ * fVar158 + auVar121._0_4_ * fVar105;
  local_490._4_4_ = auVar231._4_4_ * fVar183 + auVar121._4_4_ * fVar134;
  fStack_488 = auVar231._8_4_ * fVar184 + auVar121._8_4_ * fVar236;
  fStack_484 = auVar231._12_4_ * fVar186 + auVar121._12_4_ * fVar135;
  local_4a0._0_4_ = fVar105 * (float)local_710._0_4_ + fVar158 * (float)local_6c0._0_4_;
  local_4a0._4_4_ = fVar134 * (float)local_710._4_4_ + fVar183 * (float)local_6c0._4_4_;
  fStack_498 = fVar236 * fStack_708 + fVar184 * fStack_6b8;
  fStack_494 = fVar135 * fStack_704 + fVar186 * fStack_6b4;
  fVar233 = fVar105 * ((float)local_710._0_4_ + (fVar212 + auVar195._0_4_) * 0.33333334) +
            ((fVar210 + auVar167._0_4_) * 0.33333334 + (float)local_6c0._0_4_) * fVar158;
  fVar235 = fVar134 * ((float)local_710._4_4_ + (fVar321 + auVar195._4_4_) * 0.33333334) +
            ((fVar213 + auVar167._4_4_) * 0.33333334 + (float)local_6c0._4_4_) * fVar183;
  fVar187 = fVar236 * (fStack_708 + (fVar217 + auVar195._8_4_) * 0.33333334) +
            ((fVar215 + auVar167._8_4_) * 0.33333334 + fStack_6b8) * fVar184;
  fVar211 = fVar135 * (fStack_704 + (fVar322 + auVar195._12_4_) * 0.33333334) +
            ((fVar211 + auVar167._12_4_) * 0.33333334 + fStack_6b4) * fVar186;
  local_4b0 = fVar105 * auVar194._0_4_ + fVar158 * auVar18._0_4_;
  fStack_4ac = fVar134 * auVar194._4_4_ + fVar183 * auVar18._4_4_;
  fStack_4a8 = fVar236 * auVar194._8_4_ + fVar184 * auVar18._8_4_;
  fStack_4a4 = fVar135 * auVar194._12_4_ + fVar186 * auVar18._12_4_;
  auVar122 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x1c);
  local_4c0._0_4_ = (auVar240._0_4_ + auVar141._0_4_) * fVar105 + auVar347._0_4_ * fVar158;
  local_4c0._4_4_ = (auVar240._4_4_ + auVar141._4_4_) * fVar134 + auVar347._4_4_ * fVar183;
  fStack_4b8 = (auVar240._8_4_ + auVar141._8_4_) * fVar236 + auVar347._8_4_ * fVar184;
  fStack_4b4 = (auVar240._12_4_ + auVar141._12_4_) * fVar135 + auVar347._12_4_ * fVar186;
  auVar122 = vinsertps_avx(auVar122,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  local_360 = vsubps_avx(_local_470,auVar122);
  auVar231 = vmovsldup_avx(local_360);
  auVar194 = vmovshdup_avx(local_360);
  auVar17 = vshufps_avx(local_360,local_360,0xaa);
  fVar105 = pre->ray_space[k].vx.field_0.m128[0];
  fVar134 = pre->ray_space[k].vx.field_0.m128[1];
  fVar236 = pre->ray_space[k].vx.field_0.m128[2];
  fVar135 = pre->ray_space[k].vx.field_0.m128[3];
  fVar158 = pre->ray_space[k].vy.field_0.m128[0];
  fVar183 = pre->ray_space[k].vy.field_0.m128[1];
  fVar184 = pre->ray_space[k].vy.field_0.m128[2];
  fVar186 = pre->ray_space[k].vy.field_0.m128[3];
  fVar188 = pre->ray_space[k].vz.field_0.m128[0];
  fVar210 = pre->ray_space[k].vz.field_0.m128[1];
  fVar213 = pre->ray_space[k].vz.field_0.m128[2];
  fVar215 = pre->ray_space[k].vz.field_0.m128[3];
  local_5e0._0_4_ = fVar105 * auVar231._0_4_ + fVar158 * auVar194._0_4_ + fVar188 * auVar17._0_4_;
  local_5e0._4_4_ = fVar134 * auVar231._4_4_ + fVar183 * auVar194._4_4_ + fVar210 * auVar17._4_4_;
  fStack_5d8 = fVar236 * auVar231._8_4_ + fVar184 * auVar194._8_4_ + fVar213 * auVar17._8_4_;
  fStack_5d4 = fVar135 * auVar231._12_4_ + fVar186 * auVar194._12_4_ + fVar215 * auVar17._12_4_;
  auVar62._4_4_ = fVar234;
  auVar62._0_4_ = fVar218;
  auVar62._8_4_ = fVar185;
  auVar62._12_4_ = fVar189;
  local_370 = vsubps_avx(auVar62,auVar122);
  auVar17 = vshufps_avx(local_370,local_370,0xaa);
  auVar194 = vmovshdup_avx(local_370);
  auVar231 = vmovsldup_avx(local_370);
  auVar348._0_8_ =
       CONCAT44(fVar134 * auVar231._4_4_ + fVar183 * auVar194._4_4_ + fVar210 * auVar17._4_4_,
                fVar105 * auVar231._0_4_ + fVar158 * auVar194._0_4_ + fVar188 * auVar17._0_4_);
  auVar348._8_4_ = fVar236 * auVar231._8_4_ + fVar184 * auVar194._8_4_ + fVar213 * auVar17._8_4_;
  auVar348._12_4_ = fVar135 * auVar231._12_4_ + fVar186 * auVar194._12_4_ + fVar215 * auVar17._12_4_
  ;
  local_380 = vsubps_avx(_local_480,auVar122);
  auVar17 = vshufps_avx(local_380,local_380,0xaa);
  auVar194 = vmovshdup_avx(local_380);
  auVar231 = vmovsldup_avx(local_380);
  auVar332._0_4_ = fVar105 * auVar231._0_4_ + fVar158 * auVar194._0_4_ + fVar188 * auVar17._0_4_;
  auVar332._4_4_ = fVar134 * auVar231._4_4_ + fVar183 * auVar194._4_4_ + fVar210 * auVar17._4_4_;
  auVar332._8_4_ = fVar236 * auVar231._8_4_ + fVar184 * auVar194._8_4_ + fVar213 * auVar17._8_4_;
  auVar332._12_4_ = fVar135 * auVar231._12_4_ + fVar186 * auVar194._12_4_ + fVar215 * auVar17._12_4_
  ;
  local_390 = vsubps_avx(_local_490,auVar122);
  auVar17 = vshufps_avx(local_390,local_390,0xaa);
  auVar194 = vmovshdup_avx(local_390);
  auVar231 = vmovsldup_avx(local_390);
  auVar116._0_4_ = auVar231._0_4_ * fVar105 + auVar194._0_4_ * fVar158 + fVar188 * auVar17._0_4_;
  auVar116._4_4_ = auVar231._4_4_ * fVar134 + auVar194._4_4_ * fVar183 + fVar210 * auVar17._4_4_;
  auVar116._8_4_ = auVar231._8_4_ * fVar236 + auVar194._8_4_ * fVar184 + fVar213 * auVar17._8_4_;
  auVar116._12_4_ = auVar231._12_4_ * fVar135 + auVar194._12_4_ * fVar186 + fVar215 * auVar17._12_4_
  ;
  local_3a0 = vsubps_avx(_local_4a0,auVar122);
  auVar17 = vshufps_avx(local_3a0,local_3a0,0xaa);
  auVar194 = vmovshdup_avx(local_3a0);
  auVar231 = vmovsldup_avx(local_3a0);
  auVar278._0_4_ = auVar231._0_4_ * fVar105 + auVar194._0_4_ * fVar158 + auVar17._0_4_ * fVar188;
  auVar278._4_4_ = auVar231._4_4_ * fVar134 + auVar194._4_4_ * fVar183 + auVar17._4_4_ * fVar210;
  auVar278._8_4_ = auVar231._8_4_ * fVar236 + auVar194._8_4_ * fVar184 + auVar17._8_4_ * fVar213;
  auVar278._12_4_ = auVar231._12_4_ * fVar135 + auVar194._12_4_ * fVar186 + auVar17._12_4_ * fVar215
  ;
  auVar60._4_4_ = fVar235;
  auVar60._0_4_ = fVar233;
  auVar60._8_4_ = fVar187;
  auVar60._12_4_ = fVar211;
  local_3b0 = vsubps_avx(auVar60,auVar122);
  auVar17 = vshufps_avx(local_3b0,local_3b0,0xaa);
  auVar194 = vmovshdup_avx(local_3b0);
  auVar231 = vmovsldup_avx(local_3b0);
  auVar288._0_4_ = auVar231._0_4_ * fVar105 + auVar194._0_4_ * fVar158 + auVar17._0_4_ * fVar188;
  auVar288._4_4_ = auVar231._4_4_ * fVar134 + auVar194._4_4_ * fVar183 + auVar17._4_4_ * fVar210;
  auVar288._8_4_ = auVar231._8_4_ * fVar236 + auVar194._8_4_ * fVar184 + auVar17._8_4_ * fVar213;
  auVar288._12_4_ = auVar231._12_4_ * fVar135 + auVar194._12_4_ * fVar186 + auVar17._12_4_ * fVar215
  ;
  auVar68._4_4_ = fStack_4ac;
  auVar68._0_4_ = local_4b0;
  auVar68._8_4_ = fStack_4a8;
  auVar68._12_4_ = fStack_4a4;
  local_3c0 = vsubps_avx(auVar68,auVar122);
  auVar17 = vshufps_avx(local_3c0,local_3c0,0xaa);
  auVar194 = vmovshdup_avx(local_3c0);
  auVar231 = vmovsldup_avx(local_3c0);
  auVar306._0_4_ = auVar231._0_4_ * fVar105 + auVar194._0_4_ * fVar158 + auVar17._0_4_ * fVar188;
  auVar306._4_4_ = auVar231._4_4_ * fVar134 + auVar194._4_4_ * fVar183 + auVar17._4_4_ * fVar210;
  auVar306._8_4_ = auVar231._8_4_ * fVar236 + auVar194._8_4_ * fVar184 + auVar17._8_4_ * fVar213;
  auVar306._12_4_ = auVar231._12_4_ * fVar135 + auVar194._12_4_ * fVar186 + auVar17._12_4_ * fVar215
  ;
  local_3d0 = vsubps_avx(_local_4c0,auVar122);
  auVar231 = vshufps_avx(local_3d0,local_3d0,0xaa);
  auVar122 = vmovshdup_avx(local_3d0);
  auVar194 = vmovsldup_avx(local_3d0);
  auVar94._0_4_ = fVar105 * auVar194._0_4_ + fVar158 * auVar122._0_4_ + fVar188 * auVar231._0_4_;
  auVar94._4_4_ = fVar134 * auVar194._4_4_ + fVar183 * auVar122._4_4_ + fVar210 * auVar231._4_4_;
  auVar94._8_4_ = fVar236 * auVar194._8_4_ + fVar184 * auVar122._8_4_ + fVar213 * auVar231._8_4_;
  auVar94._12_4_ = fVar135 * auVar194._12_4_ + fVar186 * auVar122._12_4_ + fVar215 * auVar231._12_4_
  ;
  auVar17 = vmovlhps_avx(_local_5e0,auVar278);
  auVar18 = vmovlhps_avx(auVar348,auVar288);
  auVar19 = vmovlhps_avx(auVar332,auVar306);
  _local_460 = vmovlhps_avx(auVar116,auVar94);
  auVar122 = vminps_avx(auVar17,auVar18);
  auVar194 = vminps_avx(auVar19,_local_460);
  auVar231 = vminps_avx(auVar122,auVar194);
  auVar122 = vmaxps_avx(auVar17,auVar18);
  auVar194 = vmaxps_avx(auVar19,_local_460);
  auVar122 = vmaxps_avx(auVar122,auVar194);
  auVar194 = vshufpd_avx(auVar231,auVar231,3);
  auVar231 = vminps_avx(auVar231,auVar194);
  auVar194 = vshufpd_avx(auVar122,auVar122,3);
  auVar194 = vmaxps_avx(auVar122,auVar194);
  auVar242._8_4_ = 0x7fffffff;
  auVar242._0_8_ = 0x7fffffff7fffffff;
  auVar242._12_4_ = 0x7fffffff;
  auVar122 = vandps_avx(auVar231,auVar242);
  auVar194 = vandps_avx(auVar194,auVar242);
  auVar122 = vmaxps_avx(auVar122,auVar194);
  auVar194 = vmovshdup_avx(auVar122);
  auVar122 = vmaxss_avx(auVar194,auVar122);
  local_528 = uVar70 + 0xf;
  fVar134 = auVar122._0_4_ * 9.536743e-07;
  register0x00001548 = auVar348._0_8_;
  local_450 = auVar348._0_8_;
  auVar122 = vshufps_avx(ZEXT416((uint)fVar134),ZEXT416((uint)fVar134),0);
  local_280._16_16_ = auVar122;
  local_280._0_16_ = auVar122;
  auVar95._0_8_ = auVar122._0_8_ ^ 0x8000000080000000;
  auVar95._8_4_ = auVar122._8_4_ ^ 0x80000000;
  auVar95._12_4_ = auVar122._12_4_ ^ 0x80000000;
  local_2a0._16_16_ = auVar95;
  local_2a0._0_16_ = auVar95;
  auVar122 = vshufps_avx(ZEXT416(uVar71),ZEXT416(uVar71),0);
  local_2c0._16_16_ = auVar122;
  local_2c0._0_16_ = auVar122;
  auVar122 = vpshufd_avx(ZEXT416(uVar9),0);
  local_2e0._16_16_ = auVar122;
  local_2e0._0_16_ = auVar122;
  uVar75 = 0;
  fVar105 = *(float *)(ray + k * 4 + 0x60);
  _local_330 = vsubps_avx(auVar18,auVar17);
  _local_340 = vsubps_avx(auVar19,auVar18);
  _local_350 = vsubps_avx(_local_460,auVar19);
  _local_3f0 = vsubps_avx(_local_4a0,_local_470);
  auVar61._4_4_ = fVar235;
  auVar61._0_4_ = fVar233;
  auVar61._8_4_ = fVar187;
  auVar61._12_4_ = fVar211;
  auVar63._4_4_ = fVar234;
  auVar63._0_4_ = fVar218;
  auVar63._8_4_ = fVar185;
  auVar63._12_4_ = fVar189;
  _local_400 = vsubps_avx(auVar61,auVar63);
  _local_410 = vsubps_avx(auVar68,_local_480);
  _local_420 = vsubps_avx(_local_4c0,_local_490);
  _local_710 = ZEXT816(0x3f80000000000000);
  local_3e0 = _local_710;
  do {
    auVar122 = vshufps_avx(_local_710,_local_710,0x50);
    auVar362._8_4_ = 0x3f800000;
    auVar362._0_8_ = &DAT_3f8000003f800000;
    auVar362._12_4_ = 0x3f800000;
    auVar365._16_4_ = 0x3f800000;
    auVar365._0_16_ = auVar362;
    auVar365._20_4_ = 0x3f800000;
    auVar365._24_4_ = 0x3f800000;
    auVar365._28_4_ = 0x3f800000;
    auVar194 = vsubps_avx(auVar362,auVar122);
    fVar236 = auVar122._0_4_;
    fVar135 = auVar122._4_4_;
    fVar158 = auVar122._8_4_;
    fVar183 = auVar122._12_4_;
    fVar184 = auVar194._0_4_;
    fVar186 = auVar194._4_4_;
    fVar188 = auVar194._8_4_;
    fVar210 = auVar194._12_4_;
    auVar149._0_4_ = auVar278._0_4_ * fVar236 + fVar184 * (float)local_5e0._0_4_;
    auVar149._4_4_ = auVar278._4_4_ * fVar135 + fVar186 * (float)local_5e0._4_4_;
    auVar149._8_4_ = auVar278._0_4_ * fVar158 + fVar188 * (float)local_5e0._0_4_;
    auVar149._12_4_ = auVar278._4_4_ * fVar183 + fVar210 * (float)local_5e0._4_4_;
    auVar117._0_4_ = auVar288._0_4_ * fVar236 + local_450._0_4_ * fVar184;
    auVar117._4_4_ = auVar288._4_4_ * fVar135 + local_450._4_4_ * fVar186;
    auVar117._8_4_ = auVar288._0_4_ * fVar158 + local_450._8_4_ * fVar188;
    auVar117._12_4_ = auVar288._4_4_ * fVar183 + local_450._12_4_ * fVar210;
    auVar260._0_4_ = auVar306._0_4_ * fVar236 + auVar332._0_4_ * fVar184;
    auVar260._4_4_ = auVar306._4_4_ * fVar135 + auVar332._4_4_ * fVar186;
    auVar260._8_4_ = auVar306._0_4_ * fVar158 + auVar332._0_4_ * fVar188;
    auVar260._12_4_ = auVar306._4_4_ * fVar183 + auVar332._4_4_ * fVar210;
    auVar168._0_4_ = auVar94._0_4_ * fVar236 + auVar116._0_4_ * fVar184;
    auVar168._4_4_ = auVar94._4_4_ * fVar135 + auVar116._4_4_ * fVar186;
    auVar168._8_4_ = auVar94._0_4_ * fVar158 + auVar116._0_4_ * fVar188;
    auVar168._12_4_ = auVar94._4_4_ * fVar183 + auVar116._4_4_ * fVar210;
    auVar122 = vmovshdup_avx(local_3e0);
    auVar194 = vshufps_avx(local_3e0,local_3e0,0);
    auVar285._16_16_ = auVar194;
    auVar285._0_16_ = auVar194;
    auVar231 = vshufps_avx(local_3e0,local_3e0,0x55);
    auVar100._16_16_ = auVar231;
    auVar100._0_16_ = auVar231;
    auVar99 = vsubps_avx(auVar100,auVar285);
    auVar231 = vshufps_avx(auVar149,auVar149,0);
    auVar176 = vshufps_avx(auVar149,auVar149,0x55);
    auVar121 = vshufps_avx(auVar117,auVar117,0);
    auVar175 = vshufps_avx(auVar117,auVar117,0x55);
    auVar96 = vshufps_avx(auVar260,auVar260,0);
    auVar150 = vshufps_avx(auVar260,auVar260,0x55);
    auVar20 = vshufps_avx(auVar168,auVar168,0);
    auVar80 = vshufps_avx(auVar168,auVar168,0x55);
    auVar122 = ZEXT416((uint)((auVar122._0_4_ - local_3e0._0_4_) * 0.04761905));
    auVar122 = vshufps_avx(auVar122,auVar122,0);
    auVar298._0_4_ = auVar194._0_4_ + auVar99._0_4_ * 0.0;
    auVar298._4_4_ = auVar194._4_4_ + auVar99._4_4_ * 0.14285715;
    auVar298._8_4_ = auVar194._8_4_ + auVar99._8_4_ * 0.2857143;
    auVar298._12_4_ = auVar194._12_4_ + auVar99._12_4_ * 0.42857146;
    auVar298._16_4_ = auVar194._0_4_ + auVar99._16_4_ * 0.5714286;
    auVar298._20_4_ = auVar194._4_4_ + auVar99._20_4_ * 0.71428573;
    auVar298._24_4_ = auVar194._8_4_ + auVar99._24_4_ * 0.8571429;
    auVar298._28_4_ = auVar194._12_4_ + auVar99._28_4_;
    auVar23 = vsubps_avx(auVar365,auVar298);
    fVar303 = auVar121._0_4_;
    fVar299 = auVar121._4_4_;
    fVar212 = auVar121._8_4_;
    fVar217 = auVar121._12_4_;
    fVar236 = auVar23._0_4_;
    fVar184 = auVar23._4_4_;
    fVar213 = auVar23._8_4_;
    fVar302 = auVar23._12_4_;
    fVar353 = auVar231._12_4_;
    fVar300 = auVar23._16_4_;
    fVar301 = auVar23._20_4_;
    fVar16 = auVar23._24_4_;
    fVar249 = auVar175._0_4_;
    fVar250 = auVar175._4_4_;
    fVar251 = auVar175._8_4_;
    fVar344 = auVar175._12_4_;
    local_660 = auVar176._0_4_;
    fStack_65c = auVar176._4_4_;
    fStack_658 = auVar176._8_4_;
    fStack_654 = auVar176._12_4_;
    fVar135 = auVar96._0_4_;
    fVar183 = auVar96._4_4_;
    fVar188 = auVar96._8_4_;
    fVar215 = auVar96._12_4_;
    fVar312 = auVar298._0_4_ * fVar135 + fVar303 * fVar236;
    fVar320 = auVar298._4_4_ * fVar183 + fVar299 * fVar184;
    fVar321 = auVar298._8_4_ * fVar188 + fVar212 * fVar213;
    fVar322 = auVar298._12_4_ * fVar215 + fVar217 * fVar302;
    fVar323 = auVar298._16_4_ * fVar135 + fVar303 * fVar300;
    fVar324 = auVar298._20_4_ * fVar183 + fVar299 * fVar301;
    fVar325 = auVar298._24_4_ * fVar188 + fVar212 * fVar16;
    fVar158 = auVar150._0_4_;
    fVar186 = auVar150._4_4_;
    fVar210 = auVar150._8_4_;
    fVar214 = auVar150._12_4_;
    fVar326 = auVar298._0_4_ * fVar158 + fVar249 * fVar236;
    fVar335 = auVar298._4_4_ * fVar186 + fVar250 * fVar184;
    fVar336 = auVar298._8_4_ * fVar210 + fVar251 * fVar213;
    fVar337 = auVar298._12_4_ * fVar214 + fVar344 * fVar302;
    fVar338 = auVar298._16_4_ * fVar158 + fVar249 * fVar300;
    fVar340 = auVar298._20_4_ * fVar186 + fVar250 * fVar301;
    fVar342 = auVar298._24_4_ * fVar210 + fVar251 * fVar16;
    auVar194 = vshufps_avx(auVar149,auVar149,0xaa);
    auVar176 = vshufps_avx(auVar149,auVar149,0xff);
    fVar216 = fVar215 + 0.0;
    auVar121 = vshufps_avx(auVar117,auVar117,0xaa);
    auVar175 = vshufps_avx(auVar117,auVar117,0xff);
    auVar101._0_4_ =
         fVar236 * (fVar303 * auVar298._0_4_ + auVar231._0_4_ * fVar236) + auVar298._0_4_ * fVar312;
    auVar101._4_4_ =
         fVar184 * (fVar299 * auVar298._4_4_ + auVar231._4_4_ * fVar184) + auVar298._4_4_ * fVar320;
    auVar101._8_4_ =
         fVar213 * (fVar212 * auVar298._8_4_ + auVar231._8_4_ * fVar213) + auVar298._8_4_ * fVar321;
    auVar101._12_4_ =
         fVar302 * (fVar217 * auVar298._12_4_ + fVar353 * fVar302) + auVar298._12_4_ * fVar322;
    auVar101._16_4_ =
         fVar300 * (fVar303 * auVar298._16_4_ + auVar231._0_4_ * fVar300) +
         auVar298._16_4_ * fVar323;
    auVar101._20_4_ =
         fVar301 * (fVar299 * auVar298._20_4_ + auVar231._4_4_ * fVar301) +
         auVar298._20_4_ * fVar324;
    auVar101._24_4_ =
         fVar16 * (fVar212 * auVar298._24_4_ + auVar231._8_4_ * fVar16) + auVar298._24_4_ * fVar325;
    auVar101._28_4_ = fVar353 + 1.0 + fVar214;
    auVar179._0_4_ =
         fVar236 * (fVar249 * auVar298._0_4_ + fVar236 * local_660) + auVar298._0_4_ * fVar326;
    auVar179._4_4_ =
         fVar184 * (fVar250 * auVar298._4_4_ + fVar184 * fStack_65c) + auVar298._4_4_ * fVar335;
    auVar179._8_4_ =
         fVar213 * (fVar251 * auVar298._8_4_ + fVar213 * fStack_658) + auVar298._8_4_ * fVar336;
    auVar179._12_4_ =
         fVar302 * (fVar344 * auVar298._12_4_ + fVar302 * fStack_654) + auVar298._12_4_ * fVar337;
    auVar179._16_4_ =
         fVar300 * (fVar249 * auVar298._16_4_ + fVar300 * local_660) + auVar298._16_4_ * fVar338;
    auVar179._20_4_ =
         fVar301 * (fVar250 * auVar298._20_4_ + fVar301 * fStack_65c) + auVar298._20_4_ * fVar340;
    auVar179._24_4_ =
         fVar16 * (fVar251 * auVar298._24_4_ + fVar16 * fStack_658) + auVar298._24_4_ * fVar342;
    auVar179._28_4_ = fVar353 + 1.0 + fVar214;
    auVar207._0_4_ =
         fVar236 * fVar312 + auVar298._0_4_ * (auVar20._0_4_ * auVar298._0_4_ + fVar236 * fVar135);
    auVar207._4_4_ =
         fVar184 * fVar320 + auVar298._4_4_ * (auVar20._4_4_ * auVar298._4_4_ + fVar184 * fVar183);
    auVar207._8_4_ =
         fVar213 * fVar321 + auVar298._8_4_ * (auVar20._8_4_ * auVar298._8_4_ + fVar213 * fVar188);
    auVar207._12_4_ =
         fVar302 * fVar322 +
         auVar298._12_4_ * (auVar20._12_4_ * auVar298._12_4_ + fVar302 * fVar215);
    auVar207._16_4_ =
         fVar300 * fVar323 + auVar298._16_4_ * (auVar20._0_4_ * auVar298._16_4_ + fVar300 * fVar135)
    ;
    auVar207._20_4_ =
         fVar301 * fVar324 + auVar298._20_4_ * (auVar20._4_4_ * auVar298._20_4_ + fVar301 * fVar183)
    ;
    auVar207._24_4_ =
         fVar16 * fVar325 + auVar298._24_4_ * (auVar20._8_4_ * auVar298._24_4_ + fVar16 * fVar188);
    auVar207._28_4_ = fVar214 + fVar216;
    auVar311._0_4_ =
         fVar236 * fVar326 + auVar298._0_4_ * (auVar80._0_4_ * auVar298._0_4_ + fVar236 * fVar158);
    auVar311._4_4_ =
         fVar184 * fVar335 + auVar298._4_4_ * (auVar80._4_4_ * auVar298._4_4_ + fVar184 * fVar186);
    auVar311._8_4_ =
         fVar213 * fVar336 + auVar298._8_4_ * (auVar80._8_4_ * auVar298._8_4_ + fVar213 * fVar210);
    auVar311._12_4_ =
         fVar302 * fVar337 +
         auVar298._12_4_ * (auVar80._12_4_ * auVar298._12_4_ + fVar302 * fVar214);
    auVar311._16_4_ =
         fVar300 * fVar338 + auVar298._16_4_ * (auVar80._0_4_ * auVar298._16_4_ + fVar300 * fVar158)
    ;
    auVar311._20_4_ =
         fVar301 * fVar340 + auVar298._20_4_ * (auVar80._4_4_ * auVar298._20_4_ + fVar301 * fVar186)
    ;
    auVar311._24_4_ =
         fVar16 * fVar342 + auVar298._24_4_ * (auVar80._8_4_ * auVar298._24_4_ + fVar16 * fVar210);
    auVar311._28_4_ = fVar216 + fVar214 + 0.0;
    local_1c0._0_4_ = fVar236 * auVar101._0_4_ + auVar298._0_4_ * auVar207._0_4_;
    local_1c0._4_4_ = fVar184 * auVar101._4_4_ + auVar298._4_4_ * auVar207._4_4_;
    local_1c0._8_4_ = fVar213 * auVar101._8_4_ + auVar298._8_4_ * auVar207._8_4_;
    local_1c0._12_4_ = fVar302 * auVar101._12_4_ + auVar298._12_4_ * auVar207._12_4_;
    local_1c0._16_4_ = fVar300 * auVar101._16_4_ + auVar298._16_4_ * auVar207._16_4_;
    local_1c0._20_4_ = fVar301 * auVar101._20_4_ + auVar298._20_4_ * auVar207._20_4_;
    local_1c0._24_4_ = fVar16 * auVar101._24_4_ + auVar298._24_4_ * auVar207._24_4_;
    local_1c0._28_4_ = fVar353 + fVar217 + fVar214 + 0.0;
    local_1e0._0_4_ = fVar236 * auVar179._0_4_ + auVar298._0_4_ * auVar311._0_4_;
    local_1e0._4_4_ = fVar184 * auVar179._4_4_ + auVar298._4_4_ * auVar311._4_4_;
    local_1e0._8_4_ = fVar213 * auVar179._8_4_ + auVar298._8_4_ * auVar311._8_4_;
    local_1e0._12_4_ = fVar302 * auVar179._12_4_ + auVar298._12_4_ * auVar311._12_4_;
    local_1e0._16_4_ = fVar300 * auVar179._16_4_ + auVar298._16_4_ * auVar311._16_4_;
    local_1e0._20_4_ = fVar301 * auVar179._20_4_ + auVar298._20_4_ * auVar311._20_4_;
    local_1e0._24_4_ = fVar16 * auVar179._24_4_ + auVar298._24_4_ * auVar311._24_4_;
    local_1e0._28_4_ = fVar353 + fVar217 + fVar216;
    auVar24 = vsubps_avx(auVar207,auVar101);
    auVar99 = vsubps_avx(auVar311,auVar179);
    local_6c0._0_4_ = auVar122._0_4_;
    local_6c0._4_4_ = auVar122._4_4_;
    fStack_6b8 = auVar122._8_4_;
    fStack_6b4 = auVar122._12_4_;
    local_220 = (float)local_6c0._0_4_ * auVar24._0_4_ * 3.0;
    fStack_21c = (float)local_6c0._4_4_ * auVar24._4_4_ * 3.0;
    auVar25._4_4_ = fStack_21c;
    auVar25._0_4_ = local_220;
    fStack_218 = fStack_6b8 * auVar24._8_4_ * 3.0;
    auVar25._8_4_ = fStack_218;
    fStack_214 = fStack_6b4 * auVar24._12_4_ * 3.0;
    auVar25._12_4_ = fStack_214;
    fStack_210 = (float)local_6c0._0_4_ * auVar24._16_4_ * 3.0;
    auVar25._16_4_ = fStack_210;
    fStack_20c = (float)local_6c0._4_4_ * auVar24._20_4_ * 3.0;
    auVar25._20_4_ = fStack_20c;
    fStack_208 = fStack_6b8 * auVar24._24_4_ * 3.0;
    auVar25._24_4_ = fStack_208;
    auVar25._28_4_ = auVar24._28_4_;
    fVar320 = (float)local_6c0._0_4_ * auVar99._0_4_ * 3.0;
    fVar212 = (float)local_6c0._4_4_ * auVar99._4_4_ * 3.0;
    auVar26._4_4_ = fVar212;
    auVar26._0_4_ = fVar320;
    fVar321 = fStack_6b8 * auVar99._8_4_ * 3.0;
    auVar26._8_4_ = fVar321;
    fVar217 = fStack_6b4 * auVar99._12_4_ * 3.0;
    auVar26._12_4_ = fVar217;
    fVar322 = (float)local_6c0._0_4_ * auVar99._16_4_ * 3.0;
    auVar26._16_4_ = fVar322;
    fVar323 = (float)local_6c0._4_4_ * auVar99._20_4_ * 3.0;
    auVar26._20_4_ = fVar323;
    fVar324 = fStack_6b8 * auVar99._24_4_ * 3.0;
    auVar26._24_4_ = fVar324;
    auVar26._28_4_ = auVar207._28_4_;
    auVar25 = vsubps_avx(local_1c0,auVar25);
    auVar99 = vperm2f128_avx(auVar25,auVar25,1);
    auVar99 = vshufps_avx(auVar99,auVar25,0x30);
    auVar99 = vshufps_avx(auVar25,auVar99,0x29);
    auVar26 = vsubps_avx(local_1e0,auVar26);
    auVar25 = vperm2f128_avx(auVar26,auVar26,1);
    auVar25 = vshufps_avx(auVar25,auVar26,0x30);
    auVar100 = vshufps_avx(auVar26,auVar25,0x29);
    fVar355 = auVar121._0_4_;
    fVar359 = auVar121._4_4_;
    fVar360 = auVar121._8_4_;
    fVar135 = auVar175._0_4_;
    fVar186 = auVar175._4_4_;
    fVar215 = auVar175._8_4_;
    fVar303 = auVar175._12_4_;
    fVar354 = auVar176._12_4_;
    auVar122 = vshufps_avx(auVar260,auVar260,0xaa);
    fVar158 = auVar122._0_4_;
    fVar188 = auVar122._4_4_;
    fVar214 = auVar122._8_4_;
    fVar312 = auVar122._12_4_;
    fVar337 = auVar298._0_4_ * fVar158 + fVar355 * fVar236;
    fVar338 = auVar298._4_4_ * fVar188 + fVar359 * fVar184;
    fVar340 = auVar298._8_4_ * fVar214 + fVar360 * fVar213;
    fVar342 = auVar298._12_4_ * fVar312 + auVar121._12_4_ * fVar302;
    fVar339 = auVar298._16_4_ * fVar158 + fVar355 * fVar300;
    fVar341 = auVar298._20_4_ * fVar188 + fVar359 * fVar301;
    fVar343 = auVar298._24_4_ * fVar214 + fVar360 * fVar16;
    fVar344 = fVar354 + fVar353 + fVar344;
    auVar122 = vshufps_avx(auVar260,auVar260,0xff);
    fVar183 = auVar122._0_4_;
    fVar210 = auVar122._4_4_;
    fVar216 = auVar122._8_4_;
    fVar299 = auVar122._12_4_;
    fVar325 = auVar298._0_4_ * fVar183 + fVar236 * fVar135;
    fVar249 = auVar298._4_4_ * fVar210 + fVar184 * fVar186;
    fVar326 = auVar298._8_4_ * fVar216 + fVar213 * fVar215;
    fVar250 = auVar298._12_4_ * fVar299 + fVar302 * fVar303;
    fVar335 = auVar298._16_4_ * fVar183 + fVar300 * fVar135;
    fVar251 = auVar298._20_4_ * fVar210 + fVar301 * fVar186;
    fVar336 = auVar298._24_4_ * fVar216 + fVar16 * fVar215;
    auVar122 = vshufps_avx(auVar168,auVar168,0xaa);
    auVar231 = vshufps_avx(auVar168,auVar168,0xff);
    fVar353 = auVar231._12_4_;
    auVar102._0_4_ =
         auVar298._0_4_ * fVar337 + fVar236 * (fVar355 * auVar298._0_4_ + auVar194._0_4_ * fVar236);
    auVar102._4_4_ =
         auVar298._4_4_ * fVar338 + fVar184 * (fVar359 * auVar298._4_4_ + auVar194._4_4_ * fVar184);
    auVar102._8_4_ =
         auVar298._8_4_ * fVar340 + fVar213 * (fVar360 * auVar298._8_4_ + auVar194._8_4_ * fVar213);
    auVar102._12_4_ =
         auVar298._12_4_ * fVar342 +
         fVar302 * (auVar121._12_4_ * auVar298._12_4_ + auVar194._12_4_ * fVar302);
    auVar102._16_4_ =
         auVar298._16_4_ * fVar339 +
         fVar300 * (fVar355 * auVar298._16_4_ + auVar194._0_4_ * fVar300);
    auVar102._20_4_ =
         auVar298._20_4_ * fVar341 +
         fVar301 * (fVar359 * auVar298._20_4_ + auVar194._4_4_ * fVar301);
    auVar102._24_4_ =
         auVar298._24_4_ * fVar343 + fVar16 * (fVar360 * auVar298._24_4_ + auVar194._8_4_ * fVar16);
    auVar102._28_4_ = fVar353 + auVar26._28_4_ + auVar25._28_4_;
    auVar352._0_4_ =
         auVar298._0_4_ * fVar325 + fVar236 * (auVar298._0_4_ * fVar135 + auVar176._0_4_ * fVar236);
    auVar352._4_4_ =
         auVar298._4_4_ * fVar249 + fVar184 * (auVar298._4_4_ * fVar186 + auVar176._4_4_ * fVar184);
    auVar352._8_4_ =
         auVar298._8_4_ * fVar326 + fVar213 * (auVar298._8_4_ * fVar215 + auVar176._8_4_ * fVar213);
    auVar352._12_4_ =
         auVar298._12_4_ * fVar250 + fVar302 * (auVar298._12_4_ * fVar303 + fVar354 * fVar302);
    auVar352._16_4_ =
         auVar298._16_4_ * fVar335 +
         fVar300 * (auVar298._16_4_ * fVar135 + auVar176._0_4_ * fVar300);
    auVar352._20_4_ =
         auVar298._20_4_ * fVar251 +
         fVar301 * (auVar298._20_4_ * fVar186 + auVar176._4_4_ * fVar301);
    auVar352._24_4_ =
         auVar298._24_4_ * fVar336 + fVar16 * (auVar298._24_4_ * fVar215 + auVar176._8_4_ * fVar16);
    auVar352._28_4_ = fVar353 + auVar25._28_4_ + auVar207._28_4_;
    auVar25 = vperm2f128_avx(local_1c0,local_1c0,1);
    auVar25 = vshufps_avx(auVar25,local_1c0,0x30);
    auVar101 = vshufps_avx(local_1c0,auVar25,0x29);
    auVar208._0_4_ =
         fVar236 * fVar337 + auVar298._0_4_ * (auVar122._0_4_ * auVar298._0_4_ + fVar236 * fVar158);
    auVar208._4_4_ =
         fVar184 * fVar338 + auVar298._4_4_ * (auVar122._4_4_ * auVar298._4_4_ + fVar184 * fVar188);
    auVar208._8_4_ =
         fVar213 * fVar340 + auVar298._8_4_ * (auVar122._8_4_ * auVar298._8_4_ + fVar213 * fVar214);
    auVar208._12_4_ =
         fVar302 * fVar342 +
         auVar298._12_4_ * (auVar122._12_4_ * auVar298._12_4_ + fVar302 * fVar312);
    auVar208._16_4_ =
         fVar300 * fVar339 +
         auVar298._16_4_ * (auVar122._0_4_ * auVar298._16_4_ + fVar300 * fVar158);
    auVar208._20_4_ =
         fVar301 * fVar341 +
         auVar298._20_4_ * (auVar122._4_4_ * auVar298._20_4_ + fVar301 * fVar188);
    auVar208._24_4_ =
         fVar16 * fVar343 + auVar298._24_4_ * (auVar122._8_4_ * auVar298._24_4_ + fVar16 * fVar214);
    auVar208._28_4_ = fVar344 + auVar122._12_4_ + fVar312;
    auVar248._0_4_ =
         fVar236 * fVar325 + auVar298._0_4_ * (auVar231._0_4_ * auVar298._0_4_ + fVar236 * fVar183);
    auVar248._4_4_ =
         fVar184 * fVar249 + auVar298._4_4_ * (auVar231._4_4_ * auVar298._4_4_ + fVar184 * fVar210);
    auVar248._8_4_ =
         fVar213 * fVar326 + auVar298._8_4_ * (auVar231._8_4_ * auVar298._8_4_ + fVar213 * fVar216);
    auVar248._12_4_ =
         fVar302 * fVar250 + auVar298._12_4_ * (fVar353 * auVar298._12_4_ + fVar302 * fVar299);
    auVar248._16_4_ =
         fVar300 * fVar335 +
         auVar298._16_4_ * (auVar231._0_4_ * auVar298._16_4_ + fVar300 * fVar183);
    auVar248._20_4_ =
         fVar301 * fVar251 +
         auVar298._20_4_ * (auVar231._4_4_ * auVar298._20_4_ + fVar301 * fVar210);
    auVar248._24_4_ =
         fVar16 * fVar336 + auVar298._24_4_ * (auVar231._8_4_ * auVar298._24_4_ + fVar16 * fVar216);
    auVar248._28_4_ = fVar354 + fVar303 + fVar353 + fVar299;
    auVar264._0_4_ = fVar236 * auVar102._0_4_ + auVar298._0_4_ * auVar208._0_4_;
    auVar264._4_4_ = fVar184 * auVar102._4_4_ + auVar298._4_4_ * auVar208._4_4_;
    auVar264._8_4_ = fVar213 * auVar102._8_4_ + auVar298._8_4_ * auVar208._8_4_;
    auVar264._12_4_ = fVar302 * auVar102._12_4_ + auVar298._12_4_ * auVar208._12_4_;
    auVar264._16_4_ = fVar300 * auVar102._16_4_ + auVar298._16_4_ * auVar208._16_4_;
    auVar264._20_4_ = fVar301 * auVar102._20_4_ + auVar298._20_4_ * auVar208._20_4_;
    auVar264._24_4_ = fVar16 * auVar102._24_4_ + auVar298._24_4_ * auVar208._24_4_;
    auVar264._28_4_ = fVar344 + fVar353 + fVar299;
    auVar286._0_4_ = fVar236 * auVar352._0_4_ + auVar298._0_4_ * auVar248._0_4_;
    auVar286._4_4_ = fVar184 * auVar352._4_4_ + auVar298._4_4_ * auVar248._4_4_;
    auVar286._8_4_ = fVar213 * auVar352._8_4_ + auVar298._8_4_ * auVar248._8_4_;
    auVar286._12_4_ = fVar302 * auVar352._12_4_ + auVar298._12_4_ * auVar248._12_4_;
    auVar286._16_4_ = fVar300 * auVar352._16_4_ + auVar298._16_4_ * auVar248._16_4_;
    auVar286._20_4_ = fVar301 * auVar352._20_4_ + auVar298._20_4_ * auVar248._20_4_;
    auVar286._24_4_ = fVar16 * auVar352._24_4_ + auVar298._24_4_ * auVar248._24_4_;
    auVar286._28_4_ = auVar23._28_4_ + auVar298._28_4_;
    auVar25 = vsubps_avx(auVar208,auVar102);
    auVar23 = vsubps_avx(auVar248,auVar352);
    local_240 = (float)local_6c0._0_4_ * auVar25._0_4_ * 3.0;
    fStack_23c = (float)local_6c0._4_4_ * auVar25._4_4_ * 3.0;
    auVar21._4_4_ = fStack_23c;
    auVar21._0_4_ = local_240;
    fStack_238 = fStack_6b8 * auVar25._8_4_ * 3.0;
    auVar21._8_4_ = fStack_238;
    fStack_234 = fStack_6b4 * auVar25._12_4_ * 3.0;
    auVar21._12_4_ = fStack_234;
    fStack_230 = (float)local_6c0._0_4_ * auVar25._16_4_ * 3.0;
    auVar21._16_4_ = fStack_230;
    fStack_22c = (float)local_6c0._4_4_ * auVar25._20_4_ * 3.0;
    auVar21._20_4_ = fStack_22c;
    fStack_228 = fStack_6b8 * auVar25._24_4_ * 3.0;
    auVar21._24_4_ = fStack_228;
    auVar21._28_4_ = auVar248._28_4_;
    local_260 = (float)local_6c0._0_4_ * auVar23._0_4_ * 3.0;
    fStack_25c = (float)local_6c0._4_4_ * auVar23._4_4_ * 3.0;
    auVar22._4_4_ = fStack_25c;
    auVar22._0_4_ = local_260;
    fStack_258 = fStack_6b8 * auVar23._8_4_ * 3.0;
    auVar22._8_4_ = fStack_258;
    fStack_254 = fStack_6b4 * auVar23._12_4_ * 3.0;
    auVar22._12_4_ = fStack_254;
    local_6c0._0_4_ = (float)local_6c0._0_4_ * auVar23._16_4_ * 3.0;
    auVar22._16_4_ = local_6c0._0_4_;
    local_6c0._4_4_ = (float)local_6c0._4_4_ * auVar23._20_4_ * 3.0;
    auVar22._20_4_ = local_6c0._4_4_;
    fStack_6b8 = fStack_6b8 * auVar23._24_4_ * 3.0;
    auVar22._24_4_ = fStack_6b8;
    auVar22._28_4_ = fStack_6b4;
    auVar25 = vperm2f128_avx(auVar264,auVar264,1);
    auVar25 = vshufps_avx(auVar25,auVar264,0x30);
    auVar102 = vshufps_avx(auVar264,auVar25,0x29);
    auVar23 = vsubps_avx(auVar264,auVar21);
    auVar25 = vperm2f128_avx(auVar23,auVar23,1);
    auVar25 = vshufps_avx(auVar25,auVar23,0x30);
    auVar21 = vshufps_avx(auVar23,auVar25,0x29);
    auVar23 = vsubps_avx(auVar286,auVar22);
    auVar25 = vperm2f128_avx(auVar23,auVar23,1);
    auVar25 = vshufps_avx(auVar25,auVar23,0x30);
    auVar22 = vshufps_avx(auVar23,auVar25,0x29);
    auVar26 = vsubps_avx(auVar264,local_1c0);
    auVar27 = vsubps_avx(auVar102,auVar101);
    fVar236 = auVar27._0_4_ + auVar26._0_4_;
    fVar135 = auVar27._4_4_ + auVar26._4_4_;
    fVar158 = auVar27._8_4_ + auVar26._8_4_;
    fVar183 = auVar27._12_4_ + auVar26._12_4_;
    fVar184 = auVar27._16_4_ + auVar26._16_4_;
    fVar186 = auVar27._20_4_ + auVar26._20_4_;
    fVar188 = auVar27._24_4_ + auVar26._24_4_;
    auVar23 = vperm2f128_avx(local_1e0,local_1e0,1);
    auVar23 = vshufps_avx(auVar23,local_1e0,0x30);
    local_200 = vshufps_avx(local_1e0,auVar23,0x29);
    auVar23 = vperm2f128_avx(auVar286,auVar286,1);
    auVar23 = vshufps_avx(auVar23,auVar286,0x30);
    auVar179 = vshufps_avx(auVar286,auVar23,0x29);
    auVar23 = vsubps_avx(auVar286,local_1e0);
    auVar208 = vsubps_avx(auVar179,local_200);
    fVar210 = auVar23._0_4_ + auVar208._0_4_;
    fVar213 = auVar23._4_4_ + auVar208._4_4_;
    fVar215 = auVar23._8_4_ + auVar208._8_4_;
    fVar214 = auVar23._12_4_ + auVar208._12_4_;
    fVar216 = auVar23._16_4_ + auVar208._16_4_;
    fVar302 = auVar23._20_4_ + auVar208._20_4_;
    fVar303 = auVar23._24_4_ + auVar208._24_4_;
    fVar312 = auVar23._28_4_;
    auVar23._4_4_ = local_1e0._4_4_ * fVar135;
    auVar23._0_4_ = local_1e0._0_4_ * fVar236;
    auVar23._8_4_ = local_1e0._8_4_ * fVar158;
    auVar23._12_4_ = local_1e0._12_4_ * fVar183;
    auVar23._16_4_ = local_1e0._16_4_ * fVar184;
    auVar23._20_4_ = local_1e0._20_4_ * fVar186;
    auVar23._24_4_ = local_1e0._24_4_ * fVar188;
    auVar23._28_4_ = fVar312;
    auVar28._4_4_ = fVar213 * local_1c0._4_4_;
    auVar28._0_4_ = fVar210 * local_1c0._0_4_;
    auVar28._8_4_ = fVar215 * local_1c0._8_4_;
    auVar28._12_4_ = fVar214 * local_1c0._12_4_;
    auVar28._16_4_ = fVar216 * local_1c0._16_4_;
    auVar28._20_4_ = fVar302 * local_1c0._20_4_;
    auVar28._24_4_ = fVar303 * local_1c0._24_4_;
    auVar28._28_4_ = auVar25._28_4_;
    auVar23 = vsubps_avx(auVar23,auVar28);
    local_220 = local_1c0._0_4_ + local_220;
    fStack_21c = local_1c0._4_4_ + fStack_21c;
    fStack_218 = local_1c0._8_4_ + fStack_218;
    fStack_214 = local_1c0._12_4_ + fStack_214;
    fStack_210 = local_1c0._16_4_ + fStack_210;
    fStack_20c = local_1c0._20_4_ + fStack_20c;
    fStack_208 = local_1c0._24_4_ + fStack_208;
    fStack_204 = local_1c0._28_4_ + auVar24._28_4_;
    fVar320 = local_1e0._0_4_ + fVar320;
    fVar212 = local_1e0._4_4_ + fVar212;
    fVar321 = local_1e0._8_4_ + fVar321;
    fVar217 = local_1e0._12_4_ + fVar217;
    fVar322 = local_1e0._16_4_ + fVar322;
    fVar323 = local_1e0._20_4_ + fVar323;
    fVar324 = local_1e0._24_4_ + fVar324;
    auVar24._4_4_ = fVar212 * fVar135;
    auVar24._0_4_ = fVar320 * fVar236;
    auVar24._8_4_ = fVar321 * fVar158;
    auVar24._12_4_ = fVar217 * fVar183;
    auVar24._16_4_ = fVar322 * fVar184;
    auVar24._20_4_ = fVar323 * fVar186;
    auVar24._24_4_ = fVar324 * fVar188;
    auVar24._28_4_ = fVar312;
    auVar29._4_4_ = fVar213 * fStack_21c;
    auVar29._0_4_ = fVar210 * local_220;
    auVar29._8_4_ = fVar215 * fStack_218;
    auVar29._12_4_ = fVar214 * fStack_214;
    auVar29._16_4_ = fVar216 * fStack_210;
    auVar29._20_4_ = fVar302 * fStack_20c;
    auVar29._24_4_ = fVar303 * fStack_208;
    auVar29._28_4_ = fStack_204;
    auVar24 = vsubps_avx(auVar24,auVar29);
    auVar30._4_4_ = auVar100._4_4_ * fVar135;
    auVar30._0_4_ = auVar100._0_4_ * fVar236;
    auVar30._8_4_ = auVar100._8_4_ * fVar158;
    auVar30._12_4_ = auVar100._12_4_ * fVar183;
    auVar30._16_4_ = auVar100._16_4_ * fVar184;
    auVar30._20_4_ = auVar100._20_4_ * fVar186;
    auVar30._24_4_ = auVar100._24_4_ * fVar188;
    auVar30._28_4_ = fVar312;
    local_660 = auVar99._0_4_;
    fStack_65c = auVar99._4_4_;
    fStack_658 = auVar99._8_4_;
    fStack_654 = auVar99._12_4_;
    fStack_650 = auVar99._16_4_;
    fStack_64c = auVar99._20_4_;
    fStack_648 = auVar99._24_4_;
    auVar31._4_4_ = fVar213 * fStack_65c;
    auVar31._0_4_ = fVar210 * local_660;
    auVar31._8_4_ = fVar215 * fStack_658;
    auVar31._12_4_ = fVar214 * fStack_654;
    auVar31._16_4_ = fVar216 * fStack_650;
    auVar31._20_4_ = fVar302 * fStack_64c;
    auVar31._24_4_ = fVar303 * fStack_648;
    auVar31._28_4_ = 0x40400000;
    auVar28 = vsubps_avx(auVar30,auVar31);
    auVar32._4_4_ = local_200._4_4_ * fVar135;
    auVar32._0_4_ = local_200._0_4_ * fVar236;
    auVar32._8_4_ = local_200._8_4_ * fVar158;
    auVar32._12_4_ = local_200._12_4_ * fVar183;
    auVar32._16_4_ = local_200._16_4_ * fVar184;
    auVar32._20_4_ = local_200._20_4_ * fVar186;
    auVar32._24_4_ = local_200._24_4_ * fVar188;
    auVar32._28_4_ = fVar312;
    auVar33._4_4_ = auVar101._4_4_ * fVar213;
    auVar33._0_4_ = auVar101._0_4_ * fVar210;
    auVar33._8_4_ = auVar101._8_4_ * fVar215;
    auVar33._12_4_ = auVar101._12_4_ * fVar214;
    auVar33._16_4_ = auVar101._16_4_ * fVar216;
    auVar33._20_4_ = auVar101._20_4_ * fVar302;
    auVar33._24_4_ = auVar101._24_4_ * fVar303;
    auVar33._28_4_ = local_200._28_4_;
    auVar29 = vsubps_avx(auVar32,auVar33);
    auVar34._4_4_ = auVar286._4_4_ * fVar135;
    auVar34._0_4_ = auVar286._0_4_ * fVar236;
    auVar34._8_4_ = auVar286._8_4_ * fVar158;
    auVar34._12_4_ = auVar286._12_4_ * fVar183;
    auVar34._16_4_ = auVar286._16_4_ * fVar184;
    auVar34._20_4_ = auVar286._20_4_ * fVar186;
    auVar34._24_4_ = auVar286._24_4_ * fVar188;
    auVar34._28_4_ = fVar312;
    auVar35._4_4_ = fVar213 * auVar264._4_4_;
    auVar35._0_4_ = fVar210 * auVar264._0_4_;
    auVar35._8_4_ = fVar215 * auVar264._8_4_;
    auVar35._12_4_ = fVar214 * auVar264._12_4_;
    auVar35._16_4_ = fVar216 * auVar264._16_4_;
    auVar35._20_4_ = fVar302 * auVar264._20_4_;
    auVar35._24_4_ = fVar303 * auVar264._24_4_;
    auVar35._28_4_ = auVar100._28_4_;
    auVar30 = vsubps_avx(auVar34,auVar35);
    local_240 = auVar264._0_4_ + local_240;
    fStack_23c = auVar264._4_4_ + fStack_23c;
    fStack_238 = auVar264._8_4_ + fStack_238;
    fStack_234 = auVar264._12_4_ + fStack_234;
    fStack_230 = auVar264._16_4_ + fStack_230;
    fStack_22c = auVar264._20_4_ + fStack_22c;
    fStack_228 = auVar264._24_4_ + fStack_228;
    fStack_224 = auVar264._28_4_ + auVar248._28_4_;
    local_260 = auVar286._0_4_ + local_260;
    fStack_25c = auVar286._4_4_ + fStack_25c;
    fStack_258 = auVar286._8_4_ + fStack_258;
    fStack_254 = auVar286._12_4_ + fStack_254;
    fStack_250 = auVar286._16_4_ + (float)local_6c0._0_4_;
    fStack_24c = auVar286._20_4_ + (float)local_6c0._4_4_;
    fStack_248 = auVar286._24_4_ + fStack_6b8;
    fStack_244 = auVar286._28_4_ + fStack_6b4;
    auVar36._4_4_ = fStack_25c * fVar135;
    auVar36._0_4_ = local_260 * fVar236;
    auVar36._8_4_ = fStack_258 * fVar158;
    auVar36._12_4_ = fStack_254 * fVar183;
    auVar36._16_4_ = fStack_250 * fVar184;
    auVar36._20_4_ = fStack_24c * fVar186;
    auVar36._24_4_ = fStack_248 * fVar188;
    auVar36._28_4_ = auVar286._28_4_ + fStack_6b4;
    auVar37._4_4_ = fStack_23c * fVar213;
    auVar37._0_4_ = local_240 * fVar210;
    auVar37._8_4_ = fStack_238 * fVar215;
    auVar37._12_4_ = fStack_234 * fVar214;
    auVar37._16_4_ = fStack_230 * fVar216;
    auVar37._20_4_ = fStack_22c * fVar302;
    auVar37._24_4_ = fStack_228 * fVar303;
    auVar37._28_4_ = fStack_224;
    auVar31 = vsubps_avx(auVar36,auVar37);
    auVar38._4_4_ = auVar22._4_4_ * fVar135;
    auVar38._0_4_ = auVar22._0_4_ * fVar236;
    auVar38._8_4_ = auVar22._8_4_ * fVar158;
    auVar38._12_4_ = auVar22._12_4_ * fVar183;
    auVar38._16_4_ = auVar22._16_4_ * fVar184;
    auVar38._20_4_ = auVar22._20_4_ * fVar186;
    auVar38._24_4_ = auVar22._24_4_ * fVar188;
    auVar38._28_4_ = fStack_224;
    auVar39._4_4_ = fVar213 * auVar21._4_4_;
    auVar39._0_4_ = fVar210 * auVar21._0_4_;
    auVar39._8_4_ = fVar215 * auVar21._8_4_;
    auVar39._12_4_ = fVar214 * auVar21._12_4_;
    auVar39._16_4_ = fVar216 * auVar21._16_4_;
    auVar39._20_4_ = fVar302 * auVar21._20_4_;
    auVar39._24_4_ = fVar303 * auVar21._24_4_;
    auVar39._28_4_ = auVar21._28_4_;
    auVar32 = vsubps_avx(auVar38,auVar39);
    auVar40._4_4_ = auVar179._4_4_ * fVar135;
    auVar40._0_4_ = auVar179._0_4_ * fVar236;
    auVar40._8_4_ = auVar179._8_4_ * fVar158;
    auVar40._12_4_ = auVar179._12_4_ * fVar183;
    auVar40._16_4_ = auVar179._16_4_ * fVar184;
    auVar40._20_4_ = auVar179._20_4_ * fVar186;
    auVar40._24_4_ = auVar179._24_4_ * fVar188;
    auVar40._28_4_ = auVar27._28_4_ + auVar26._28_4_;
    auVar27._4_4_ = auVar102._4_4_ * fVar213;
    auVar27._0_4_ = auVar102._0_4_ * fVar210;
    auVar27._8_4_ = auVar102._8_4_ * fVar215;
    auVar27._12_4_ = auVar102._12_4_ * fVar214;
    auVar27._16_4_ = auVar102._16_4_ * fVar216;
    auVar27._20_4_ = auVar102._20_4_ * fVar302;
    auVar27._24_4_ = auVar102._24_4_ * fVar303;
    auVar27._28_4_ = fVar312 + auVar208._28_4_;
    auVar27 = vsubps_avx(auVar40,auVar27);
    auVar25 = vminps_avx(auVar23,auVar24);
    auVar99 = vmaxps_avx(auVar23,auVar24);
    auVar23 = vminps_avx(auVar28,auVar29);
    auVar23 = vminps_avx(auVar25,auVar23);
    auVar25 = vmaxps_avx(auVar28,auVar29);
    auVar99 = vmaxps_avx(auVar99,auVar25);
    auVar24 = vminps_avx(auVar30,auVar31);
    auVar25 = vmaxps_avx(auVar30,auVar31);
    auVar26 = vminps_avx(auVar32,auVar27);
    auVar24 = vminps_avx(auVar24,auVar26);
    auVar24 = vminps_avx(auVar23,auVar24);
    auVar23 = vmaxps_avx(auVar32,auVar27);
    auVar25 = vmaxps_avx(auVar25,auVar23);
    auVar25 = vmaxps_avx(auVar99,auVar25);
    auVar99 = vcmpps_avx(auVar24,local_280,2);
    auVar25 = vcmpps_avx(auVar25,local_2a0,5);
    auVar99 = vandps_avx(auVar25,auVar99);
    auVar25 = local_320 & auVar99;
    uVar72 = 0;
    if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar25 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar25 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar25 >> 0x7f,0) != '\0') ||
          (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar25 >> 0xbf,0) != '\0') ||
        (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar25[0x1f] < '\0')
    {
      auVar25 = vsubps_avx(auVar101,local_1c0);
      auVar23 = vsubps_avx(auVar102,auVar264);
      fVar135 = auVar25._0_4_ + auVar23._0_4_;
      fVar158 = auVar25._4_4_ + auVar23._4_4_;
      fVar183 = auVar25._8_4_ + auVar23._8_4_;
      fVar184 = auVar25._12_4_ + auVar23._12_4_;
      fVar186 = auVar25._16_4_ + auVar23._16_4_;
      fVar188 = auVar25._20_4_ + auVar23._20_4_;
      fVar210 = auVar25._24_4_ + auVar23._24_4_;
      auVar24 = vsubps_avx(local_200,local_1e0);
      auVar26 = vsubps_avx(auVar179,auVar286);
      fVar213 = auVar24._0_4_ + auVar26._0_4_;
      fVar215 = auVar24._4_4_ + auVar26._4_4_;
      fVar214 = auVar24._8_4_ + auVar26._8_4_;
      fVar216 = auVar24._12_4_ + auVar26._12_4_;
      fVar302 = auVar24._16_4_ + auVar26._16_4_;
      fVar303 = auVar24._20_4_ + auVar26._20_4_;
      fVar312 = auVar24._24_4_ + auVar26._24_4_;
      fVar236 = auVar26._28_4_;
      auVar41._4_4_ = local_1e0._4_4_ * fVar158;
      auVar41._0_4_ = local_1e0._0_4_ * fVar135;
      auVar41._8_4_ = local_1e0._8_4_ * fVar183;
      auVar41._12_4_ = local_1e0._12_4_ * fVar184;
      auVar41._16_4_ = local_1e0._16_4_ * fVar186;
      auVar41._20_4_ = local_1e0._20_4_ * fVar188;
      auVar41._24_4_ = local_1e0._24_4_ * fVar210;
      auVar41._28_4_ = local_1e0._28_4_;
      auVar42._4_4_ = local_1c0._4_4_ * fVar215;
      auVar42._0_4_ = local_1c0._0_4_ * fVar213;
      auVar42._8_4_ = local_1c0._8_4_ * fVar214;
      auVar42._12_4_ = local_1c0._12_4_ * fVar216;
      auVar42._16_4_ = local_1c0._16_4_ * fVar302;
      auVar42._20_4_ = local_1c0._20_4_ * fVar303;
      auVar42._24_4_ = local_1c0._24_4_ * fVar312;
      auVar42._28_4_ = local_1c0._28_4_;
      auVar26 = vsubps_avx(auVar41,auVar42);
      auVar43._4_4_ = fVar212 * fVar158;
      auVar43._0_4_ = fVar320 * fVar135;
      auVar43._8_4_ = fVar321 * fVar183;
      auVar43._12_4_ = fVar217 * fVar184;
      auVar43._16_4_ = fVar322 * fVar186;
      auVar43._20_4_ = fVar323 * fVar188;
      auVar43._24_4_ = fVar324 * fVar210;
      auVar43._28_4_ = local_1e0._28_4_;
      auVar44._4_4_ = fVar215 * fStack_21c;
      auVar44._0_4_ = fVar213 * local_220;
      auVar44._8_4_ = fVar214 * fStack_218;
      auVar44._12_4_ = fVar216 * fStack_214;
      auVar44._16_4_ = fVar302 * fStack_210;
      auVar44._20_4_ = fVar303 * fStack_20c;
      auVar44._24_4_ = fVar312 * fStack_208;
      auVar44._28_4_ = fVar236;
      auVar27 = vsubps_avx(auVar43,auVar44);
      auVar45._4_4_ = fVar158 * auVar100._4_4_;
      auVar45._0_4_ = fVar135 * auVar100._0_4_;
      auVar45._8_4_ = fVar183 * auVar100._8_4_;
      auVar45._12_4_ = fVar184 * auVar100._12_4_;
      auVar45._16_4_ = fVar186 * auVar100._16_4_;
      auVar45._20_4_ = fVar188 * auVar100._20_4_;
      auVar45._24_4_ = fVar210 * auVar100._24_4_;
      auVar45._28_4_ = fVar236;
      auVar46._4_4_ = fVar215 * fStack_65c;
      auVar46._0_4_ = fVar213 * local_660;
      auVar46._8_4_ = fVar214 * fStack_658;
      auVar46._12_4_ = fVar216 * fStack_654;
      auVar46._16_4_ = fVar302 * fStack_650;
      auVar46._20_4_ = fVar303 * fStack_64c;
      auVar46._24_4_ = fVar312 * fStack_648;
      auVar46._28_4_ = local_1e0._28_4_ + auVar207._28_4_;
      auVar100 = vsubps_avx(auVar45,auVar46);
      auVar47._4_4_ = local_200._4_4_ * fVar158;
      auVar47._0_4_ = local_200._0_4_ * fVar135;
      auVar47._8_4_ = local_200._8_4_ * fVar183;
      auVar47._12_4_ = local_200._12_4_ * fVar184;
      auVar47._16_4_ = local_200._16_4_ * fVar186;
      auVar47._20_4_ = local_200._20_4_ * fVar188;
      auVar47._24_4_ = local_200._24_4_ * fVar210;
      auVar47._28_4_ = local_1e0._28_4_ + auVar207._28_4_;
      auVar48._4_4_ = auVar101._4_4_ * fVar215;
      auVar48._0_4_ = auVar101._0_4_ * fVar213;
      auVar48._8_4_ = auVar101._8_4_ * fVar214;
      auVar48._12_4_ = auVar101._12_4_ * fVar216;
      auVar48._16_4_ = auVar101._16_4_ * fVar302;
      auVar48._20_4_ = auVar101._20_4_ * fVar303;
      uVar5 = auVar101._28_4_;
      auVar48._24_4_ = auVar101._24_4_ * fVar312;
      auVar48._28_4_ = uVar5;
      auVar101 = vsubps_avx(auVar47,auVar48);
      auVar49._4_4_ = auVar286._4_4_ * fVar158;
      auVar49._0_4_ = auVar286._0_4_ * fVar135;
      auVar49._8_4_ = auVar286._8_4_ * fVar183;
      auVar49._12_4_ = auVar286._12_4_ * fVar184;
      auVar49._16_4_ = auVar286._16_4_ * fVar186;
      auVar49._20_4_ = auVar286._20_4_ * fVar188;
      auVar49._24_4_ = auVar286._24_4_ * fVar210;
      auVar49._28_4_ = auVar286._28_4_;
      auVar50._4_4_ = auVar264._4_4_ * fVar215;
      auVar50._0_4_ = auVar264._0_4_ * fVar213;
      auVar50._8_4_ = auVar264._8_4_ * fVar214;
      auVar50._12_4_ = auVar264._12_4_ * fVar216;
      auVar50._16_4_ = auVar264._16_4_ * fVar302;
      auVar50._20_4_ = auVar264._20_4_ * fVar303;
      auVar50._24_4_ = auVar264._24_4_ * fVar312;
      auVar50._28_4_ = auVar264._28_4_;
      auVar208 = vsubps_avx(auVar49,auVar50);
      auVar51._4_4_ = fVar158 * fStack_25c;
      auVar51._0_4_ = fVar135 * local_260;
      auVar51._8_4_ = fVar183 * fStack_258;
      auVar51._12_4_ = fVar184 * fStack_254;
      auVar51._16_4_ = fVar186 * fStack_250;
      auVar51._20_4_ = fVar188 * fStack_24c;
      auVar51._24_4_ = fVar210 * fStack_248;
      auVar51._28_4_ = auVar286._28_4_;
      auVar52._4_4_ = fVar215 * fStack_23c;
      auVar52._0_4_ = fVar213 * local_240;
      auVar52._8_4_ = fVar214 * fStack_238;
      auVar52._12_4_ = fVar216 * fStack_234;
      auVar52._16_4_ = fVar302 * fStack_230;
      auVar52._20_4_ = fVar303 * fStack_22c;
      auVar52._24_4_ = fVar312 * fStack_228;
      auVar52._28_4_ = uVar5;
      auVar28 = vsubps_avx(auVar51,auVar52);
      auVar53._4_4_ = fVar158 * auVar22._4_4_;
      auVar53._0_4_ = fVar135 * auVar22._0_4_;
      auVar53._8_4_ = fVar183 * auVar22._8_4_;
      auVar53._12_4_ = fVar184 * auVar22._12_4_;
      auVar53._16_4_ = fVar186 * auVar22._16_4_;
      auVar53._20_4_ = fVar188 * auVar22._20_4_;
      auVar53._24_4_ = fVar210 * auVar22._24_4_;
      auVar53._28_4_ = uVar5;
      auVar54._4_4_ = fVar215 * auVar21._4_4_;
      auVar54._0_4_ = fVar213 * auVar21._0_4_;
      auVar54._8_4_ = fVar214 * auVar21._8_4_;
      auVar54._12_4_ = fVar216 * auVar21._12_4_;
      auVar54._16_4_ = fVar302 * auVar21._16_4_;
      auVar54._20_4_ = fVar303 * auVar21._20_4_;
      auVar54._24_4_ = fVar312 * auVar21._24_4_;
      auVar54._28_4_ = local_200._28_4_;
      auVar21 = vsubps_avx(auVar53,auVar54);
      auVar55._4_4_ = auVar179._4_4_ * fVar158;
      auVar55._0_4_ = auVar179._0_4_ * fVar135;
      auVar55._8_4_ = auVar179._8_4_ * fVar183;
      auVar55._12_4_ = auVar179._12_4_ * fVar184;
      auVar55._16_4_ = auVar179._16_4_ * fVar186;
      auVar55._20_4_ = auVar179._20_4_ * fVar188;
      auVar55._24_4_ = auVar179._24_4_ * fVar210;
      auVar55._28_4_ = auVar25._28_4_ + auVar23._28_4_;
      auVar56._4_4_ = auVar102._4_4_ * fVar215;
      auVar56._0_4_ = auVar102._0_4_ * fVar213;
      auVar56._8_4_ = auVar102._8_4_ * fVar214;
      auVar56._12_4_ = auVar102._12_4_ * fVar216;
      auVar56._16_4_ = auVar102._16_4_ * fVar302;
      auVar56._20_4_ = auVar102._20_4_ * fVar303;
      auVar56._24_4_ = auVar102._24_4_ * fVar312;
      auVar56._28_4_ = auVar24._28_4_ + fVar236;
      auVar102 = vsubps_avx(auVar55,auVar56);
      auVar23 = vminps_avx(auVar26,auVar27);
      auVar25 = vmaxps_avx(auVar26,auVar27);
      auVar24 = vminps_avx(auVar100,auVar101);
      auVar24 = vminps_avx(auVar23,auVar24);
      auVar23 = vmaxps_avx(auVar100,auVar101);
      auVar25 = vmaxps_avx(auVar25,auVar23);
      auVar26 = vminps_avx(auVar208,auVar28);
      auVar23 = vmaxps_avx(auVar208,auVar28);
      auVar100 = vminps_avx(auVar21,auVar102);
      auVar26 = vminps_avx(auVar26,auVar100);
      auVar26 = vminps_avx(auVar24,auVar26);
      auVar24 = vmaxps_avx(auVar21,auVar102);
      auVar23 = vmaxps_avx(auVar23,auVar24);
      auVar23 = vmaxps_avx(auVar25,auVar23);
      auVar25 = vcmpps_avx(auVar26,local_280,2);
      auVar23 = vcmpps_avx(auVar23,local_2a0,5);
      auVar25 = vandps_avx(auVar23,auVar25);
      auVar99 = vandps_avx(auVar99,local_320);
      auVar23 = auVar99 & auVar25;
      if ((((((((auVar23 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar23 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar23 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar23 >> 0x7f,0) != '\0') ||
            (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar23 >> 0xbf,0) != '\0') ||
          (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar23[0x1f] < '\0') {
        auVar99 = vandps_avx(auVar25,auVar99);
        uVar72 = vmovmskps_avx(auVar99);
      }
    }
    if (uVar72 != 0) {
      auStack_440[uVar75] = uVar72;
      uVar6 = vmovlps_avx(local_3e0);
      *(undefined8 *)(afStack_300 + uVar75 * 2) = uVar6;
      uVar7 = vmovlps_avx(_local_710);
      auStack_1a0[uVar75] = uVar7;
      uVar75 = (ulong)((int)uVar75 + 1);
    }
    auVar366 = ZEXT464(0) << 0x20;
    do {
      if ((int)uVar75 == 0) {
        uVar5 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar98._4_4_ = uVar5;
        auVar98._0_4_ = uVar5;
        auVar98._8_4_ = uVar5;
        auVar98._12_4_ = uVar5;
        auVar122 = vcmpps_avx(local_430,auVar98,2);
        uVar71 = vmovmskps_avx(auVar122);
        uVar70 = uVar70 & local_528 & uVar71;
        if (uVar70 == 0) {
          return;
        }
        goto LAB_010318c8;
      }
      uVar77 = (int)uVar75 - 1;
      uVar78 = (ulong)uVar77;
      uVar72 = auStack_440[uVar78];
      fVar236 = afStack_300[uVar78 * 2];
      fVar135 = afStack_300[uVar78 * 2 + 1];
      register0x00001588 = 0;
      local_710 = (undefined1  [8])auStack_1a0[uVar78];
      uVar7 = 0;
      if (uVar72 != 0) {
        for (; (uVar72 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
        }
      }
      uVar72 = uVar72 - 1 & uVar72;
      auStack_440[uVar78] = uVar72;
      if (uVar72 == 0) {
        uVar75 = (ulong)uVar77;
      }
      auVar223._8_4_ = 0x3f800000;
      auVar223._0_8_ = &DAT_3f8000003f800000;
      auVar223._12_4_ = 0x3f800000;
      fVar183 = (float)(uVar7 + 1) * 0.14285715;
      fVar158 = (1.0 - (float)uVar7 * 0.14285715) * fVar236 + fVar135 * (float)uVar7 * 0.14285715;
      fVar236 = (1.0 - fVar183) * fVar236 + fVar135 * fVar183;
      fVar135 = fVar236 - fVar158;
      if (0.16666667 <= fVar135) break;
      auVar122 = vshufps_avx(_local_710,_local_710,0x50);
      auVar194 = vsubps_avx(auVar223,auVar122);
      fVar183 = auVar122._0_4_;
      fVar184 = auVar122._4_4_;
      fVar186 = auVar122._8_4_;
      fVar188 = auVar122._12_4_;
      fVar210 = auVar194._0_4_;
      fVar213 = auVar194._4_4_;
      fVar215 = auVar194._8_4_;
      fVar214 = auVar194._12_4_;
      auVar169._0_4_ = auVar278._0_4_ * fVar183 + fVar210 * (float)local_5e0._0_4_;
      auVar169._4_4_ = auVar278._4_4_ * fVar184 + fVar213 * (float)local_5e0._4_4_;
      auVar169._8_4_ = auVar278._0_4_ * fVar186 + fVar215 * (float)local_5e0._0_4_;
      auVar169._12_4_ = auVar278._4_4_ * fVar188 + fVar214 * (float)local_5e0._4_4_;
      auVar199._0_4_ = auVar288._0_4_ * fVar183 + fVar210 * (float)local_450._0_4_;
      auVar199._4_4_ = auVar288._4_4_ * fVar184 + fVar213 * (float)local_450._4_4_;
      auVar199._8_4_ = auVar288._0_4_ * fVar186 + fVar215 * fStack_448;
      auVar199._12_4_ = auVar288._4_4_ * fVar188 + fVar214 * fStack_444;
      auVar224._0_4_ = auVar306._0_4_ * fVar183 + fVar210 * auVar332._0_4_;
      auVar224._4_4_ = auVar306._4_4_ * fVar184 + fVar213 * auVar332._4_4_;
      auVar224._8_4_ = auVar306._0_4_ * fVar186 + fVar215 * auVar332._0_4_;
      auVar224._12_4_ = auVar306._4_4_ * fVar188 + fVar214 * auVar332._4_4_;
      auVar118._0_4_ = auVar94._0_4_ * fVar183 + auVar116._0_4_ * fVar210;
      auVar118._4_4_ = auVar94._4_4_ * fVar184 + auVar116._4_4_ * fVar213;
      auVar118._8_4_ = auVar94._0_4_ * fVar186 + auVar116._0_4_ * fVar215;
      auVar118._12_4_ = auVar94._4_4_ * fVar188 + auVar116._4_4_ * fVar214;
      auVar155._16_16_ = auVar169;
      auVar155._0_16_ = auVar169;
      auVar180._16_16_ = auVar199;
      auVar180._0_16_ = auVar199;
      auVar209._16_16_ = auVar224;
      auVar209._0_16_ = auVar224;
      auVar99 = vshufps_avx(ZEXT2032(CONCAT416(fVar236,ZEXT416((uint)fVar158))),
                            ZEXT2032(CONCAT416(fVar236,ZEXT416((uint)fVar158))),0);
      auVar25 = vsubps_avx(auVar180,auVar155);
      fVar183 = auVar99._0_4_;
      fVar184 = auVar99._4_4_;
      fVar186 = auVar99._8_4_;
      fVar188 = auVar99._12_4_;
      fVar210 = auVar99._16_4_;
      fVar213 = auVar99._20_4_;
      fVar215 = auVar99._24_4_;
      auVar156._0_4_ = auVar169._0_4_ + auVar25._0_4_ * fVar183;
      auVar156._4_4_ = auVar169._4_4_ + auVar25._4_4_ * fVar184;
      auVar156._8_4_ = auVar169._8_4_ + auVar25._8_4_ * fVar186;
      auVar156._12_4_ = auVar169._12_4_ + auVar25._12_4_ * fVar188;
      auVar156._16_4_ = auVar169._0_4_ + auVar25._16_4_ * fVar210;
      auVar156._20_4_ = auVar169._4_4_ + auVar25._20_4_ * fVar213;
      auVar156._24_4_ = auVar169._8_4_ + auVar25._24_4_ * fVar215;
      auVar156._28_4_ = auVar169._12_4_ + auVar25._28_4_;
      auVar25 = vsubps_avx(auVar209,auVar180);
      auVar181._0_4_ = auVar199._0_4_ + auVar25._0_4_ * fVar183;
      auVar181._4_4_ = auVar199._4_4_ + auVar25._4_4_ * fVar184;
      auVar181._8_4_ = auVar199._8_4_ + auVar25._8_4_ * fVar186;
      auVar181._12_4_ = auVar199._12_4_ + auVar25._12_4_ * fVar188;
      auVar181._16_4_ = auVar199._0_4_ + auVar25._16_4_ * fVar210;
      auVar181._20_4_ = auVar199._4_4_ + auVar25._20_4_ * fVar213;
      auVar181._24_4_ = auVar199._8_4_ + auVar25._24_4_ * fVar215;
      auVar181._28_4_ = auVar199._12_4_ + auVar25._28_4_;
      auVar122 = vsubps_avx(auVar118,auVar224);
      auVar131._0_4_ = auVar224._0_4_ + auVar122._0_4_ * fVar183;
      auVar131._4_4_ = auVar224._4_4_ + auVar122._4_4_ * fVar184;
      auVar131._8_4_ = auVar224._8_4_ + auVar122._8_4_ * fVar186;
      auVar131._12_4_ = auVar224._12_4_ + auVar122._12_4_ * fVar188;
      auVar131._16_4_ = auVar224._0_4_ + auVar122._0_4_ * fVar210;
      auVar131._20_4_ = auVar224._4_4_ + auVar122._4_4_ * fVar213;
      auVar131._24_4_ = auVar224._8_4_ + auVar122._8_4_ * fVar215;
      auVar131._28_4_ = auVar224._12_4_ + auVar122._12_4_;
      auVar25 = vsubps_avx(auVar181,auVar156);
      auVar157._0_4_ = auVar156._0_4_ + fVar183 * auVar25._0_4_;
      auVar157._4_4_ = auVar156._4_4_ + fVar184 * auVar25._4_4_;
      auVar157._8_4_ = auVar156._8_4_ + fVar186 * auVar25._8_4_;
      auVar157._12_4_ = auVar156._12_4_ + fVar188 * auVar25._12_4_;
      auVar157._16_4_ = auVar156._16_4_ + fVar210 * auVar25._16_4_;
      auVar157._20_4_ = auVar156._20_4_ + fVar213 * auVar25._20_4_;
      auVar157._24_4_ = auVar156._24_4_ + fVar215 * auVar25._24_4_;
      auVar157._28_4_ = auVar156._28_4_ + auVar25._28_4_;
      auVar25 = vsubps_avx(auVar131,auVar181);
      auVar132._0_4_ = auVar181._0_4_ + fVar183 * auVar25._0_4_;
      auVar132._4_4_ = auVar181._4_4_ + fVar184 * auVar25._4_4_;
      auVar132._8_4_ = auVar181._8_4_ + fVar186 * auVar25._8_4_;
      auVar132._12_4_ = auVar181._12_4_ + fVar188 * auVar25._12_4_;
      auVar132._16_4_ = auVar181._16_4_ + fVar210 * auVar25._16_4_;
      auVar132._20_4_ = auVar181._20_4_ + fVar213 * auVar25._20_4_;
      auVar132._24_4_ = auVar181._24_4_ + fVar215 * auVar25._24_4_;
      auVar132._28_4_ = auVar181._28_4_ + auVar25._28_4_;
      auVar25 = vsubps_avx(auVar132,auVar157);
      auVar170._0_4_ = auVar157._0_4_ + fVar183 * auVar25._0_4_;
      auVar170._4_4_ = auVar157._4_4_ + fVar184 * auVar25._4_4_;
      auVar170._8_4_ = auVar157._8_4_ + fVar186 * auVar25._8_4_;
      auVar170._12_4_ = auVar157._12_4_ + fVar188 * auVar25._12_4_;
      auVar182._16_4_ = auVar157._16_4_ + fVar210 * auVar25._16_4_;
      auVar182._0_16_ = auVar170;
      auVar182._20_4_ = auVar157._20_4_ + fVar213 * auVar25._20_4_;
      auVar182._24_4_ = auVar157._24_4_ + fVar215 * auVar25._24_4_;
      auVar182._28_4_ = auVar157._28_4_ + auVar181._28_4_;
      fVar183 = auVar25._4_4_ * 3.0;
      auVar150 = auVar182._16_16_;
      auVar121 = vshufps_avx(ZEXT416((uint)(fVar135 * 0.33333334)),
                             ZEXT416((uint)(fVar135 * 0.33333334)),0);
      auVar289._0_4_ = auVar170._0_4_ + auVar121._0_4_ * auVar25._0_4_ * 3.0;
      auVar289._4_4_ = auVar170._4_4_ + auVar121._4_4_ * fVar183;
      auVar289._8_4_ = auVar170._8_4_ + auVar121._8_4_ * auVar25._8_4_ * 3.0;
      auVar289._12_4_ = auVar170._12_4_ + auVar121._12_4_ * auVar25._12_4_ * 3.0;
      auVar231 = vshufpd_avx(auVar170,auVar170,3);
      auVar176 = vshufpd_avx(auVar150,auVar150,3);
      auVar122 = vsubps_avx(auVar231,auVar170);
      auVar194 = vsubps_avx(auVar176,auVar150);
      auVar119._0_4_ = auVar122._0_4_ + auVar194._0_4_;
      auVar119._4_4_ = auVar122._4_4_ + auVar194._4_4_;
      auVar119._8_4_ = auVar122._8_4_ + auVar194._8_4_;
      auVar119._12_4_ = auVar122._12_4_ + auVar194._12_4_;
      auVar122 = vmovshdup_avx(auVar170);
      auVar194 = vmovshdup_avx(auVar289);
      auVar175 = vshufps_avx(auVar119,auVar119,0);
      auVar96 = vshufps_avx(auVar119,auVar119,0x55);
      fVar213 = auVar96._0_4_;
      fVar215 = auVar96._4_4_;
      fVar214 = auVar96._8_4_;
      fVar216 = auVar96._12_4_;
      fVar184 = auVar175._0_4_;
      fVar186 = auVar175._4_4_;
      fVar188 = auVar175._8_4_;
      fVar210 = auVar175._12_4_;
      auVar279._0_4_ = fVar184 * auVar170._0_4_ + fVar213 * auVar122._0_4_;
      auVar279._4_4_ = fVar186 * auVar170._4_4_ + fVar215 * auVar122._4_4_;
      auVar279._8_4_ = fVar188 * auVar170._8_4_ + fVar214 * auVar122._8_4_;
      auVar279._12_4_ = fVar210 * auVar170._12_4_ + fVar216 * auVar122._12_4_;
      auVar290._0_4_ = auVar289._0_4_ * fVar184 + fVar213 * auVar194._0_4_;
      auVar290._4_4_ = auVar289._4_4_ * fVar186 + fVar215 * auVar194._4_4_;
      auVar290._8_4_ = auVar289._8_4_ * fVar188 + fVar214 * auVar194._8_4_;
      auVar290._12_4_ = auVar289._12_4_ * fVar210 + fVar216 * auVar194._12_4_;
      auVar194 = vshufps_avx(auVar279,auVar279,0xe8);
      auVar175 = vshufps_avx(auVar290,auVar290,0xe8);
      auVar122 = vcmpps_avx(auVar194,auVar175,1);
      uVar72 = vextractps_avx(auVar122,0);
      auVar96 = auVar290;
      if ((uVar72 & 1) == 0) {
        auVar96 = auVar279;
      }
      auVar120._0_4_ = auVar121._0_4_ * auVar25._16_4_ * 3.0;
      auVar120._4_4_ = auVar121._4_4_ * fVar183;
      auVar120._8_4_ = auVar121._8_4_ * auVar25._24_4_ * 3.0;
      auVar120._12_4_ = auVar121._12_4_ * auVar99._28_4_;
      auVar80 = vsubps_avx(auVar150,auVar120);
      auVar121 = vmovshdup_avx(auVar80);
      auVar150 = vmovshdup_avx(auVar150);
      fVar183 = auVar80._0_4_;
      fVar302 = auVar80._4_4_;
      auVar363._0_4_ = fVar184 * fVar183 + fVar213 * auVar121._0_4_;
      auVar363._4_4_ = fVar186 * fVar302 + fVar215 * auVar121._4_4_;
      auVar363._8_4_ = fVar188 * auVar80._8_4_ + fVar214 * auVar121._8_4_;
      auVar363._12_4_ = fVar210 * auVar80._12_4_ + fVar216 * auVar121._12_4_;
      auVar349._0_4_ = fVar184 * auVar182._16_4_ + fVar213 * auVar150._0_4_;
      auVar349._4_4_ = fVar186 * auVar182._20_4_ + fVar215 * auVar150._4_4_;
      auVar349._8_4_ = fVar188 * auVar182._24_4_ + fVar214 * auVar150._8_4_;
      auVar349._12_4_ = fVar210 * auVar182._28_4_ + fVar216 * auVar150._12_4_;
      auVar150 = vshufps_avx(auVar363,auVar363,0xe8);
      auVar20 = vshufps_avx(auVar349,auVar349,0xe8);
      auVar121 = vcmpps_avx(auVar150,auVar20,1);
      uVar72 = vextractps_avx(auVar121,0);
      auVar81 = auVar349;
      if ((uVar72 & 1) == 0) {
        auVar81 = auVar363;
      }
      auVar96 = vmaxss_avx(auVar81,auVar96);
      auVar194 = vminps_avx(auVar194,auVar175);
      auVar175 = vminps_avx(auVar150,auVar20);
      auVar175 = vminps_avx(auVar194,auVar175);
      auVar122 = vshufps_avx(auVar122,auVar122,0x55);
      auVar122 = vblendps_avx(auVar122,auVar121,2);
      auVar121 = vpslld_avx(auVar122,0x1f);
      auVar122 = vshufpd_avx(auVar290,auVar290,1);
      auVar122 = vinsertps_avx(auVar122,auVar349,0x9c);
      auVar194 = vshufpd_avx(auVar279,auVar279,1);
      auVar194 = vinsertps_avx(auVar194,auVar363,0x9c);
      auVar122 = vblendvps_avx(auVar194,auVar122,auVar121);
      auVar194 = vmovshdup_avx(auVar122);
      auVar122 = vmaxss_avx(auVar194,auVar122);
      fVar188 = auVar175._0_4_;
      auVar194 = vmovshdup_avx(auVar175);
      fVar186 = auVar122._0_4_;
      fVar210 = auVar194._0_4_;
      fVar184 = auVar96._0_4_;
      if ((0.0001 <= fVar188) || (fVar186 <= -0.0001)) {
        if ((-0.0001 < fVar184 && fVar210 < 0.0001) ||
           ((fVar188 < 0.0001 && -0.0001 < fVar184 || (fVar210 < 0.0001 && -0.0001 < fVar186))))
        goto LAB_01032fe5;
LAB_01033a7e:
        auVar366 = ZEXT1664(ZEXT816(0) << 0x40);
LAB_01033a53:
        bVar57 = true;
      }
      else {
LAB_01032fe5:
        auVar366 = ZEXT464(0) << 0x20;
        auVar121 = vcmpps_avx(auVar175,ZEXT416(0) << 0x20,1);
        auVar194 = vcmpss_avx(auVar96,ZEXT416(0),1);
        auVar356._8_4_ = 0x3f800000;
        auVar356._0_8_ = &DAT_3f8000003f800000;
        auVar356._12_4_ = 0x3f800000;
        auVar225._8_4_ = 0xbf800000;
        auVar225._0_8_ = 0xbf800000bf800000;
        auVar225._12_4_ = 0xbf800000;
        auVar194 = vblendvps_avx(auVar356,auVar225,auVar194);
        auVar121 = vblendvps_avx(auVar356,auVar225,auVar121);
        auVar150 = vcmpss_avx(auVar194,auVar121,4);
        auVar150 = vpshufd_avx(ZEXT416(auVar150._0_4_ & 1),0x50);
        auVar150 = vpslld_avx(auVar150,0x1f);
        auVar150 = vpsrad_avx(auVar150,0x1f);
        auVar150 = vpandn_avx(auVar150,_DAT_02020eb0);
        auVar20 = vmovshdup_avx(auVar121);
        fVar213 = auVar20._0_4_;
        if ((auVar121._0_4_ != fVar213) || (NAN(auVar121._0_4_) || NAN(fVar213))) {
          if ((fVar210 != fVar188) || (NAN(fVar210) || NAN(fVar188))) {
            fVar188 = -fVar188 / (fVar210 - fVar188);
            auVar121 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar188) * 0.0 + fVar188)));
          }
          else {
            auVar121 = vcmpss_avx(auVar175,ZEXT416(0),0);
            auVar121 = vpshufd_avx(ZEXT416(auVar121._0_4_ & 1),0x50);
            auVar121 = vpslld_avx(auVar121,0x1f);
            auVar121 = vblendvps_avx(ZEXT816(0xff8000007f800000),_DAT_01fec6f0,auVar121);
          }
          auVar20 = vcmpps_avx(auVar150,auVar121,1);
          auVar175 = vblendps_avx(auVar150,auVar121,2);
          auVar121 = vblendps_avx(auVar121,auVar150,2);
          auVar150 = vblendvps_avx(auVar121,auVar175,auVar20);
        }
        auVar122 = vcmpss_avx(auVar122,ZEXT416(0),1);
        auVar151._8_4_ = 0xbf800000;
        auVar151._0_8_ = 0xbf800000bf800000;
        auVar151._12_4_ = 0xbf800000;
        auVar122 = vblendvps_avx(auVar356,auVar151,auVar122);
        fVar188 = auVar122._0_4_;
        if ((auVar194._0_4_ != fVar188) || (NAN(auVar194._0_4_) || NAN(fVar188))) {
          if ((fVar186 != fVar184) || (NAN(fVar186) || NAN(fVar184))) {
            fVar184 = -fVar184 / (fVar186 - fVar184);
            auVar122 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar184) * 0.0 + fVar184)));
          }
          else {
            auVar122 = vcmpss_avx(auVar96,ZEXT416(0),0);
            auVar122 = vpshufd_avx(ZEXT416(auVar122._0_4_ & 1),0x50);
            auVar122 = vpslld_avx(auVar122,0x1f);
            auVar122 = vblendvps_avx(ZEXT816(0xff8000007f800000),_DAT_01fec6f0,auVar122);
          }
          auVar121 = vcmpps_avx(auVar150,auVar122,1);
          auVar194 = vblendps_avx(auVar150,auVar122,2);
          auVar122 = vblendps_avx(auVar122,auVar150,2);
          auVar150 = vblendvps_avx(auVar122,auVar194,auVar121);
        }
        if ((fVar213 != fVar188) || (NAN(fVar213) || NAN(fVar188))) {
          auVar122 = vcmpps_avx(auVar150,auVar356,1);
          auVar194 = vinsertps_avx(auVar150,SUB6416(ZEXT464(0x3f800000),0),0x10);
          auVar226._4_12_ = auVar150._4_12_;
          auVar226._0_4_ = 0x3f800000;
          auVar150 = vblendvps_avx(auVar226,auVar194,auVar122);
        }
        auVar122 = vcmpps_avx(auVar150,_DAT_01fec6f0,1);
        auVar58._12_4_ = 0;
        auVar58._0_12_ = auVar150._4_12_;
        auVar194 = vinsertps_avx(auVar150,ZEXT416(0x3f800000),0x10);
        auVar122 = vblendvps_avx(auVar194,auVar58 << 0x20,auVar122);
        auVar194 = vmovshdup_avx(auVar122);
        bVar57 = true;
        if (auVar122._0_4_ <= auVar194._0_4_) {
          auVar123._0_4_ = auVar122._0_4_ + -0.1;
          auVar123._4_4_ = auVar122._4_4_ + 0.1;
          auVar123._8_4_ = auVar122._8_4_ + 0.0;
          auVar123._12_4_ = auVar122._12_4_ + 0.0;
          auVar121 = vshufpd_avx(auVar289,auVar289,3);
          auVar171._8_8_ = 0x3f80000000000000;
          auVar171._0_8_ = 0x3f80000000000000;
          auVar122 = vcmpps_avx(auVar123,auVar171,1);
          auVar59._12_4_ = 0;
          auVar59._0_12_ = auVar123._4_12_;
          auVar194 = vinsertps_avx(auVar123,SUB6416(ZEXT464(0x3f800000),0),0x10);
          auVar122 = vblendvps_avx(auVar194,auVar59 << 0x20,auVar122);
          auVar194 = vshufpd_avx(auVar80,auVar80,3);
          auVar175 = vshufps_avx(auVar122,auVar122,0x50);
          auVar96 = vsubps_avx(auVar356,auVar175);
          local_640 = auVar231._0_4_;
          fStack_63c = auVar231._4_4_;
          fStack_638 = auVar231._8_4_;
          fStack_634 = auVar231._12_4_;
          fVar184 = auVar175._0_4_;
          fVar186 = auVar175._4_4_;
          fVar188 = auVar175._8_4_;
          fVar210 = auVar175._12_4_;
          local_6a0 = auVar176._0_4_;
          fStack_69c = auVar176._4_4_;
          fStack_698 = auVar176._8_4_;
          fStack_694 = auVar176._12_4_;
          fVar213 = auVar96._0_4_;
          fVar215 = auVar96._4_4_;
          fVar214 = auVar96._8_4_;
          fVar216 = auVar96._12_4_;
          auVar152._0_4_ = fVar184 * local_640 + fVar213 * auVar170._0_4_;
          auVar152._4_4_ = fVar186 * fStack_63c + fVar215 * auVar170._4_4_;
          auVar152._8_4_ = fVar188 * fStack_638 + fVar214 * auVar170._0_4_;
          auVar152._12_4_ = fVar210 * fStack_634 + fVar216 * auVar170._4_4_;
          auVar200._0_4_ = fVar184 * auVar121._0_4_ + fVar213 * auVar289._0_4_;
          auVar200._4_4_ = fVar186 * auVar121._4_4_ + fVar215 * auVar289._4_4_;
          auVar200._8_4_ = fVar188 * auVar121._8_4_ + fVar214 * auVar289._0_4_;
          auVar200._12_4_ = fVar210 * auVar121._12_4_ + fVar216 * auVar289._4_4_;
          auVar261._0_4_ = fVar184 * auVar194._0_4_ + fVar213 * fVar183;
          auVar261._4_4_ = fVar186 * auVar194._4_4_ + fVar215 * fVar302;
          auVar261._8_4_ = fVar188 * auVar194._8_4_ + fVar214 * fVar183;
          auVar261._12_4_ = fVar210 * auVar194._12_4_ + fVar216 * fVar302;
          auVar280._0_4_ = fVar184 * local_6a0 + fVar213 * auVar182._16_4_;
          auVar280._4_4_ = fVar186 * fStack_69c + fVar215 * auVar182._20_4_;
          auVar280._8_4_ = fVar188 * fStack_698 + fVar214 * auVar182._16_4_;
          auVar280._12_4_ = fVar210 * fStack_694 + fVar216 * auVar182._20_4_;
          auVar176 = vsubps_avx(auVar356,auVar122);
          auVar194 = vmovshdup_avx(_local_710);
          auVar231 = vmovsldup_avx(_local_710);
          local_710._0_4_ = auVar176._0_4_ * auVar231._0_4_ + auVar194._0_4_ * auVar122._0_4_;
          local_710._4_4_ = auVar176._4_4_ * auVar231._4_4_ + auVar194._4_4_ * auVar122._4_4_;
          fStack_708 = auVar176._8_4_ * auVar231._8_4_ + auVar194._8_4_ * auVar122._8_4_;
          fStack_704 = auVar176._12_4_ * auVar231._12_4_ + auVar194._12_4_ * auVar122._12_4_;
          auVar80 = vmovshdup_avx(_local_710);
          auVar122 = vsubps_avx(auVar200,auVar152);
          auVar227._0_4_ = auVar122._0_4_ * 3.0;
          auVar227._4_4_ = auVar122._4_4_ * 3.0;
          auVar227._8_4_ = auVar122._8_4_ * 3.0;
          auVar227._12_4_ = auVar122._12_4_ * 3.0;
          auVar122 = vsubps_avx(auVar261,auVar200);
          auVar243._0_4_ = auVar122._0_4_ * 3.0;
          auVar243._4_4_ = auVar122._4_4_ * 3.0;
          auVar243._8_4_ = auVar122._8_4_ * 3.0;
          auVar243._12_4_ = auVar122._12_4_ * 3.0;
          auVar122 = vsubps_avx(auVar280,auVar261);
          auVar291._0_4_ = auVar122._0_4_ * 3.0;
          auVar291._4_4_ = auVar122._4_4_ * 3.0;
          auVar291._8_4_ = auVar122._8_4_ * 3.0;
          auVar291._12_4_ = auVar122._12_4_ * 3.0;
          auVar194 = vminps_avx(auVar243,auVar291);
          auVar122 = vmaxps_avx(auVar243,auVar291);
          auVar194 = vminps_avx(auVar227,auVar194);
          auVar122 = vmaxps_avx(auVar227,auVar122);
          auVar231 = vshufpd_avx(auVar194,auVar194,3);
          auVar176 = vshufpd_avx(auVar122,auVar122,3);
          auVar194 = vminps_avx(auVar194,auVar231);
          auVar122 = vmaxps_avx(auVar122,auVar176);
          auVar231 = vshufps_avx(ZEXT416((uint)(1.0 / fVar135)),ZEXT416((uint)(1.0 / fVar135)),0);
          auVar228._0_4_ = auVar231._0_4_ * auVar194._0_4_;
          auVar228._4_4_ = auVar231._4_4_ * auVar194._4_4_;
          auVar228._8_4_ = auVar231._8_4_ * auVar194._8_4_;
          auVar228._12_4_ = auVar231._12_4_ * auVar194._12_4_;
          auVar244._0_4_ = auVar122._0_4_ * auVar231._0_4_;
          auVar244._4_4_ = auVar122._4_4_ * auVar231._4_4_;
          auVar244._8_4_ = auVar122._8_4_ * auVar231._8_4_;
          auVar244._12_4_ = auVar122._12_4_ * auVar231._12_4_;
          auVar96 = ZEXT416((uint)(1.0 / (auVar80._0_4_ - (float)local_710._0_4_)));
          auVar122 = vshufpd_avx(auVar152,auVar152,3);
          auVar194 = vshufpd_avx(auVar200,auVar200,3);
          auVar231 = vshufpd_avx(auVar261,auVar261,3);
          auVar176 = vshufpd_avx(auVar280,auVar280,3);
          auVar122 = vsubps_avx(auVar122,auVar152);
          auVar121 = vsubps_avx(auVar194,auVar200);
          auVar175 = vsubps_avx(auVar231,auVar261);
          auVar176 = vsubps_avx(auVar176,auVar280);
          auVar194 = vminps_avx(auVar122,auVar121);
          auVar122 = vmaxps_avx(auVar122,auVar121);
          auVar231 = vminps_avx(auVar175,auVar176);
          auVar231 = vminps_avx(auVar194,auVar231);
          auVar194 = vmaxps_avx(auVar175,auVar176);
          auVar122 = vmaxps_avx(auVar122,auVar194);
          auVar194 = vshufps_avx(auVar96,auVar96,0);
          auVar307._0_4_ = auVar194._0_4_ * auVar231._0_4_;
          auVar307._4_4_ = auVar194._4_4_ * auVar231._4_4_;
          auVar307._8_4_ = auVar194._8_4_ * auVar231._8_4_;
          auVar307._12_4_ = auVar194._12_4_ * auVar231._12_4_;
          auVar315._0_4_ = auVar194._0_4_ * auVar122._0_4_;
          auVar315._4_4_ = auVar194._4_4_ * auVar122._4_4_;
          auVar315._8_4_ = auVar194._8_4_ * auVar122._8_4_;
          auVar315._12_4_ = auVar194._12_4_ * auVar122._12_4_;
          auVar122 = vmovsldup_avx(_local_710);
          auVar262._4_12_ = auVar122._4_12_;
          auVar262._0_4_ = fVar158;
          auVar281._4_12_ = local_710._4_12_;
          auVar281._0_4_ = fVar236;
          auVar97._0_4_ = (fVar236 + fVar158) * 0.5;
          auVar97._4_4_ = ((float)local_710._4_4_ + auVar122._4_4_) * 0.5;
          auVar97._8_4_ = (fStack_708 + auVar122._8_4_) * 0.5;
          auVar97._12_4_ = (fStack_704 + auVar122._12_4_) * 0.5;
          auVar122 = vshufps_avx(auVar97,auVar97,0);
          fVar183 = auVar122._0_4_;
          fVar184 = auVar122._4_4_;
          fVar186 = auVar122._8_4_;
          fVar188 = auVar122._12_4_;
          local_5f0 = auVar17._0_4_;
          fStack_5ec = auVar17._4_4_;
          fStack_5e8 = auVar17._8_4_;
          fStack_5e4 = auVar17._12_4_;
          auVar201._0_4_ = fVar183 * (float)local_330._0_4_ + local_5f0;
          auVar201._4_4_ = fVar184 * (float)local_330._4_4_ + fStack_5ec;
          auVar201._8_4_ = fVar186 * fStack_328 + fStack_5e8;
          auVar201._12_4_ = fVar188 * fStack_324 + fStack_5e4;
          local_600 = auVar18._0_4_;
          fStack_5fc = auVar18._4_4_;
          fStack_5f8 = auVar18._8_4_;
          fStack_5f4 = auVar18._12_4_;
          auVar292._0_4_ = fVar183 * (float)local_340._0_4_ + local_600;
          auVar292._4_4_ = fVar184 * (float)local_340._4_4_ + fStack_5fc;
          auVar292._8_4_ = fVar186 * fStack_338 + fStack_5f8;
          auVar292._12_4_ = fVar188 * fStack_334 + fStack_5f4;
          local_610 = auVar19._0_4_;
          fStack_60c = auVar19._4_4_;
          fStack_608 = auVar19._8_4_;
          fStack_604 = auVar19._12_4_;
          auVar333._0_4_ = fVar183 * (float)local_350._0_4_ + local_610;
          auVar333._4_4_ = fVar184 * (float)local_350._4_4_ + fStack_60c;
          auVar333._8_4_ = fVar186 * fStack_348 + fStack_608;
          auVar333._12_4_ = fVar188 * fStack_344 + fStack_604;
          auVar122 = vsubps_avx(auVar292,auVar201);
          auVar202._0_4_ = auVar122._0_4_ * fVar183 + auVar201._0_4_;
          auVar202._4_4_ = auVar122._4_4_ * fVar184 + auVar201._4_4_;
          auVar202._8_4_ = auVar122._8_4_ * fVar186 + auVar201._8_4_;
          auVar202._12_4_ = auVar122._12_4_ * fVar188 + auVar201._12_4_;
          auVar122 = vsubps_avx(auVar333,auVar292);
          auVar293._0_4_ = auVar292._0_4_ + auVar122._0_4_ * fVar183;
          auVar293._4_4_ = auVar292._4_4_ + auVar122._4_4_ * fVar184;
          auVar293._8_4_ = auVar292._8_4_ + auVar122._8_4_ * fVar186;
          auVar293._12_4_ = auVar292._12_4_ + auVar122._12_4_ * fVar188;
          auVar122 = vsubps_avx(auVar293,auVar202);
          fVar183 = auVar202._0_4_ + auVar122._0_4_ * fVar183;
          fVar184 = auVar202._4_4_ + auVar122._4_4_ * fVar184;
          auVar153._0_8_ = CONCAT44(fVar184,fVar183);
          auVar153._8_4_ = auVar202._8_4_ + auVar122._8_4_ * fVar186;
          auVar153._12_4_ = auVar202._12_4_ + auVar122._12_4_ * fVar188;
          fVar186 = auVar122._0_4_ * 3.0;
          fVar188 = auVar122._4_4_ * 3.0;
          auVar203._0_8_ = CONCAT44(fVar188,fVar186);
          auVar203._8_4_ = auVar122._8_4_ * 3.0;
          auVar203._12_4_ = auVar122._12_4_ * 3.0;
          auVar294._8_8_ = auVar153._0_8_;
          auVar294._0_8_ = auVar153._0_8_;
          auVar122 = vshufpd_avx(auVar153,auVar153,3);
          auVar194 = vshufps_avx(auVar97,auVar97,0x55);
          auVar175 = vsubps_avx(auVar122,auVar294);
          auVar295._0_4_ = auVar194._0_4_ * auVar175._0_4_ + fVar183;
          auVar295._4_4_ = auVar194._4_4_ * auVar175._4_4_ + fVar184;
          auVar295._8_4_ = auVar194._8_4_ * auVar175._8_4_ + fVar183;
          auVar295._12_4_ = auVar194._12_4_ * auVar175._12_4_ + fVar184;
          auVar350._8_8_ = auVar203._0_8_;
          auVar350._0_8_ = auVar203._0_8_;
          auVar122 = vshufpd_avx(auVar203,auVar203,1);
          auVar122 = vsubps_avx(auVar122,auVar350);
          auVar204._0_4_ = fVar186 + auVar194._0_4_ * auVar122._0_4_;
          auVar204._4_4_ = fVar188 + auVar194._4_4_ * auVar122._4_4_;
          auVar204._8_4_ = fVar186 + auVar194._8_4_ * auVar122._8_4_;
          auVar204._12_4_ = fVar188 + auVar194._12_4_ * auVar122._12_4_;
          auVar194 = vmovshdup_avx(auVar204);
          auVar351._0_8_ = auVar194._0_8_ ^ 0x8000000080000000;
          auVar351._8_4_ = auVar194._8_4_ ^ 0x80000000;
          auVar351._12_4_ = auVar194._12_4_ ^ 0x80000000;
          auVar231 = vmovshdup_avx(auVar175);
          auVar122 = vunpcklps_avx(auVar231,auVar351);
          auVar176 = vshufps_avx(auVar122,auVar351,4);
          auVar154._0_8_ = auVar175._0_8_ ^ 0x8000000080000000;
          auVar154._8_4_ = -auVar175._8_4_;
          auVar154._12_4_ = -auVar175._12_4_;
          auVar122 = vmovlhps_avx(auVar154,auVar204);
          auVar121 = vshufps_avx(auVar122,auVar204,8);
          auVar122 = ZEXT416((uint)(auVar231._0_4_ * auVar204._0_4_ -
                                   auVar194._0_4_ * auVar175._0_4_));
          auVar194 = vshufps_avx(auVar122,auVar122,0);
          auVar122 = vdivps_avx(auVar176,auVar194);
          auVar194 = vdivps_avx(auVar121,auVar194);
          auVar121 = vinsertps_avx(auVar228,auVar307,0x1c);
          auVar175 = vinsertps_avx(auVar244,auVar315,0x1c);
          auVar96 = vinsertps_avx(auVar307,auVar228,0x4c);
          auVar150 = vinsertps_avx(auVar315,auVar244,0x4c);
          auVar231 = vmovsldup_avx(auVar122);
          auVar316._0_4_ = auVar231._0_4_ * auVar121._0_4_;
          auVar316._4_4_ = auVar231._4_4_ * auVar121._4_4_;
          auVar316._8_4_ = auVar231._8_4_ * auVar121._8_4_;
          auVar316._12_4_ = auVar231._12_4_ * auVar121._12_4_;
          auVar308._0_4_ = auVar231._0_4_ * auVar175._0_4_;
          auVar308._4_4_ = auVar231._4_4_ * auVar175._4_4_;
          auVar308._8_4_ = auVar231._8_4_ * auVar175._8_4_;
          auVar308._12_4_ = auVar231._12_4_ * auVar175._12_4_;
          auVar176 = vminps_avx(auVar316,auVar308);
          auVar231 = vmaxps_avx(auVar308,auVar316);
          auVar20 = vmovsldup_avx(auVar194);
          auVar364._0_4_ = auVar20._0_4_ * auVar96._0_4_;
          auVar364._4_4_ = auVar20._4_4_ * auVar96._4_4_;
          auVar364._8_4_ = auVar20._8_4_ * auVar96._8_4_;
          auVar364._12_4_ = auVar20._12_4_ * auVar96._12_4_;
          auVar309._0_4_ = auVar20._0_4_ * auVar150._0_4_;
          auVar309._4_4_ = auVar20._4_4_ * auVar150._4_4_;
          auVar309._8_4_ = auVar20._8_4_ * auVar150._8_4_;
          auVar309._12_4_ = auVar20._12_4_ * auVar150._12_4_;
          auVar20 = vminps_avx(auVar364,auVar309);
          auVar124._0_4_ = auVar176._0_4_ + auVar20._0_4_;
          auVar124._4_4_ = auVar176._4_4_ + auVar20._4_4_;
          auVar124._8_4_ = auVar176._8_4_ + auVar20._8_4_;
          auVar124._12_4_ = auVar176._12_4_ + auVar20._12_4_;
          auVar176 = vmaxps_avx(auVar309,auVar364);
          auVar20 = vsubps_avx(auVar262,auVar97);
          auVar81 = vsubps_avx(auVar281,auVar97);
          auVar282._0_4_ = auVar231._0_4_ + auVar176._0_4_;
          auVar282._4_4_ = auVar231._4_4_ + auVar176._4_4_;
          auVar282._8_4_ = auVar231._8_4_ + auVar176._8_4_;
          auVar282._12_4_ = auVar231._12_4_ + auVar176._12_4_;
          auVar317._8_8_ = 0x3f800000;
          auVar317._0_8_ = 0x3f800000;
          auVar231 = vsubps_avx(auVar317,auVar282);
          auVar176 = vsubps_avx(auVar317,auVar124);
          fVar215 = auVar20._0_4_;
          auVar318._0_4_ = fVar215 * auVar231._0_4_;
          fVar214 = auVar20._4_4_;
          auVar318._4_4_ = fVar214 * auVar231._4_4_;
          fVar216 = auVar20._8_4_;
          auVar318._8_4_ = fVar216 * auVar231._8_4_;
          fVar302 = auVar20._12_4_;
          auVar318._12_4_ = fVar302 * auVar231._12_4_;
          fVar186 = auVar81._0_4_;
          auVar283._0_4_ = auVar231._0_4_ * fVar186;
          fVar188 = auVar81._4_4_;
          auVar283._4_4_ = auVar231._4_4_ * fVar188;
          fVar210 = auVar81._8_4_;
          auVar283._8_4_ = auVar231._8_4_ * fVar210;
          fVar213 = auVar81._12_4_;
          auVar283._12_4_ = auVar231._12_4_ * fVar213;
          auVar357._0_4_ = fVar215 * auVar176._0_4_;
          auVar357._4_4_ = fVar214 * auVar176._4_4_;
          auVar357._8_4_ = fVar216 * auVar176._8_4_;
          auVar357._12_4_ = fVar302 * auVar176._12_4_;
          auVar125._0_4_ = fVar186 * auVar176._0_4_;
          auVar125._4_4_ = fVar188 * auVar176._4_4_;
          auVar125._8_4_ = fVar210 * auVar176._8_4_;
          auVar125._12_4_ = fVar213 * auVar176._12_4_;
          auVar231 = vminps_avx(auVar318,auVar357);
          auVar176 = vminps_avx(auVar283,auVar125);
          auVar20 = vminps_avx(auVar231,auVar176);
          auVar231 = vmaxps_avx(auVar357,auVar318);
          auVar176 = vmaxps_avx(auVar125,auVar283);
          auVar81 = vshufps_avx(auVar97,auVar97,0x54);
          auVar176 = vmaxps_avx(auVar176,auVar231);
          auVar82 = vshufps_avx(auVar295,auVar295,0);
          auVar106 = vshufps_avx(auVar295,auVar295,0x55);
          auVar231 = vhaddps_avx(auVar20,auVar20);
          auVar176 = vhaddps_avx(auVar176,auVar176);
          auVar284._0_4_ = auVar82._0_4_ * auVar122._0_4_ + auVar106._0_4_ * auVar194._0_4_;
          auVar284._4_4_ = auVar82._4_4_ * auVar122._4_4_ + auVar106._4_4_ * auVar194._4_4_;
          auVar284._8_4_ = auVar82._8_4_ * auVar122._8_4_ + auVar106._8_4_ * auVar194._8_4_;
          auVar284._12_4_ = auVar82._12_4_ * auVar122._12_4_ + auVar106._12_4_ * auVar194._12_4_;
          auVar20 = vsubps_avx(auVar81,auVar284);
          fVar183 = auVar20._0_4_ + auVar231._0_4_;
          fVar184 = auVar20._0_4_ + auVar176._0_4_;
          auVar231 = vmaxss_avx(ZEXT416((uint)fVar158),ZEXT416((uint)fVar183));
          auVar176 = vminss_avx(ZEXT416((uint)fVar184),ZEXT416((uint)fVar236));
          if (auVar231._0_4_ <= auVar176._0_4_) {
            auVar231 = vmovshdup_avx(auVar122);
            auVar172._0_4_ = auVar121._0_4_ * auVar231._0_4_;
            auVar172._4_4_ = auVar121._4_4_ * auVar231._4_4_;
            auVar172._8_4_ = auVar121._8_4_ * auVar231._8_4_;
            auVar172._12_4_ = auVar121._12_4_ * auVar231._12_4_;
            auVar126._0_4_ = auVar175._0_4_ * auVar231._0_4_;
            auVar126._4_4_ = auVar175._4_4_ * auVar231._4_4_;
            auVar126._8_4_ = auVar175._8_4_ * auVar231._8_4_;
            auVar126._12_4_ = auVar175._12_4_ * auVar231._12_4_;
            auVar176 = vminps_avx(auVar172,auVar126);
            auVar231 = vmaxps_avx(auVar126,auVar172);
            auVar121 = vmovshdup_avx(auVar194);
            auVar229._0_4_ = auVar121._0_4_ * auVar96._0_4_;
            auVar229._4_4_ = auVar121._4_4_ * auVar96._4_4_;
            auVar229._8_4_ = auVar121._8_4_ * auVar96._8_4_;
            auVar229._12_4_ = auVar121._12_4_ * auVar96._12_4_;
            auVar173._0_4_ = auVar121._0_4_ * auVar150._0_4_;
            auVar173._4_4_ = auVar121._4_4_ * auVar150._4_4_;
            auVar173._8_4_ = auVar121._8_4_ * auVar150._8_4_;
            auVar173._12_4_ = auVar121._12_4_ * auVar150._12_4_;
            auVar121 = vminps_avx(auVar229,auVar173);
            auVar245._0_4_ = auVar176._0_4_ + auVar121._0_4_;
            auVar245._4_4_ = auVar176._4_4_ + auVar121._4_4_;
            auVar245._8_4_ = auVar176._8_4_ + auVar121._8_4_;
            auVar245._12_4_ = auVar176._12_4_ + auVar121._12_4_;
            auVar176 = vmaxps_avx(auVar173,auVar229);
            auVar127._0_4_ = auVar231._0_4_ + auVar176._0_4_;
            auVar127._4_4_ = auVar231._4_4_ + auVar176._4_4_;
            auVar127._8_4_ = auVar231._8_4_ + auVar176._8_4_;
            auVar127._12_4_ = auVar231._12_4_ + auVar176._12_4_;
            auVar231 = vsubps_avx(auVar171,auVar127);
            auVar176 = vsubps_avx(auVar171,auVar245);
            auVar230._0_4_ = fVar215 * auVar231._0_4_;
            auVar230._4_4_ = fVar214 * auVar231._4_4_;
            auVar230._8_4_ = fVar216 * auVar231._8_4_;
            auVar230._12_4_ = fVar302 * auVar231._12_4_;
            auVar246._0_4_ = fVar215 * auVar176._0_4_;
            auVar246._4_4_ = fVar214 * auVar176._4_4_;
            auVar246._8_4_ = fVar216 * auVar176._8_4_;
            auVar246._12_4_ = fVar302 * auVar176._12_4_;
            auVar128._0_4_ = fVar186 * auVar231._0_4_;
            auVar128._4_4_ = fVar188 * auVar231._4_4_;
            auVar128._8_4_ = fVar210 * auVar231._8_4_;
            auVar128._12_4_ = fVar213 * auVar231._12_4_;
            auVar174._0_4_ = fVar186 * auVar176._0_4_;
            auVar174._4_4_ = fVar188 * auVar176._4_4_;
            auVar174._8_4_ = fVar210 * auVar176._8_4_;
            auVar174._12_4_ = fVar213 * auVar176._12_4_;
            auVar231 = vminps_avx(auVar230,auVar246);
            auVar176 = vminps_avx(auVar128,auVar174);
            auVar231 = vminps_avx(auVar231,auVar176);
            auVar176 = vmaxps_avx(auVar246,auVar230);
            auVar121 = vmaxps_avx(auVar174,auVar128);
            auVar231 = vhaddps_avx(auVar231,auVar231);
            auVar176 = vmaxps_avx(auVar121,auVar176);
            auVar176 = vhaddps_avx(auVar176,auVar176);
            auVar121 = vmovshdup_avx(auVar20);
            auVar175 = ZEXT416((uint)(auVar121._0_4_ + auVar231._0_4_));
            auVar231 = vmaxss_avx(_local_710,auVar175);
            auVar121 = ZEXT416((uint)(auVar121._0_4_ + auVar176._0_4_));
            auVar176 = vminss_avx(auVar121,auVar80);
            auVar358._8_4_ = 0x7fffffff;
            auVar358._0_8_ = 0x7fffffff7fffffff;
            auVar358._12_4_ = 0x7fffffff;
            if (auVar231._0_4_ <= auVar176._0_4_) {
              uVar72 = 0;
              auVar366 = ZEXT864(0) << 0x20;
              if ((fVar158 < fVar183) && (uVar72 = 0, fVar184 < fVar236)) {
                auVar231 = vcmpps_avx(auVar121,auVar80,1);
                auVar176 = vcmpps_avx(_local_710,auVar175,1);
                auVar231 = vandps_avx(auVar176,auVar231);
                uVar72 = auVar231._0_4_;
              }
              if (((uint)uVar75 < 4 && 0.001 <= fVar135) && (uVar72 & 1) == 0) {
                bVar57 = false;
              }
              else {
                lVar76 = 200;
                do {
                  fVar183 = auVar20._0_4_;
                  fVar135 = 1.0 - fVar183;
                  auVar231 = ZEXT416((uint)(fVar135 * fVar135 * fVar135));
                  auVar231 = vshufps_avx(auVar231,auVar231,0);
                  auVar176 = ZEXT416((uint)(fVar183 * 3.0 * fVar135 * fVar135));
                  auVar176 = vshufps_avx(auVar176,auVar176,0);
                  auVar121 = ZEXT416((uint)(fVar135 * fVar183 * fVar183 * 3.0));
                  auVar121 = vshufps_avx(auVar121,auVar121,0);
                  auVar175 = ZEXT416((uint)(fVar183 * fVar183 * fVar183));
                  auVar175 = vshufps_avx(auVar175,auVar175,0);
                  fVar135 = local_5f0 * auVar231._0_4_ +
                            local_600 * auVar176._0_4_ +
                            (float)local_460._0_4_ * auVar175._0_4_ + local_610 * auVar121._0_4_;
                  fVar183 = fStack_5ec * auVar231._4_4_ +
                            fStack_5fc * auVar176._4_4_ +
                            (float)local_460._4_4_ * auVar175._4_4_ + fStack_60c * auVar121._4_4_;
                  auVar129._0_8_ = CONCAT44(fVar183,fVar135);
                  auVar129._8_4_ =
                       fStack_5e8 * auVar231._8_4_ +
                       fStack_5f8 * auVar176._8_4_ +
                       fStack_458 * auVar175._8_4_ + fStack_608 * auVar121._8_4_;
                  auVar129._12_4_ =
                       fStack_5e4 * auVar231._12_4_ +
                       fStack_5f4 * auVar176._12_4_ +
                       fStack_454 * auVar175._12_4_ + fStack_604 * auVar121._12_4_;
                  auVar177._8_8_ = auVar129._0_8_;
                  auVar177._0_8_ = auVar129._0_8_;
                  auVar176 = vshufpd_avx(auVar129,auVar129,1);
                  auVar231 = vmovshdup_avx(auVar20);
                  auVar176 = vsubps_avx(auVar176,auVar177);
                  auVar130._0_4_ = auVar231._0_4_ * auVar176._0_4_ + fVar135;
                  auVar130._4_4_ = auVar231._4_4_ * auVar176._4_4_ + fVar183;
                  auVar130._8_4_ = auVar231._8_4_ * auVar176._8_4_ + fVar135;
                  auVar130._12_4_ = auVar231._12_4_ * auVar176._12_4_ + fVar183;
                  auVar231 = vshufps_avx(auVar130,auVar130,0);
                  auVar176 = vshufps_avx(auVar130,auVar130,0x55);
                  auVar178._0_4_ = auVar122._0_4_ * auVar231._0_4_ + auVar194._0_4_ * auVar176._0_4_
                  ;
                  auVar178._4_4_ = auVar122._4_4_ * auVar231._4_4_ + auVar194._4_4_ * auVar176._4_4_
                  ;
                  auVar178._8_4_ = auVar122._8_4_ * auVar231._8_4_ + auVar194._8_4_ * auVar176._8_4_
                  ;
                  auVar178._12_4_ =
                       auVar122._12_4_ * auVar231._12_4_ + auVar194._12_4_ * auVar176._12_4_;
                  auVar20 = vsubps_avx(auVar20,auVar178);
                  auVar231 = vandps_avx(auVar358,auVar130);
                  auVar176 = vshufps_avx(auVar231,auVar231,0xf5);
                  auVar231 = vmaxss_avx(auVar176,auVar231);
                  if (auVar231._0_4_ < fVar134) {
                    fVar135 = auVar20._0_4_;
                    if ((0.0 <= fVar135) && (fVar135 <= 1.0)) {
                      auVar122 = vmovshdup_avx(auVar20);
                      fVar183 = auVar122._0_4_;
                      if ((0.0 <= fVar183) && (fVar183 <= 1.0)) {
                        auVar122 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2])
                                                 ,ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]
                                                         ),0x1c);
                        auVar150 = vinsertps_avx(auVar122,ZEXT416((uint)pre->ray_space[k].vz.field_0
                                                                        .m128[2]),0x28);
                        auVar122 = vdpps_avx(auVar150,local_360,0x7f);
                        auVar194 = vdpps_avx(auVar150,local_370,0x7f);
                        auVar231 = vdpps_avx(auVar150,local_380,0x7f);
                        auVar176 = vdpps_avx(auVar150,local_390,0x7f);
                        auVar121 = vdpps_avx(auVar150,local_3a0,0x7f);
                        auVar175 = vdpps_avx(auVar150,local_3b0,0x7f);
                        auVar96 = vdpps_avx(auVar150,local_3c0,0x7f);
                        auVar150 = vdpps_avx(auVar150,local_3d0,0x7f);
                        fVar213 = 1.0 - fVar183;
                        fVar215 = 1.0 - fVar135;
                        fVar184 = auVar20._4_4_;
                        fVar186 = auVar20._8_4_;
                        fVar188 = auVar20._12_4_;
                        fVar210 = fVar215 * fVar135 * fVar135 * 3.0;
                        auVar263._0_4_ = fVar135 * fVar135 * fVar135;
                        auVar263._4_4_ = fVar184 * fVar184 * fVar184;
                        auVar263._8_4_ = fVar186 * fVar186 * fVar186;
                        auVar263._12_4_ = fVar188 * fVar188 * fVar188;
                        fVar186 = fVar215 * fVar215 * fVar135 * 3.0;
                        fVar188 = fVar215 * fVar215 * fVar215;
                        fVar184 = fVar188 * (fVar213 * auVar122._0_4_ + fVar183 * auVar121._0_4_) +
                                  (fVar213 * auVar194._0_4_ + auVar175._0_4_ * fVar183) * fVar186 +
                                  fVar210 * (auVar96._0_4_ * fVar183 + fVar213 * auVar231._0_4_) +
                                  auVar263._0_4_ *
                                  (fVar213 * auVar176._0_4_ + fVar183 * auVar150._0_4_);
                        if (((fVar105 <= fVar184) &&
                            (fVar213 = *(float *)(ray + k * 4 + 0x100), fVar184 <= fVar213)) &&
                           (pGVar10 = (context->scene->geometries).items[uVar71].ptr,
                           (pGVar10->mask & *(uint *)(ray + k * 4 + 0x120)) != 0)) {
                          auStack_f0 = vshufps_avx(auVar20,auVar20,0x55);
                          auVar296._8_4_ = 0x3f800000;
                          auVar296._0_8_ = &DAT_3f8000003f800000;
                          auVar296._12_4_ = 0x3f800000;
                          auVar122 = vsubps_avx(auVar296,auStack_f0);
                          fVar214 = auStack_f0._0_4_;
                          fVar216 = auStack_f0._4_4_;
                          fVar302 = auStack_f0._8_4_;
                          fVar303 = auStack_f0._12_4_;
                          fVar312 = auVar122._0_4_;
                          fVar299 = auVar122._4_4_;
                          fVar300 = auVar122._8_4_;
                          fVar301 = auVar122._12_4_;
                          auVar310._0_4_ =
                               fVar214 * (float)local_4a0._0_4_ + fVar312 * (float)local_470._0_4_;
                          auVar310._4_4_ =
                               fVar216 * (float)local_4a0._4_4_ + fVar299 * (float)local_470._4_4_;
                          auVar310._8_4_ = fVar302 * fStack_498 + fVar300 * fStack_468;
                          auVar310._12_4_ = fVar303 * fStack_494 + fVar301 * fStack_464;
                          auVar319._0_4_ = fVar214 * fVar233 + fVar312 * fVar218;
                          auVar319._4_4_ = fVar216 * fVar235 + fVar299 * fVar234;
                          auVar319._8_4_ = fVar302 * fVar187 + fVar300 * fVar185;
                          auVar319._12_4_ = fVar303 * fVar211 + fVar301 * fVar189;
                          auVar334._0_4_ = fVar214 * local_4b0 + fVar312 * (float)local_480._0_4_;
                          auVar334._4_4_ = fVar216 * fStack_4ac + fVar299 * (float)local_480._4_4_;
                          auVar334._8_4_ = fVar302 * fStack_4a8 + fVar300 * fStack_478;
                          auVar334._12_4_ = fVar303 * fStack_4a4 + fVar301 * fStack_474;
                          auVar297._0_4_ =
                               fVar214 * (float)local_4c0._0_4_ + fVar312 * (float)local_490._0_4_;
                          auVar297._4_4_ =
                               fVar216 * (float)local_4c0._4_4_ + fVar299 * (float)local_490._4_4_;
                          auVar297._8_4_ = fVar302 * fStack_4b8 + fVar300 * fStack_488;
                          auVar297._12_4_ = fVar303 * fStack_4b4 + fVar301 * fStack_484;
                          auVar176 = vsubps_avx(auVar319,auVar310);
                          auVar121 = vsubps_avx(auVar334,auVar319);
                          auVar175 = vsubps_avx(auVar297,auVar334);
                          auStack_110 = vshufps_avx(auVar20,auVar20,0);
                          fVar303 = auStack_110._0_4_;
                          fVar312 = auStack_110._4_4_;
                          fVar299 = auStack_110._8_4_;
                          fVar300 = auStack_110._12_4_;
                          auVar122 = vshufps_avx(ZEXT416((uint)fVar215),ZEXT416((uint)fVar215),0);
                          fVar215 = auVar122._0_4_;
                          fVar214 = auVar122._4_4_;
                          fVar216 = auVar122._8_4_;
                          fVar302 = auVar122._12_4_;
                          auVar122 = vshufps_avx(auVar263,auVar263,0);
                          auVar194 = vshufps_avx(ZEXT416((uint)fVar210),ZEXT416((uint)fVar210),0);
                          auVar231 = vshufps_avx(ZEXT416((uint)fVar186),ZEXT416((uint)fVar186),0);
                          auVar247._0_4_ =
                               (fVar215 * (fVar215 * auVar176._0_4_ + fVar303 * auVar121._0_4_) +
                               fVar303 * (fVar215 * auVar121._0_4_ + fVar303 * auVar175._0_4_)) *
                               3.0;
                          auVar247._4_4_ =
                               (fVar214 * (fVar214 * auVar176._4_4_ + fVar312 * auVar121._4_4_) +
                               fVar312 * (fVar214 * auVar121._4_4_ + fVar312 * auVar175._4_4_)) *
                               3.0;
                          auVar247._8_4_ =
                               (fVar216 * (fVar216 * auVar176._8_4_ + fVar299 * auVar121._8_4_) +
                               fVar299 * (fVar216 * auVar121._8_4_ + fVar299 * auVar175._8_4_)) *
                               3.0;
                          auVar247._12_4_ =
                               (fVar302 * (fVar302 * auVar176._12_4_ + fVar300 * auVar121._12_4_) +
                               fVar300 * (fVar302 * auVar121._12_4_ + fVar300 * auVar175._12_4_)) *
                               3.0;
                          auVar176 = vshufps_avx(ZEXT416((uint)fVar188),ZEXT416((uint)fVar188),0);
                          auVar205._0_4_ =
                               auVar176._0_4_ * (float)local_3f0._0_4_ +
                               auVar231._0_4_ * (float)local_400._0_4_ +
                               auVar122._0_4_ * (float)local_420._0_4_ +
                               auVar194._0_4_ * (float)local_410._0_4_;
                          auVar205._4_4_ =
                               auVar176._4_4_ * (float)local_3f0._4_4_ +
                               auVar231._4_4_ * (float)local_400._4_4_ +
                               auVar122._4_4_ * (float)local_420._4_4_ +
                               auVar194._4_4_ * (float)local_410._4_4_;
                          auVar205._8_4_ =
                               auVar176._8_4_ * fStack_3e8 +
                               auVar231._8_4_ * fStack_3f8 +
                               auVar122._8_4_ * fStack_418 + auVar194._8_4_ * fStack_408;
                          auVar205._12_4_ =
                               auVar176._12_4_ * fStack_3e4 +
                               auVar231._12_4_ * fStack_3f4 +
                               auVar122._12_4_ * fStack_414 + auVar194._12_4_ * fStack_404;
                          auVar122 = vshufps_avx(auVar247,auVar247,0xc9);
                          auVar232._0_4_ = auVar205._0_4_ * auVar122._0_4_;
                          auVar232._4_4_ = auVar205._4_4_ * auVar122._4_4_;
                          auVar232._8_4_ = auVar205._8_4_ * auVar122._8_4_;
                          auVar232._12_4_ = auVar205._12_4_ * auVar122._12_4_;
                          auVar122 = vshufps_avx(auVar205,auVar205,0xc9);
                          auVar206._0_4_ = auVar247._0_4_ * auVar122._0_4_;
                          auVar206._4_4_ = auVar247._4_4_ * auVar122._4_4_;
                          auVar206._8_4_ = auVar247._8_4_ * auVar122._8_4_;
                          auVar206._12_4_ = auVar247._12_4_ * auVar122._12_4_;
                          auVar122 = vsubps_avx(auVar206,auVar232);
                          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                             (pGVar10->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                            *(float *)(ray + k * 4 + 0x100) = fVar184;
                            uVar5 = vextractps_avx(auVar122,1);
                            *(undefined4 *)(ray + k * 4 + 0x180) = uVar5;
                            uVar5 = vextractps_avx(auVar122,2);
                            *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar5;
                            *(int *)(ray + k * 4 + 0x1c0) = auVar122._0_4_;
                            *(float *)(ray + k * 4 + 0x1e0) = fVar135;
                            *(float *)(ray + k * 4 + 0x200) = fVar183;
                            *(uint *)(ray + k * 4 + 0x220) = uVar9;
                            *(uint *)(ray + k * 4 + 0x240) = uVar71;
                            *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                            *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                            goto LAB_01033a53;
                          }
                          auStack_170 = vshufps_avx(auVar122,auVar122,0x55);
                          auStack_150 = vshufps_avx(auVar122,auVar122,0xaa);
                          auStack_130 = vshufps_avx(auVar122,auVar122,0);
                          local_180[0] = (RTCHitN)auStack_170[0];
                          local_180[1] = (RTCHitN)auStack_170[1];
                          local_180[2] = (RTCHitN)auStack_170[2];
                          local_180[3] = (RTCHitN)auStack_170[3];
                          local_180[4] = (RTCHitN)auStack_170[4];
                          local_180[5] = (RTCHitN)auStack_170[5];
                          local_180[6] = (RTCHitN)auStack_170[6];
                          local_180[7] = (RTCHitN)auStack_170[7];
                          local_180[8] = (RTCHitN)auStack_170[8];
                          local_180[9] = (RTCHitN)auStack_170[9];
                          local_180[10] = (RTCHitN)auStack_170[10];
                          local_180[0xb] = (RTCHitN)auStack_170[0xb];
                          local_180[0xc] = (RTCHitN)auStack_170[0xc];
                          local_180[0xd] = (RTCHitN)auStack_170[0xd];
                          local_180[0xe] = (RTCHitN)auStack_170[0xe];
                          local_180[0xf] = (RTCHitN)auStack_170[0xf];
                          local_160 = auStack_150;
                          local_140 = auStack_130;
                          local_120 = auStack_110;
                          local_100 = auStack_f0;
                          local_e0 = local_2e0._0_8_;
                          uStack_d8 = local_2e0._8_8_;
                          uStack_d0 = local_2e0._16_8_;
                          uStack_c8 = local_2e0._24_8_;
                          local_c0 = local_2c0._0_8_;
                          uStack_b8 = local_2c0._8_8_;
                          uStack_b0 = local_2c0._16_8_;
                          uStack_a8 = local_2c0._24_8_;
                          auVar99 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
                          uStack_9c = context->user->instID[0];
                          local_a0 = uStack_9c;
                          uStack_98 = uStack_9c;
                          uStack_94 = uStack_9c;
                          uStack_90 = uStack_9c;
                          uStack_8c = uStack_9c;
                          uStack_84 = auVar99._28_4_;
                          uVar72 = uStack_84;
                          uStack_88 = uStack_9c;
                          uStack_84 = uStack_9c;
                          uStack_7c = context->user->instPrimID[0];
                          local_80 = uStack_7c;
                          uStack_78 = uStack_7c;
                          uStack_74 = uStack_7c;
                          uStack_70 = uStack_7c;
                          uStack_6c = uStack_7c;
                          uStack_68 = uStack_7c;
                          uStack_64 = uStack_7c;
                          *(float *)(ray + k * 4 + 0x100) = fVar184;
                          local_520 = *(undefined8 *)(mm_lookupmask_ps + uVar73);
                          uStack_518 = *(undefined8 *)(mm_lookupmask_ps + uVar73 + 8);
                          local_510 = *(undefined8 *)(mm_lookupmask_ps + lVar74);
                          uStack_508 = *(undefined8 *)(mm_lookupmask_ps + lVar74 + 8);
                          local_4f0.valid = (int *)&local_520;
                          local_4f0.geometryUserPtr = pGVar10->userPtr;
                          local_4f0.context = context->user;
                          local_4f0.hit = local_180;
                          local_4f0.N = 8;
                          local_4f0.ray = (RTCRayN *)ray;
                          if (pGVar10->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                            (*pGVar10->intersectionFilterN)(&local_4f0);
                            auVar366 = ZEXT1664(ZEXT816(0) << 0x40);
                          }
                          auVar64._8_8_ = uStack_518;
                          auVar64._0_8_ = local_520;
                          auVar122 = vpcmpeqd_avx(auVar366._0_16_,auVar64);
                          auVar66._8_8_ = uStack_508;
                          auVar66._0_8_ = local_510;
                          auVar194 = vpcmpeqd_avx(auVar366._0_16_,auVar66);
                          auVar103._16_16_ = auVar194;
                          auVar103._0_16_ = auVar122;
                          auVar25 = auVar99 & ~auVar103;
                          if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0 &&
                                   (auVar25 >> 0x3f & (undefined1  [32])0x1) ==
                                   (undefined1  [32])0x0) &&
                                  (auVar25 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                  ) && SUB321(auVar25 >> 0x7f,0) == '\0') &&
                                (auVar25 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0)
                               && SUB321(auVar25 >> 0xbf,0) == '\0') &&
                              (auVar25 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                              -1 < auVar25[0x1f]) {
                            auVar104._0_4_ = auVar122._0_4_ ^ auVar99._0_4_;
                            auVar104._4_4_ = auVar122._4_4_ ^ auVar99._4_4_;
                            auVar104._8_4_ = auVar122._8_4_ ^ auVar99._8_4_;
                            auVar104._12_4_ = auVar122._12_4_ ^ auVar99._12_4_;
                            auVar104._16_4_ = auVar194._0_4_ ^ auVar99._16_4_;
                            auVar104._20_4_ = auVar194._4_4_ ^ auVar99._20_4_;
                            auVar104._24_4_ = auVar194._8_4_ ^ auVar99._24_4_;
                            auVar104._28_4_ = auVar194._12_4_ ^ uVar72;
                          }
                          else {
                            p_Var15 = context->args->filter;
                            if ((p_Var15 != (RTCFilterFunctionN)0x0) &&
                               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (((pGVar10->field_8).field_0x2 & 0x40) != 0)))) {
                              (*p_Var15)(&local_4f0);
                              auVar366 = ZEXT1664(ZEXT816(0) << 0x40);
                            }
                            auVar65._8_8_ = uStack_518;
                            auVar65._0_8_ = local_520;
                            auVar122 = vpcmpeqd_avx(auVar366._0_16_,auVar65);
                            auVar67._8_8_ = uStack_508;
                            auVar67._0_8_ = local_510;
                            auVar194 = vpcmpeqd_avx(auVar366._0_16_,auVar67);
                            auVar133._16_16_ = auVar194;
                            auVar133._0_16_ = auVar122;
                            auVar104._0_4_ = auVar122._0_4_ ^ auVar99._0_4_;
                            auVar104._4_4_ = auVar122._4_4_ ^ auVar99._4_4_;
                            auVar104._8_4_ = auVar122._8_4_ ^ auVar99._8_4_;
                            auVar104._12_4_ = auVar122._12_4_ ^ auVar99._12_4_;
                            auVar104._16_4_ = auVar194._0_4_ ^ auVar99._16_4_;
                            auVar104._20_4_ = auVar194._4_4_ ^ auVar99._20_4_;
                            auVar104._24_4_ = auVar194._8_4_ ^ auVar99._24_4_;
                            auVar104._28_4_ = auVar194._12_4_ ^ uVar72;
                            auVar99 = auVar99 & ~auVar133;
                            if ((((((((auVar99 >> 0x1f & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0 ||
                                     (auVar99 >> 0x3f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (auVar99 >> 0x5f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) || SUB321(auVar99 >> 0x7f,0) != '\0') ||
                                  (auVar99 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0
                                  ) || SUB321(auVar99 >> 0xbf,0) != '\0') ||
                                (auVar99 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0)
                                || auVar99[0x1f] < '\0') {
                              auVar99 = vmaskmovps_avx(auVar104,*(undefined1 (*) [32])local_4f0.hit)
                              ;
                              *(undefined1 (*) [32])(local_4f0.ray + 0x180) = auVar99;
                              auVar99 = vmaskmovps_avx(auVar104,*(undefined1 (*) [32])
                                                                 (local_4f0.hit + 0x20));
                              *(undefined1 (*) [32])(local_4f0.ray + 0x1a0) = auVar99;
                              auVar99 = vmaskmovps_avx(auVar104,*(undefined1 (*) [32])
                                                                 (local_4f0.hit + 0x40));
                              *(undefined1 (*) [32])(local_4f0.ray + 0x1c0) = auVar99;
                              auVar99 = vmaskmovps_avx(auVar104,*(undefined1 (*) [32])
                                                                 (local_4f0.hit + 0x60));
                              *(undefined1 (*) [32])(local_4f0.ray + 0x1e0) = auVar99;
                              auVar99 = vmaskmovps_avx(auVar104,*(undefined1 (*) [32])
                                                                 (local_4f0.hit + 0x80));
                              *(undefined1 (*) [32])(local_4f0.ray + 0x200) = auVar99;
                              auVar99 = vmaskmovps_avx(auVar104,*(undefined1 (*) [32])
                                                                 (local_4f0.hit + 0xa0));
                              *(undefined1 (*) [32])(local_4f0.ray + 0x220) = auVar99;
                              auVar99 = vmaskmovps_avx(auVar104,*(undefined1 (*) [32])
                                                                 (local_4f0.hit + 0xc0));
                              *(undefined1 (*) [32])(local_4f0.ray + 0x240) = auVar99;
                              auVar99 = vmaskmovps_avx(auVar104,*(undefined1 (*) [32])
                                                                 (local_4f0.hit + 0xe0));
                              *(undefined1 (*) [32])(local_4f0.ray + 0x260) = auVar99;
                              auVar99 = vmaskmovps_avx(auVar104,*(undefined1 (*) [32])
                                                                 (local_4f0.hit + 0x100));
                              *(undefined1 (*) [32])(local_4f0.ray + 0x280) = auVar99;
                            }
                          }
                          if ((((((((auVar104 >> 0x1f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0 &&
                                   (auVar104 >> 0x3f & (undefined1  [32])0x1) ==
                                   (undefined1  [32])0x0) &&
                                  (auVar104 >> 0x5f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) && SUB321(auVar104 >> 0x7f,0) == '\0') &&
                                (auVar104 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0)
                               && SUB321(auVar104 >> 0xbf,0) == '\0') &&
                              (auVar104 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0)
                              && -1 < auVar104[0x1f]) {
                            *(float *)(ray + k * 4 + 0x100) = fVar213;
                          }
                        }
                      }
                    }
                    break;
                  }
                  lVar76 = lVar76 + -1;
                } while (lVar76 != 0);
              }
              goto LAB_01033a68;
            }
          }
          goto LAB_01033a7e;
        }
      }
LAB_01033a68:
    } while (bVar57);
    _local_680 = ZEXT416((uint)fVar158);
    local_3e0 = vinsertps_avx(_local_680,ZEXT416((uint)fVar236),0x10);
  } while( true );
}

Assistant:

static __forceinline void intersect_n(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const Vec3fa ray_org(ray.org.x[k], ray.org.y[k], ray.org.z[k]);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray_org, primID,ray.time()[k]);
          Intersector().intersect(pre,ray,k,context,geom,primID,curve,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }